

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodeJacobian.cpp
# Opt level: O2

int pele::physics::reactions::cvode::cJac
              (Real param_1,N_Vector u,N_Vector param_3,SUNMatrix J,void *user_data,N_Vector param_6
              ,N_Vector param_7,N_Vector param_8)

{
  double dVar1;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *__s;
  undefined1 auVar7 [8];
  undefined8 uVar8;
  Real RVar9;
  Real RVar10;
  Real RVar11;
  Real RVar12;
  Real RVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int i;
  realtype *prVar16;
  long lVar17;
  double *pdVar18;
  Real *pRVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  realtype *prVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar43 [16];
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ulong extraout_XMM0_Qb_05;
  undefined1 auVar46 [16];
  undefined8 extraout_XMM0_Qb_06;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar80;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  double dVar111;
  double dVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  double dVar115;
  double dVar116;
  double dVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  double dVar120;
  double dVar123;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  Real T_1;
  undefined4 uVar124;
  Real invT_1;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  double dVar134;
  double dVar135;
  undefined1 auVar136 [16];
  Real invT;
  double dVar137;
  double dVar138;
  undefined1 local_2128 [16];
  double local_2118;
  double local_2108;
  double local_20e8;
  double local_20d8;
  double local_20a8;
  double dStack_20a0;
  double local_2078;
  double dStack_2070;
  double local_1f28 [7];
  undefined1 auStack_1ef0 [8];
  double local_1ee8;
  double dStack_1ee0;
  undefined1 local_1ed8 [8];
  double dStack_1ed0;
  double local_1ec8;
  double dStack_1ec0;
  double local_1eb8;
  double dStack_1eb0;
  double local_1ea8;
  double dStack_1ea0;
  double local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined1 local_1e78 [8];
  undefined8 uStack_1e70;
  double local_1e68;
  double dStack_1e60;
  double local_1e58;
  double dStack_1e50;
  double local_1e48;
  double dStack_1e40;
  double local_1e38;
  double dStack_1e30;
  double local_1e28;
  Real RStack_1e20;
  undefined1 local_1e18 [8];
  undefined8 uStack_1e10;
  double local_1e08;
  double dStack_1e00;
  undefined1 local_1df8 [16];
  double local_1de8 [22];
  double local_1d38;
  double dStack_1d30;
  double local_1d28;
  undefined8 uStack_1d20;
  double local_1d18;
  double dStack_1d10;
  double local_1d08;
  undefined8 uStack_1d00;
  double local_1cf8;
  undefined8 uStack_1cf0;
  undefined1 local_1ce8 [16];
  Real h_RT [21];
  double local_1c28;
  double dStack_1c20;
  double local_1bc8;
  double dStack_1bc0;
  Real T;
  double local_1b98 [22];
  double local_1ae8;
  Real RStack_1ae0;
  double local_1ad8;
  Real RStack_1ad0;
  double local_1ac8;
  Real RStack_1ac0;
  double local_1ab0;
  undefined1 local_1aa8 [16];
  Real local_1a98;
  double dStack_1a90;
  double local_1a88;
  double dStack_1a80;
  Real local_1a78;
  double dStack_1a70;
  double local_1a68;
  undefined8 uStack_1a60;
  undefined1 local_1a58 [16];
  double local_1a48;
  ulong uStack_1a40;
  double local_1a38;
  ulong uStack_1a30;
  undefined1 local_1a28 [16];
  double local_1a18;
  undefined8 uStack_1a10;
  double local_1a08;
  undefined8 uStack_1a00;
  double local_19f8;
  double dStack_19f0;
  double local_19e8;
  double dStack_19e0;
  undefined1 local_19d8 [16];
  double local_19c8;
  double dStack_19c0;
  double local_19b8;
  double dStack_19b0;
  double local_19a8;
  undefined8 uStack_19a0;
  double local_1998;
  double local_1988;
  undefined8 uStack_1980;
  double local_1978;
  undefined8 uStack_1970;
  double local_1968;
  Real RStack_1960;
  double local_1958;
  Real RStack_1950;
  double local_1948;
  undefined8 uStack_1940;
  double local_1938;
  Real RStack_1930;
  double local_1920;
  double local_1918;
  double dStack_1910;
  double local_1908;
  undefined8 uStack_1900;
  double local_18f8;
  Real RStack_18f0;
  undefined1 local_18e8 [8];
  undefined8 uStack_18e0;
  double local_18d8;
  double dStack_18d0;
  double local_18c8;
  double dStack_18c0;
  undefined1 local_18b8 [16];
  double local_18a8;
  undefined8 uStack_18a0;
  double local_1898;
  undefined8 uStack_1890;
  double local_1888;
  undefined8 uStack_1880;
  double local_1878;
  double dStack_1870;
  double local_1868;
  ulong uStack_1860;
  double local_1858;
  double dStack_1850;
  double local_1848;
  double dStack_1840;
  double local_1838;
  double dStack_1830;
  double local_1828;
  undefined8 uStack_1820;
  double local_1818;
  undefined8 uStack_1810;
  double local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  double dStack_17f0;
  double local_17e8;
  undefined8 uStack_17e0;
  double local_17d8;
  undefined8 uStack_17d0;
  double local_17c8;
  undefined8 uStack_17c0;
  double local_17b8;
  Real RStack_17b0;
  double local_17a8;
  undefined8 uStack_17a0;
  double local_1798;
  double dStack_1790;
  double local_1788;
  Real RStack_1780;
  double local_1778;
  undefined8 uStack_1770;
  double local_1768;
  double local_1758;
  double local_1748;
  Real RStack_1740;
  Real local_1738;
  Real RStack_1730;
  double local_1728;
  undefined8 uStack_1720;
  double local_1718;
  undefined8 uStack_1710;
  double local_1708;
  double dStack_1700;
  double local_16f8;
  double dStack_16f0;
  double local_16e8;
  undefined8 uStack_16e0;
  undefined1 local_16d8 [16];
  undefined1 local_16c8 [16];
  double local_16b8;
  undefined8 uStack_16b0;
  double local_16a8;
  undefined8 uStack_16a0;
  double local_1698;
  double dStack_1690;
  double local_1680 [2];
  double local_1670;
  double dStack_1668;
  double local_1660;
  double local_1658;
  double local_1650;
  double local_1648;
  double local_1640;
  double local_1638;
  double local_1630;
  double local_1628;
  double local_1620;
  double local_1618;
  double local_1610;
  double local_1608;
  double local_1600;
  double local_15f8;
  double local_15f0;
  double local_15e8 [3];
  double local_15d0 [2];
  undefined1 auStack_15c0 [16];
  double local_15b0;
  double dStack_15a8;
  double local_15a0;
  double local_1598;
  double local_1590;
  double local_1588;
  double dStack_1580;
  double local_1578;
  double local_1570;
  double local_1568;
  double local_1560;
  double local_1558;
  double dStack_1550;
  double local_1548;
  double local_1540;
  double local_1538;
  double local_1518;
  double local_1510;
  double dStack_1508;
  double local_1500;
  double dStack_14f8;
  double local_14f0;
  double local_14e8;
  double local_14e0;
  double local_14d8;
  double local_14d0;
  double local_14c8;
  double local_14c0;
  double local_14b8;
  double local_14b0;
  double local_14a8;
  double local_14a0;
  double local_1498;
  double local_1490;
  double local_1488;
  double local_1468;
  double local_1460;
  double dStack_1458;
  double local_1450;
  double dStack_1448;
  double local_1440;
  double dStack_1438;
  double local_1430;
  double local_1428;
  double local_1420;
  double local_1418;
  double local_1410;
  double local_1408;
  double local_1400;
  double local_13f8;
  double local_13f0;
  double local_13e8;
  double local_13e0;
  double local_13b8;
  double local_13b0;
  double dStack_13a8;
  undefined1 local_13a0 [16];
  double local_1390;
  double local_1388;
  double dStack_1380;
  double local_1378;
  double local_1370;
  double local_1368;
  double local_1360;
  double local_1358;
  double local_1350;
  double local_1348;
  double local_1340;
  double local_1330;
  double local_1328;
  double local_1308;
  double local_1300;
  double dStack_12f8;
  double local_12f0;
  double local_12e8;
  double local_12e0;
  double local_12d8;
  double local_12d0;
  double local_12c8;
  double local_12c0;
  double local_12b8;
  double local_12b0;
  double local_12a8;
  double local_12a0;
  double local_1298;
  double local_1290;
  double local_1288;
  double local_1280;
  double local_1278;
  double local_1258;
  double local_1250;
  double local_1248;
  double local_1240;
  double dStack_1238;
  double local_1230;
  double dStack_1228;
  double dStack_1220;
  double local_1210;
  double local_1208;
  double local_1200;
  double local_11f8;
  double local_11f0;
  double local_11e8;
  double local_11e0;
  double local_11d8;
  double local_11d0;
  double local_11a8;
  double local_11a0;
  double local_1198;
  double local_1190;
  double local_1188;
  double local_1180;
  double local_1178;
  double dStack_1170;
  double local_1168;
  double local_1160;
  double local_1158;
  double local_1140;
  double local_1138;
  double local_1128;
  double local_10f8;
  double local_10f0;
  double local_10e8;
  double local_10e0;
  double local_10d8;
  double local_10d0;
  double local_10c0;
  double local_10b8;
  double local_10b0;
  double local_10a8;
  double local_10a0;
  double local_1098;
  double local_1090;
  double local_1088;
  double local_1078;
  double local_1048;
  double local_1040;
  double local_1038;
  double local_1030;
  double local_1028;
  double local_1020;
  double local_1018;
  double local_1010;
  double local_1008;
  double local_1000;
  double local_ff8;
  double dStack_ff0;
  double local_fe0;
  double dStack_fd8;
  double local_fd0;
  double local_fc8;
  double local_fc0;
  double local_fb8;
  double local_f98;
  double local_f90;
  double dStack_f88;
  double local_f80;
  double local_f78;
  double local_f70;
  double local_f68;
  double local_f60;
  double local_f58;
  double local_f50;
  double local_f48;
  double dStack_f40;
  double local_f38;
  double local_f30;
  double local_f28;
  double local_f20;
  double local_f18;
  double local_f10;
  double local_f08;
  double local_ee8;
  double local_ee0;
  double dStack_ed8;
  double local_ed0;
  double local_ec8;
  double local_ec0;
  double local_eb8;
  double local_eb0;
  double local_ea8;
  double local_ea0;
  double local_e98;
  double dStack_e90;
  double dStack_e88;
  double local_e80;
  double local_e78;
  double local_e70;
  double local_e68;
  double local_e60;
  double local_e58;
  double local_e38;
  double local_e30;
  double dStack_e28;
  double local_e20;
  double local_e18;
  double local_e08;
  double local_e00;
  double local_df8;
  double local_df0;
  double local_de8;
  double local_de0;
  double local_dd8;
  double local_dd0;
  double local_dc8;
  double local_dc0;
  double local_db8;
  double local_db0;
  double local_da8;
  double local_d88;
  double local_d80;
  double local_d78;
  double local_d70;
  double local_d68;
  double local_d60;
  double local_d58;
  double local_d50;
  double local_d48;
  double local_d40;
  double local_d38;
  double local_d30;
  double local_d28;
  double local_d20;
  double local_d18;
  double local_d08;
  double local_cd8;
  double local_cd0;
  double local_cc8;
  double local_cc0;
  double local_cb8;
  double local_cb0;
  double local_ca8;
  double dStack_ca0;
  double local_c98;
  double local_c90;
  double local_c88;
  double local_c80;
  double local_c78;
  double local_c70;
  double local_c68;
  double local_c60;
  double local_c50;
  double local_c20;
  double local_c18;
  double local_c10;
  double local_c08;
  double local_bf8;
  double local_be0;
  double local_bb8;
  double local_bb0;
  double local_b70;
  double local_b68;
  double local_b60;
  double local_b48;
  double local_b40;
  double local_b38;
  double dStack_b30;
  double local_b10;
  double local_af8;
  double local_af0;
  double local_ac8;
  double local_ac0;
  double local_ab8;
  double local_ab0;
  double local_aa8;
  double local_aa0;
  double local_a98;
  double local_a80;
  double local_a78;
  double local_a58;
  double local_a48;
  double local_a40;
  double local_a38;
  double local_a18;
  double local_a10;
  double dStack_a08;
  double local_a00;
  double local_9f8;
  double local_9f0;
  double local_9e8;
  double local_9e0;
  double local_9d0;
  double local_9c8;
  double local_9c0;
  double local_9b8;
  double local_9b0;
  double local_9a8;
  double local_9a0;
  double local_998;
  double local_990;
  double local_988;
  double local_960;
  double local_950;
  double local_938;
  double local_930;
  double local_928;
  double local_8b8;
  double local_8b0;
  double dStack_8a8;
  double local_8a0;
  double local_898;
  double local_890;
  double local_888;
  double local_880;
  double local_878;
  double local_870;
  double local_868;
  double local_860;
  double local_858;
  double local_850;
  double local_848;
  double local_838;
  double local_830;
  double local_828;
  double local_808 [10];
  undefined1 local_7b8 [16];
  double local_7a8;
  double dStack_7a0;
  double dStack_798;
  double dStack_790;
  double dStack_788;
  double dStack_780;
  double local_778;
  double local_760;
  double local_758;
  ulong uStack_750;
  double local_748;
  double dStack_740;
  double local_738;
  undefined8 uStack_730;
  double local_728;
  ulong uStack_720;
  double local_718;
  double dStack_710;
  double local_708;
  double dStack_700;
  double local_6f8;
  undefined8 uStack_6f0;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double local_6c8;
  undefined8 uStack_6c0;
  double local_6b8;
  undefined8 uStack_6b0;
  double local_6a8;
  undefined8 uStack_6a0;
  double local_698;
  double dStack_690;
  double local_688;
  Real RStack_680;
  double local_678;
  undefined8 uStack_670;
  double local_668;
  undefined8 uStack_660;
  double local_658;
  double dStack_650;
  double local_648;
  double dStack_640;
  Real local_638;
  Real RStack_630;
  double local_628;
  undefined8 uStack_620;
  double local_618;
  undefined8 uStack_610;
  double local_608;
  Real RStack_600;
  double local_5f8;
  double dStack_5f0;
  double local_5e8;
  Real RStack_5e0;
  double local_5d8;
  double local_5c8;
  undefined8 uStack_5c0;
  double local_5b8;
  Real RStack_5b0;
  double local_5a8;
  Real RStack_5a0;
  double local_598;
  Real RStack_590;
  double local_588;
  double dStack_580;
  double local_578;
  undefined8 uStack_570;
  double local_568;
  undefined8 uStack_560;
  Real c_R [21];
  Real dcRdT [21];
  undefined4 uStack_384;
  undefined4 uStack_380;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double local_260;
  double local_258;
  double local_248;
  undefined8 uStack_240;
  double local_238 [22];
  Real massfrac [21];
  double adStack_d8 [21];
  
  prVar16 = N_VGetArrayPointer(u);
  iVar2 = *(int *)((long)user_data + 0x14);
  uVar25 = 0;
  uVar20 = (ulong)*(uint *)((long)user_data + 8);
  if ((int)*(uint *)((long)user_data + 8) < 1) {
    uVar20 = uVar25;
  }
  __s = local_1680 + 1;
  prVar24 = prVar16;
  for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
    local_238[0] = 2.016;
    local_238[1] = 1.008;
    local_238[2] = 15.999;
    local_238[3] = 31.998;
    local_238[4] = 17.007;
    local_238[5] = 18.015;
    local_238[6] = 33.006;
    local_238[7] = 14.027;
    local_238[8] = 14.027;
    local_238[9] = 15.035;
    local_238[10] = 16.043;
    local_238[0xb] = 28.01;
    local_238[0xc] = 44.009;
    local_238[0xd] = 29.018;
    local_238[0xe] = 30.026;
    local_238[0xf] = 31.034;
    local_238[0x10] = 28.054;
    local_238[0x11] = 29.062;
    local_238[0x12] = 30.07;
    local_238[0x13] = 28.014;
    local_238[0x14] = 39.95;
    dVar47 = 0.0;
    for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
      dVar47 = dVar47 + prVar24[lVar17];
    }
    dVar1 = prVar16[uVar21 * 0x16 + 0x15];
    memset(massfrac,0,0xa8);
    for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
      massfrac[lVar17] = prVar24[lVar17] / dVar47;
    }
    memset(__s,0,0xf20);
    local_1f28[0] = 0.49603174603174605;
    local_1f28[1] = 0.9920634920634921;
    local_1f28[2] = 0.06250390649415588;
    local_1f28[3] = 0.03125195324707794;
    local_1f28[4] = 0.05879931792791203;
    local_1f28[5] = 0.055509297807382736;
    local_1f28[6] = 0.030297521662727988;
    auStack_1ef0 = (undefined1  [8])0x3fb24021df7a429e;
    local_1ee8 = 0.07129108148570615;
    dStack_1ee0 = 0.06651147322913202;
    local_1ed8 = (undefined1  [8])0x3fafea0b02aa32d7;
    dStack_1ed0 = 0.035701535166012134;
    local_1ec8 = 0.022722624917630486;
    dStack_1ec0 = 0.03446136880556896;
    local_1eb8 = 0.033304469459801506;
    dStack_1eb0 = 0.032222723464587225;
    local_1ea8 = 0.035645540742853074;
    dStack_1ea0 = 0.034409194136673316;
    local_1e98 = 0.03325573661456601;
    uStack_1e90 = 0x3fa246cdaf410bdd;
    local_1e88 = 0x3f99a1cd6070c7ee;
    for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
      adStack_d8[lVar17] = massfrac[lVar17] * dVar47 * local_1f28[lVar17];
    }
    for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
      local_1de8[lVar17] = adStack_d8[lVar17] * 1000000.0;
    }
    for (lVar17 = 0; lVar17 != 0x1e4; lVar17 = lVar17 + 1) {
      local_1680[lVar17 + 1] = 0.0;
    }
    for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
      local_1f28[lVar17] = 0.0;
    }
    dVar26 = log(dVar1);
    local_1808 = dVar1 * dVar1;
    uStack_1800 = 0;
    local_568 = dVar1 * local_1808;
    dVar47 = 1.0 / dVar1;
    local_19a8 = 12186.6002121605 / dVar1;
    uStack_19a0 = 0;
    local_1d28 = 0.0;
    for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
      local_1d28 = local_1d28 + local_1de8[lVar17];
    }
    local_6a8 = dVar1 * local_568;
    if (1000.0 <= dVar1) {
      local_1868 = local_6a8 * -1.00127688e-15 +
                   local_568 * 1.496386616666667e-11 +
                   local_1808 * -8.324279633333333e-08 +
                   dVar1 * 2.470123655e-05 + dVar26 * -3.3372792 + dVar47 * -950.158922 + 6.54230251
      ;
      local_1d18 = local_6a8 * -2.490986785e-23 +
                   local_568 * 3.945960291666667e-19 +
                   local_1808 * -2.692699133333334e-15 +
                   dVar1 * 1.154214865e-11 +
                   dVar26 * -2.50000001 + dVar47 * 25473.6599 + 2.946682924;
      local_1848 = local_6a8 * 2.667543555e-15 +
                   local_568 * -4.909681483333334e-11 +
                   local_1808 * 4.140760216666667e-07 +
                   dVar1 * -0.00247847763 + dVar26 * -2.77217438 + dVar47 * 4011.91815 + -7.02617054
      ;
      dStack_1840 = local_6a8 * 2.33577197e-15 +
                    local_568 * -4.9640387e-11 +
                    local_1808 * 4.978572466666667e-07 +
                    dVar1 * -0.003619950185 +
                    dVar26 * -2.28571772 + dVar47 * 16775.5843 + -6.19435407;
      local_1858 = local_6a8 * 1.01823858e-15 +
                   local_568 * -1.9171084e-11 +
                   local_1808 * 1.664709618333334e-07 +
                   dVar1 * -0.001031263715 +
                   dVar26 * -2.71518561 + dVar47 * -14151.8724 + -5.10350211;
      dStack_1850 = local_6a8 * -5.8706188e-16 +
                    local_568 * 7.3288463e-12 +
                    local_1808 * -2.108420466666667e-08 +
                    dVar1 * -0.000274214858 + dVar26 * -3.09288767 + dVar47 * 3858.657 + -1.38380843
      ;
      local_1c28 = local_6a8 * 1.08358897e-15 +
                   local_568 * -1.745587958333333e-11 +
                   local_1808 * 1.263277781666667e-07 +
                   dVar1 * -0.00074154377 +
                   dVar26 * -3.28253784 + dVar47 * -1088.45772 + -2.17069345;
      dStack_1c20 = local_6a8 * 4.419278200000001e-15 +
                    local_568 * -8.386767666666666e-11 +
                    local_1808 * 7.370980216666666e-07 +
                    dVar1 * -0.00460000041 +
                    dVar26 * -1.76069008 + dVar47 * -13995.8323 + -11.89563292;
      local_1bc8 = local_6a8 * 1.698581825e-15 +
                   local_568 * -3.48255e-11 +
                   local_1808 * 3.353199116666667e-07 +
                   dVar1 * -0.002327943185 +
                   dVar26 * -2.29203842 + dVar47 * 50925.9997 + -6.33446327;
      dStack_1bc0 = local_6a8 * 9.38637835e-16 +
                    local_568 * -2.168162908333333e-11 +
                    local_1808 * 2.348243283333333e-07 +
                    dVar1 * -0.00182819646 + dVar26 * -2.87410113 + dVar47 * 46263.604 + -3.29709211
      ;
      local_748 = local_6a8 * 7.4820788e-15 +
                  local_568 * -1.460147408333333e-10 +
                  local_1808 * 1.330344446666667e-06 +
                  dVar1 * -0.0086986361 + dVar26 * -1.95465642 + dVar47 * 12857.52 + -11.50777788;
      dStack_740 = local_6a8 * -6.141684549999999e-17 +
                   local_568 * 8.348149916666666e-13 +
                   local_1808 * -6.991409816666667e-09 +
                   dVar1 * 4.298705685e-05 +
                   dVar26 * -2.56942078 + dVar47 * 29217.5791 + -2.214917859999999;
      local_1ce8._8_8_ =
           local_6a8 * -8.4100496e-16 +
           local_568 * 8.08683225e-12 +
           local_1808 * 2.734541966666666e-08 +
           dVar1 * -0.00108845902 + dVar26 * -3.03399249 + dVar47 * -30004.2971 + -1.93277761;
      local_1ce8._0_8_ =
           local_6a8 * 5.39542675e-16 +
           local_568 * -9.520530833333334e-12 +
           local_1808 * 1.056096916666667e-07 +
           dVar1 * -0.001119910065 + dVar26 * -4.0172109 + dVar47 * 111.856713 + 0.2321087500000001;
      local_1d38 = local_6a8 * 2.36042082e-15 +
                   local_568 * -4.362418233333334e-11 +
                   local_1808 * 3.691356733333334e-07 +
                   dVar1 * -0.00220718513 + dVar26 * -3.85746029 + dVar47 * -48759.166 + 1.58582223;
      dStack_1d30 = local_6a8 * 5.0907615e-15 +
                    local_568 * -1.019104458333333e-10 +
                    local_1808 * 9.554763483333333e-07 +
                    dVar1 * -0.00669547335 +
                    dVar26 * -0.074851495 + dVar47 * -9468.34459 + -18.362466505;
      local_698 = local_6a8 * 6.28530305e-15 +
                  local_568 * -1.226857691666667e-10 +
                  local_1808 * 1.118463191666667e-06 +
                  dVar1 * -0.00732270755 +
                  dVar26 * -2.03611116 + dVar47 * 4939.88614 + -8.269258140000002;
      dStack_690 = local_6a8 * 1.056308e-15 +
                   local_568 * -3.287025833333333e-11 +
                   local_1808 * 4.427306666666667e-07 +
                   dVar1 * -0.0039357485 + dVar26 * -3.770799 + dVar47 * 127.83252 + 0.841224;
      local_758 = local_6a8 * 9.5001445e-15 +
                  local_568 * -1.845100008333333e-10 +
                  local_1808 * 1.67093445e-06 +
                  dVar1 * -0.01084263385 + dVar26 * -1.0718815 + dVar47 * -11426.3932 + -14.0437292;
      dVar27 = local_568 * -8.414198333333333e-12 +
               local_1808 * 9.474600000000001e-08 +
               dVar1 * -0.0007439884 + dVar26 * -2.92664 + dVar47 * -922.7977 + -3.053888;
      dVar48 = local_6a8 * 3.3766755e-16;
    }
    else {
      local_1868 = local_6a8 * 3.688058805e-13 +
                   local_568 * -1.67976745e-09 +
                   local_1808 * 3.2463585e-06 +
                   dVar1 * -0.003990260375 +
                   dVar26 * -2.34433112 + dVar47 * -917.935173 + 1.661320882;
      local_1d18 = local_6a8 * 4.63866166e-23 +
                   local_568 * -1.917346933333333e-19 +
                   local_1808 * 3.326532733333333e-16 +
                   dVar1 * -3.526664095e-13 + dVar26 * -2.5 + dVar47 * 25473.6599 + 2.946682853;
      local_1848 = local_6a8 * -2.168844325e-13 +
                   local_568 * 1.109534108333333e-09 +
                   local_1808 * -2.296657433333333e-06 +
                   dVar1 * 0.00162196266 +
                   dVar26 * -4.22118584 + dVar47 * 3839.56496 + 0.8268134100000002;
      dStack_1840 = local_6a8 * -1.27192867e-13 +
                    local_568 * 5.725978541666666e-10 +
                    local_1808 * -9.550364266666668e-07 +
                    dVar1 * -0.001005475875 + dVar26 * -3.6735904 + dVar47 * 16444.9988 + 2.06902607
      ;
      local_1858 = local_6a8 * 4.522122495e-14 +
                   local_568 * -7.558382366666667e-11 +
                   local_1808 * -1.69469055e-07 +
                   dVar1 * 0.00030517684 +
                   dVar26 * -3.57953347 + dVar47 * -14344.086 + 0.07112418999999992;
      dStack_1850 = local_6a8 * -6.8205735e-14 +
                    local_568 * 3.234277775e-10 +
                    local_1808 * -7.696564016666666e-07 +
                    dVar1 * 0.00120065876 + dVar26 * -3.99201543 + dVar47 * 3615.08056 + 4.095940888
      ;
      local_1c28 = local_6a8 * -1.621864185e-13 +
                   local_568 * 8.067745908333334e-10 +
                   local_1808 * -1.641217001666667e-06 +
                   dVar1 * 0.00149836708 +
                   dVar26 * -3.78245636 + dVar47 * -1063.94356 + 0.1247806300000001;
      dStack_1c20 = local_6a8 * -6.5886326e-13 +
                    local_568 * 3.160710508333333e-09 +
                    local_1808 * -6.220333466666666e-06 +
                    dVar1 * 0.004954166845 +
                    dVar26 * -4.79372315 + dVar47 * -14308.9567 + 4.19091025;
      local_1bc8 = local_6a8 * -9.71573685e-14 +
                   local_568 * 5.573466508333334e-10 +
                   local_1808 * -1.372160366666667e-06 +
                   dVar1 * 0.001183307095 + dVar26 * -4.19860411 + dVar47 * 50496.8163 + 4.967723077
      ;
      dStack_1bc0 = local_6a8 * -8.43708595e-14 +
                    local_568 * 3.209092941666667e-10 +
                    local_1808 * -4.658164016666667e-07 +
                    dVar1 * -0.0004844360715 +
                    dVar26 * -3.76267867 + dVar47 * 46004.0401 + 2.20014682;
      local_748 = local_6a8 * -1.15254502e-12 +
                  local_568 * 4.992721716666666e-09 +
                  local_1808 * -8.28571345e-06 +
                  dVar1 * 0.00209329446 +
                  dVar26 * -4.30646568 + dVar47 * 12841.6265 + -0.4007435600000004;
      dStack_740 = local_6a8 * -1.056329855e-13 +
                   local_568 * 5.106721866666666e-10 +
                   local_1808 * -1.107177326666667e-06 +
                   dVar1 * 0.00163965942 + dVar26 * -3.1682671 + dVar47 * 29122.2592 + 1.11633364;
      local_1ce8._8_8_ =
           local_6a8 * -8.85989085e-14 +
           local_568 * 4.57330885e-10 +
           local_1808 * -1.086733685e-06 +
           dVar1 * 0.00101821705 + dVar26 * -4.19864056 + dVar47 * -30293.7267 + 5.047672768;
      local_1ce8._0_8_ =
           local_6a8 * -4.646125620000001e-13 +
           local_568 * 2.02303245e-09 +
           local_1808 * -3.526381516666666e-06 +
           dVar1 * 0.002374560255 + dVar26 * -4.30179801 + dVar47 * 294.80804 + 0.5851355599999999;
      local_1d38 = local_6a8 * 7.184977399999999e-15 +
                   local_568 * -2.049325183333333e-10 +
                   local_1808 * 1.187260448333333e-06 +
                   dVar1 * -0.004492298385 +
                   dVar26 * -2.35677352 + dVar47 * -48371.9697 + -7.5442787;
      dStack_1d30 = local_6a8 * -8.3346978e-13 +
                    local_568 * 4.039525216666667e-09 +
                    local_1808 * -8.19667665e-06 +
                    dVar1 * 0.0068354894 +
                    dVar26 * -5.14987613 + dVar47 * -10246.6476 + 9.791179889999999;
      local_698 = local_6a8 * -1.349421865e-12 +
                  local_568 * 5.763239608333333e-09 +
                  local_1808 * -9.516504866666667e-06 +
                  dVar1 * 0.003785261235 +
                  dVar26 * -3.95920148 + dVar47 * 5089.77593 + -0.1381294799999999;
      dStack_690 = local_6a8 * -1.037805e-13 +
                   local_568 * 6.14803e-10 +
                   local_1808 * -8.897453333333333e-07 +
                   dVar1 * -0.0036082975 + dVar26 * -2.106204 + dVar47 * 978.6011 + -11.045973;
      local_758 = local_6a8 * -1.343428855e-12 +
                  local_568 * 5.903885708333334e-09 +
                  local_1808 * -9.990638133333334e-06 +
                  dVar1 * 0.00275077135 + dVar26 * -4.29142492 + dVar47 * -11522.2055 + 1.62460176;
      dVar27 = local_568 * -4.701262500000001e-10 +
               local_1808 * 6.605369999999999e-07 +
               dVar1 * -0.0007041202 +
               dVar26 * -3.298677 + dVar47 * -1020.8999 + -0.6516950000000001;
      dVar48 = local_6a8 * 1.222427e-13;
    }
    dStack_1d10 = 0.0;
    dVar28 = dVar47 * dVar47;
    dVar29 = 1.0 / (12186.6002121605 / dVar1);
    local_1df8._8_4_ = (int)extraout_XMM0_Qb;
    local_1df8._0_8_ = dVar26;
    local_1df8._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    if (1000.0 <= dVar1) {
      h_RT[0] = dVar47 * -950.158922 +
                local_6a8 * 4.00510752e-15 +
                local_568 * -4.48915985e-11 +
                local_1808 * 1.66485593e-07 + dVar1 * -2.47012365e-05 + 3.3372792;
      h_RT[1] = dVar47 * 25473.6599 +
                local_6a8 * 9.96394714e-23 +
                local_568 * -1.18378809e-18 +
                local_1808 * 5.38539827e-15 + dVar1 * -1.15421486e-11 + 2.50000001;
      h_RT[2] = dVar47 * 29217.5791 +
                local_6a8 * 2.45667382e-16 +
                local_568 * -2.50444497e-12 +
                local_1808 * 1.39828196e-08 + dVar1 * -4.29870569e-05 + 2.56942078;
      h_RT[3] = dVar47 * -1088.45772 +
                local_6a8 * -4.33435588e-15 +
                local_568 * 5.23676387e-11 +
                local_1808 * -2.52655556e-07 + dVar1 * 0.00074154377 + 3.28253784;
      h_RT[4] = dVar47 * 3858.657 +
                local_6a8 * 2.34824752e-15 +
                local_568 * -2.19865389e-11 +
                local_1808 * 4.21684093e-08 + dVar1 * 0.000274214858 + 3.09288767;
      h_RT[5] = dVar47 * -30004.2971 +
                local_6a8 * 3.36401984e-15 +
                local_568 * -2.42604967e-11 +
                local_1808 * -5.46908393e-08 + dVar1 * 0.00108845902 + 3.03399249;
      h_RT[6] = dVar47 * 111.856713 +
                local_6a8 * -2.1581707e-15 +
                local_568 * 2.85615925e-11 +
                local_1808 * -2.11219383e-07 + dVar1 * 0.00111991006 + 4.0172109;
      dVar123 = dVar47 * 46263.604 +
                local_6a8 * -3.75455134e-15 +
                local_568 * 6.50448872e-11 +
                local_1808 * -4.69648657e-07 + dVar1 * 0.00182819646 + 2.87410113;
      h_RT[8] = dVar47 * 50925.9997 +
                local_6a8 * -6.7943273e-15 +
                local_568 * 1.044765e-10 +
                local_1808 * -6.70639823e-07 + dVar1 * 0.00232794318 + 2.29203842;
      h_RT[10] = dVar47 * -9468.34459 +
                 local_6a8 * -2.0363046e-14 +
                 local_568 * 3.05731338e-10 +
                 local_1808 * -1.9109527e-06 + dVar1 * 0.00669547335 + 0.074851495;
      h_RT[0xb] = dVar47 * -14151.8724 +
                  local_6a8 * -4.07295432e-15 +
                  local_568 * 5.7513252e-11 +
                  local_1808 * -3.32941924e-07 + dVar1 * 0.00103126372 + 2.71518561;
      h_RT[0xc] = dVar47 * -48759.166 +
                  local_6a8 * -9.44168328e-15 +
                  local_568 * 1.30872547e-10 +
                  local_1808 * -7.38271347e-07 + dVar1 * 0.00220718513 + 3.85746029;
      h_RT[0xd] = dVar47 * 4011.91815 +
                  local_6a8 * -1.06701742e-14 +
                  local_568 * 1.47290445e-10 +
                  local_1808 * -8.28152043e-07 + dVar1 * 0.00247847763 + 2.77217438;
      h_RT[0xe] = dVar47 * -13995.8323 +
                  local_6a8 * -1.76771128e-14 +
                  local_568 * 2.5160303e-10 +
                  local_1808 * -1.47419604e-06 + dVar1 * 0.00460000041 + 1.76069008;
      h_RT[0xf] = dVar47 * 127.83252 +
                  local_6a8 * -4.225232e-15 +
                  local_568 * 9.8610775e-11 +
                  local_1808 * -8.85461333e-07 + dVar1 * 0.0039357485 + 3.770799;
      h_RT[0x10] = dVar47 * 4939.88614 +
                   local_6a8 * -2.51412122e-14 +
                   local_568 * 3.68057308e-10 +
                   local_1808 * -2.23692638e-06 + dVar1 * 0.00732270755 + 2.03611116;
      h_RT[0x11] = dVar47 * 12857.52 +
                   local_6a8 * -2.99283152e-14 +
                   local_568 * 4.38044223e-10 +
                   local_1808 * -2.66068889e-06 + dVar1 * 0.0086986361 + 1.95465642;
      h_RT[0x12] = dVar47 * -11426.3932 +
                   local_6a8 * -3.8000578e-14 +
                   local_568 * 5.53530003e-10 +
                   local_1808 * -3.3418689e-06 + dVar1 * 0.0108426339 + 1.0718815;
      dVar67 = local_6a8 * -1.3506702e-15 +
               local_568 * 2.5242595e-11 +
               local_1808 * -1.89492e-07 + dVar1 * 0.0007439884 + 2.92664;
      dVar80 = local_6a8 * -9.34308788e-15 +
               local_568 * 1.48921161e-10 +
               local_1808 * -9.95714493e-07 + dVar1 * 0.00361995018 + 2.28571772;
      dVar31 = -922.7977;
      dVar53 = 16775.5843;
    }
    else {
      h_RT[0] = dVar47 * -917.935173 +
                local_6a8 * -1.47522352e-12 +
                local_568 * 5.03930235e-09 +
                local_1808 * -6.492717e-06 + dVar1 * 0.00399026037 + 2.34433112;
      h_RT[1] = dVar47 * 25473.6599 +
                local_6a8 * -1.85546466e-22 +
                local_568 * 5.7520408e-19 +
                local_1808 * -6.65306547e-16 + dVar1 * 3.52666409e-13 + 2.5;
      h_RT[2] = dVar47 * 29122.2592 +
                local_6a8 * 4.22531942e-13 +
                local_568 * -1.53201656e-09 +
                local_1808 * 2.21435465e-06 + dVar1 * -0.00163965942 + 3.1682671;
      h_RT[3] = dVar47 * -1063.94356 +
                local_6a8 * 6.48745674e-13 +
                local_568 * -2.42032377e-09 +
                local_1808 * 3.282434e-06 + dVar1 * -0.00149836708 + 3.78245636;
      h_RT[4] = dVar47 * 3615.08056 +
                local_6a8 * 2.7282294e-13 +
                local_568 * -9.70283332e-10 +
                local_1808 * 1.5393128e-06 + dVar1 * -0.00120065876 + 3.99201543;
      h_RT[5] = dVar47 * -30293.7267 +
                local_6a8 * 3.54395634e-13 +
                local_568 * -1.37199266e-09 +
                local_1808 * 2.17346737e-06 + dVar1 * -0.00101821705 + 4.19864056;
      h_RT[6] = dVar47 * 294.80804 +
                local_6a8 * 1.85845025e-12 +
                local_568 * -6.06909735e-09 +
                local_1808 * 7.05276303e-06 + dVar1 * -0.00237456025 + 4.30179801;
      dVar123 = dVar47 * 46004.0401 +
                local_6a8 * 3.37483438e-13 +
                local_568 * -9.62727883e-10 +
                local_1808 * 9.31632803e-07 + dVar1 * 0.000484436072 + 3.76267867;
      h_RT[8] = dVar47 * 50496.8163 +
                local_6a8 * 3.88629474e-13 +
                local_568 * -1.67203995e-09 +
                local_1808 * 2.74432073e-06 + dVar1 * -0.0011833071 + 4.19860411;
      h_RT[10] = dVar47 * -10246.6476 +
                 local_6a8 * 3.33387912e-12 +
                 local_568 * -1.21185757e-08 +
                 local_1808 * 1.63933533e-05 + dVar1 * -0.0068354894 + 5.14987613;
      h_RT[0xb] = dVar47 * -14344.086 +
                  local_6a8 * -1.808849e-13 +
                  local_568 * 2.26751471e-10 +
                  local_1808 * 3.3893811e-07 + dVar1 * -0.00030517684 + 3.57953347;
      h_RT[0xc] = dVar47 * -48371.9697 +
                  local_6a8 * -2.87399096e-14 +
                  local_568 * 6.14797555e-10 +
                  local_1808 * -2.3745209e-06 + dVar1 * 0.00449229839 + 2.35677352;
      h_RT[0xd] = dVar47 * 3839.56496 +
                  local_6a8 * 8.6753773e-13 +
                  local_568 * -3.32860233e-09 +
                  local_1808 * 4.59331487e-06 + dVar1 * -0.00162196266 + 4.22118584;
      h_RT[0xe] = dVar47 * -14308.9567 +
                  local_6a8 * 2.63545304e-12 +
                  local_568 * -9.48213152e-09 +
                  local_1808 * 1.24406669e-05 + dVar1 * -0.00495416684 + 4.79372315;
      h_RT[0xf] = dVar47 * 978.6011 +
                  local_6a8 * 4.15122e-13 +
                  local_568 * -1.844409e-09 +
                  local_1808 * 1.77949067e-06 + dVar1 * 0.0036082975 + 2.106204;
      h_RT[0x10] = dVar47 * 5089.77593 +
                   local_6a8 * 5.39768746e-12 +
                   local_568 * -1.72897188e-08 +
                   local_1808 * 1.90330097e-05 + dVar1 * -0.00378526124 + 3.95920148;
      h_RT[0x11] = dVar47 * 12841.6265 +
                   local_6a8 * 4.61018008e-12 +
                   local_568 * -1.49781651e-08 +
                   local_1808 * 1.65714269e-05 + dVar1 * -0.00209329446 + 4.30646568;
      h_RT[0x12] = dVar47 * -11522.2055 +
                   local_6a8 * 5.37371542e-12 +
                   local_568 * -1.77116571e-08 +
                   local_1808 * 1.99812763e-05 + dVar1 * -0.00275077135 + 4.29142492;
      dVar67 = local_6a8 * -4.889708e-13 +
               local_568 * 1.41037875e-09 +
               local_1808 * -1.321074e-06 + dVar1 * 0.0007041202 + 3.298677;
      dVar80 = local_6a8 * 5.08771468e-13 +
               local_568 * -1.71779356e-09 +
               local_1808 * 1.91007285e-06 + dVar1 * 0.00100547588 + 3.6735904;
      dVar31 = -1020.8999;
      dVar53 = 16444.9988;
    }
    h_RT[0x13] = dVar47 * dVar31 + dVar67;
    h_RT[9] = dVar47 * dVar53 + dVar80;
    auVar132._8_4_ = SUB84(h_RT[9],0);
    auVar132._0_8_ = h_RT[0x13];
    auVar132._12_4_ = (int)((ulong)h_RT[9] >> 0x20);
    dVar80 = dVar1 * 0.0;
    dVar125 = local_1808 * 0.0;
    uStack_560 = 0;
    dVar137 = local_568 * 0.0;
    uStack_6a0 = 0;
    dVar134 = local_6a8 * 0.0;
    h_RT[0x14] = dVar47 * -745.375 + dVar80 + 2.5 + dVar125 + dVar137 + dVar134;
    dVar68 = local_1de8[0x14] * -0.30000000000000004 +
             local_1de8[0x12] + local_1de8[0x12] +
             local_1de8[0xb] * 0.5 +
             local_1de8[5] * 5.0 + local_1de8[0] + local_1d28 + local_1de8[10] + local_1de8[0xc];
    dVar81 = local_1de8[1] * local_1de8[7];
    dVar49 = dVar47 * -0.0;
    dVar69 = dVar26 * -0.8 + dVar49;
    h_RT[7] = dVar123;
    uStack_1860 = (ulong)dStack_1d10;
    uStack_750 = (ulong)dStack_1d10;
    dVar30 = exp(dVar69);
    dVar30 = dVar30 * 25000000000.0;
    dVar31 = exp((double)local_1df8._0_8_ * -3.14 + dVar47 * -618.9564989398057);
    dVar50 = ((dVar68 * 1e-12) / dVar30) * dVar31 * 3.2e+27;
    dVar32 = log10(dVar50);
    local_1e58 = exp(dVar1 / -78.0);
    local_1e58 = local_1e58 * 0.31999999999999995;
    dVar33 = exp(dVar1 / -1995.0);
    dVar34 = exp(dVar47 * -5590.0);
    dVar51 = local_1e58 + dVar33 * 0.68 + dVar34;
    local_1e38 = log10(dVar51);
    local_1e68 = local_1e38 * -1.27 + 0.75;
    dVar32 = local_1e38 * -0.67 + -0.4 + dVar32;
    dVar82 = 1.0 / (dVar32 * -0.14 + local_1e68);
    dVar32 = dVar32 * dVar82;
    dVar70 = 1.0 / (dVar32 * dVar32 + 1.0);
    local_1918 = pow(10.0,local_1e38 * dVar70);
    dVar53 = local_1de8[9];
    local_1838 = dStack_1840;
    dStack_1830 = dStack_1840;
    dVar35 = exp((dStack_1bc0 + local_1d18) - dStack_1840);
    RVar9 = h_RT[1];
    dVar67 = local_1de8[10];
    dVar31 = local_1de8[1];
    dVar111 = local_1e58 / -78.0;
    dVar71 = (local_1e38 + local_1e38) * dVar70 * dVar70 * dVar32 * dVar82;
    dVar82 = -local_1e68 * dVar71 * dVar82;
    local_1e58 = dVar28 * 0.0;
    dStack_1e50 = 0.0;
    dVar115 = dVar47 * -0.8 + local_1e58;
    dVar72 = dVar50 + 1.0;
    dVar52 = ((dVar47 * -3.14 + dVar28 * 618.9564989398057) - dVar115) * 0.43429448190325176;
    dVar35 = dVar30 / (dVar35 * dVar29);
    dStack_20a0 = auVar132._8_8_;
    dVar126 = (dVar50 / dVar72) * local_1918;
    dVar50 = (dVar30 * dVar81 - dVar53 * dVar35) * dVar126;
    dVar123 = (dVar115 * dVar30 * dVar81 -
              (dVar115 - ((dStack_20a0 - (dVar123 + h_RT[1])) + 1.0) * dVar47) * dVar35 * dVar53) *
              dVar126 + (dVar52 * dVar82 +
                         (dVar71 * dVar32 * -1.27 + dVar82 * -0.67 + dVar70) *
                         (dVar34 * 5590.0 * dVar28 + (dVar33 * 0.68) / -1995.0 + dVar111) *
                         (0.43429448190325176 / dVar51) + dVar52 / dVar72) * 2.302585092994046 *
                        dVar50;
    local_1f28[1] = local_1f28[1] - dVar50;
    auStack_1ef0 = (undefined1  [8])((double)auStack_1ef0 - dVar50);
    dStack_1ee0 = dStack_1ee0 + dVar50;
    dVar30 = dVar30 * dVar126;
    dVar126 = dVar126 * dVar35;
    dVar32 = (1.0 / dVar72 + dVar82) * (dVar50 / dVar68);
    if (iVar2 == 2) {
      local_1670 = local_1670 - dVar32;
      local_1640 = local_1640 - dVar32;
      local_1630 = local_1630 + dVar32;
      dVar33 = local_1de8[7] * dVar30;
      auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ - dVar33;
      local_1590 = local_1590 - dVar33;
      dStack_1580 = dVar33 + dStack_1580;
      dVar33 = dVar32 * 5.0;
      local_1300 = local_1300 - dVar33;
      local_12d0 = local_12d0 - dVar33;
      local_12c0 = dVar33 + local_12c0;
      dVar30 = dVar30 * local_1de8[1];
      local_11a0 = local_11a0 - dVar30;
      dStack_1170 = dStack_1170 - dVar30;
      local_1160 = dVar30 + local_1160;
      local_1040 = local_1040 + dVar126;
      local_1010 = local_1010 + dVar126;
      local_1000 = local_1000 - dVar126;
      local_f90 = local_f90 - dVar32;
      local_f60 = local_f60 - dVar32;
      local_f50 = local_f50 + dVar32;
      dVar30 = dVar32 * 0.5;
      local_ee0 = local_ee0 - dVar30;
      local_eb0 = local_eb0 - dVar30;
      local_ea0 = dVar30 + local_ea0;
      local_e30 = local_e30 - dVar32;
      local_e00 = local_e00 - dVar32;
      local_df0 = local_df0 + dVar32;
      dVar30 = dVar32 + dVar32;
      local_a10 = local_a10 - dVar30;
      local_9e0 = local_9e0 - dVar30;
      local_9d0 = dVar30 + local_9d0;
      dVar32 = dVar32 * -0.30000000000000004;
      local_8b0 = local_8b0 - dVar32;
      local_880 = local_880 - dVar32;
      local_870 = dVar32 + local_870;
    }
    else {
      local_1b98[0] = dVar32 * 2.0;
      local_1b98[1] = local_1de8[7] * dVar30 + dVar32;
      local_1b98[2] = dVar32;
      local_1b98[3] = dVar32;
      local_1b98[4] = dVar32;
      local_1b98[5] = dVar32 * 6.0;
      local_1b98[6] = dVar32;
      local_1b98[7] = dVar30 * local_1de8[1] + dVar32;
      local_1b98[8] = dVar32;
      local_1b98[9] = dVar32 - dVar126;
      local_1b98[10] = local_1b98[0];
      local_1b98[0xb] = dVar32 * 1.5;
      local_1b98[0xc] = local_1b98[0];
      local_1b98[0xf] = dVar32;
      local_1b98[0x10] = dVar32;
      local_1b98[0xd] = dVar32;
      local_1b98[0xe] = dVar32;
      local_1b98[0x11] = dVar32;
      local_1b98[0x12] = dVar32 * 3.0;
      local_1b98[0x13] = dVar32;
      local_1b98[0x14] = dVar32 * 0.7;
      pdVar18 = local_1680 + 10;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar30 = local_1b98[lVar17];
        pdVar18[-8] = pdVar18[-8] - dVar30;
        pdVar18[-2] = pdVar18[-2] - dVar30;
        *pdVar18 = dVar30 + *pdVar18;
        pdVar18 = pdVar18 + 0x16;
      }
    }
    local_808[1] = local_808[1] - dVar123;
    local_808[7] = local_808[7] - dVar123;
    local_808[9] = dVar123 + local_808[9];
    dVar35 = local_1de8[0x14] * -0.30000000000000004 +
             local_1de8[0x12] + local_1de8[0x12] +
             local_1de8[0xb] * 0.5 +
             local_1de8[5] * 5.0 + local_1de8[0] + local_1d28 + local_1de8[10] + local_1de8[0xc];
    dVar123 = exp((double)local_1df8._0_8_ * -0.63 + dVar47 * -192.73198300320777);
    dVar123 = dVar123 * 12700000000.0;
    dVar30 = exp((double)local_1df8._0_8_ * -4.76 + dVar47 * -1227.8486645635169);
    dVar50 = ((dVar35 * 1e-12) / dVar123) * dVar30 * 2.477e+33;
    local_1918 = log10(dVar50);
    dVar30 = exp(dVar1 / -74.0);
    dVar32 = exp(dVar1 / -2941.0);
    local_1e68 = exp(dVar47 * -6964.0);
    dVar51 = dVar30 * 0.21699999999999997 + dVar32 * 0.783 + local_1e68;
    dVar33 = log10(dVar51);
    dVar52 = dVar33 * -1.27 + 0.75;
    dVar70 = dVar33 * -0.67 + -0.4 + local_1918;
    dVar71 = 1.0 / (dVar70 * -0.14 + dVar52);
    dVar70 = dVar70 * dVar71;
    local_1e38 = 1.0 / (dVar70 * dVar70 + 1.0);
    local_1918 = pow(10.0,dVar33 * local_1e38);
    local_648 = dStack_1d30;
    dStack_640 = dStack_1d30;
    dVar34 = exp((local_1838 + local_1d18) - dStack_1d30);
    dVar68 = dVar47 * -0.63 + dVar28 * 192.73198300320777;
    dVar81 = (dVar33 + dVar33) * local_1e38 * local_1e38 * dVar70 * dVar71;
    dVar71 = -dVar52 * dVar81 * dVar71;
    dVar72 = dVar50 + 1.0;
    dVar52 = ((dVar47 * -4.76 + dVar28 * 1227.8486645635169) - dVar68) * 0.43429448190325176;
    dVar34 = dVar123 / (dVar34 * dVar29);
    dVar50 = (dVar50 / dVar72) * local_1918;
    dVar33 = (dVar123 * dVar31 * dVar53 - dVar67 * dVar34) * dVar50;
    dVar53 = (dVar68 * dVar123 * dVar31 * dVar53 -
             (dVar68 - ((h_RT[10] - (RVar9 + h_RT[9])) + 1.0) * dVar47) * dVar34 * dVar67) * dVar50
             + (dVar52 * dVar71 +
                (dVar81 * dVar70 * -1.27 + dVar71 * -0.67 + local_1e38) *
                (local_1e68 * 6964.0 * dVar28 +
                (dVar32 * 0.783) / -2941.0 + (dVar30 * 0.21699999999999997) / -74.0) *
                (0.43429448190325176 / dVar51) + dVar52 / dVar72) * 2.302585092994046 * dVar33;
    local_1f28[1] = local_1f28[1] - dVar33;
    dStack_1ee0 = dStack_1ee0 - dVar33;
    local_1ed8 = (undefined1  [8])((double)local_1ed8 + dVar33);
    dVar123 = dVar50 * dVar123;
    dVar31 = (1.0 / dVar72 + dVar71) * (dVar33 / dVar35);
    if (iVar2 == 2) {
      local_1670 = local_1670 - dVar31;
      local_1630 = local_1630 - dVar31;
      local_1628 = local_1628 + dVar31;
      dVar67 = local_1de8[9] * dVar123;
      auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ - dVar67;
      dStack_1580 = dStack_1580 - dVar67;
      local_1578 = dVar67 + local_1578;
      dVar67 = dVar31 * 5.0;
      local_1300 = local_1300 - dVar67;
      local_12c0 = local_12c0 - dVar67;
      local_12b8 = dVar67 + local_12b8;
      dVar123 = dVar123 * local_1de8[1];
      local_1040 = local_1040 - dVar123;
      local_1000 = local_1000 - dVar123;
      local_ff8 = dVar123 + local_ff8;
      dVar67 = dVar31 - dVar34 * dVar50;
      local_f90 = local_f90 - dVar67;
      local_f50 = local_f50 - dVar67;
      local_f48 = dVar67 + local_f48;
      dVar67 = dVar31 * 0.5;
      local_ee0 = local_ee0 - dVar67;
      local_ea0 = local_ea0 - dVar67;
      local_e98 = dVar67 + local_e98;
      local_e30 = local_e30 - dVar31;
      local_df0 = local_df0 - dVar31;
      local_de8 = local_de8 + dVar31;
      dVar67 = dVar31 + dVar31;
      local_a10 = local_a10 - dVar67;
      local_9d0 = local_9d0 - dVar67;
      local_9c8 = dVar67 + local_9c8;
      dVar31 = dVar31 * -0.30000000000000004;
      local_8b0 = local_8b0 - dVar31;
      local_870 = local_870 - dVar31;
      local_868 = dVar31 + local_868;
    }
    else {
      local_1b98[0] = dVar31 * 2.0;
      local_1b98[1] = local_1de8[9] * dVar123 + dVar31;
      local_1b98[2] = dVar31;
      local_1b98[3] = dVar31;
      local_1b98[4] = dVar31;
      local_1b98[5] = dVar31 * 6.0;
      local_1b98[6] = dVar31;
      local_1b98[7] = dVar31;
      local_1b98[8] = dVar31;
      local_1b98[9] = local_1de8[1] * dVar123 + dVar31;
      local_1b98[10] = dVar31 * 2.0 + -(dVar34 * dVar50);
      local_1b98[0xb] = dVar31 * 1.5;
      local_1b98[0xc] = dVar31 * 2.0;
      local_1b98[0xf] = dVar31;
      local_1b98[0x10] = dVar31;
      local_1b98[0xd] = dVar31;
      local_1b98[0xe] = dVar31;
      local_1b98[0x11] = dVar31;
      local_1b98[0x12] = dVar31 * 3.0;
      local_1b98[0x13] = dVar31;
      local_1b98[0x14] = dVar31 * 0.7;
      pdVar18 = local_1680 + 0xb;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar31 = local_1b98[lVar17];
        pdVar18[-9] = pdVar18[-9] - dVar31;
        pdVar18[-1] = pdVar18[-1] - dVar31;
        *pdVar18 = dVar31 + *pdVar18;
        pdVar18 = pdVar18 + 0x16;
      }
    }
    local_808[1] = local_808[1] - dVar53;
    local_808[9] = local_808[9] - dVar53;
    local_7b8._0_8_ = dVar53 + (double)local_7b8._0_8_;
    dVar30 = local_1de8[0x14] * -0.30000000000000004 +
             local_1de8[0x12] + local_1de8[0x12] +
             local_1de8[0xb] * 0.5 +
             local_1de8[5] * 5.0 + local_1de8[0] + local_1d28 + local_1de8[10] + local_1de8[0xc];
    dVar53 = local_1de8[1] * local_1de8[0xd];
    dVar32 = exp((double)local_1df8._0_8_ * 0.48 + dVar47 * 130.8363331092272);
    dVar32 = dVar32 * 1090000.0;
    dVar31 = exp((double)local_1df8._0_8_ * -2.57 + dVar47 * -717.083748771726);
    local_1e68 = ((dVar30 * 1e-12) / dVar32) * dVar31 * 1.35e+24;
    dVar33 = log10(local_1e68);
    dVar34 = exp(dVar1 / -271.0);
    dVar35 = exp(dVar1 / -2755.0);
    dVar50 = exp(dVar47 * -6570.0);
    dVar52 = dVar34 * 0.21760000000000002 + dVar35 * 0.7824 + dVar50;
    local_1e38 = log10(dVar52);
    dVar68 = local_1e38 * -1.27 + 0.75;
    dVar33 = local_1e38 * -0.67 + -0.4 + dVar33;
    dVar81 = 1.0 / (dVar33 * -0.14 + dVar68);
    dVar33 = dVar33 * dVar81;
    dVar71 = 1.0 / (dVar33 * dVar33 + 1.0);
    dVar31 = pow(10.0,local_1e38 * dVar71);
    dVar123 = local_1de8[0xe];
    local_1918 = dStack_1c20;
    dStack_1910 = dStack_1c20;
    dVar51 = exp((local_1848 + local_1d18) - dStack_1c20);
    RVar10 = h_RT[0xe];
    RVar9 = h_RT[1];
    dVar67 = local_1de8[1];
    dVar70 = dVar47 * 0.48 + dVar28 * -130.8363331092272;
    dVar82 = local_1e68 + 1.0;
    dVar72 = ((dVar47 * -2.57 + dVar28 * 717.083748771726) - dVar70) * 0.43429448190325176;
    dVar111 = (local_1e38 + local_1e38) * dVar71 * dVar71 * dVar33 * dVar81;
    dVar81 = -dVar68 * dVar111 * dVar81;
    dVar51 = dVar32 / (dVar51 * dVar29);
    dVar31 = (local_1e68 / dVar82) * dVar31;
    dVar68 = (dVar32 * dVar53 - dVar123 * dVar51) * dVar31;
    dVar33 = (dVar70 * dVar32 * dVar53 -
             (dVar70 - ((h_RT[0xe] - (h_RT[0xd] + h_RT[1])) + 1.0) * dVar47) * dVar51 * dVar123) *
             dVar31 + (dVar72 * dVar81 +
                       (dVar111 * dVar33 * -1.27 + dVar81 * -0.67 + dVar71) *
                       (dVar50 * 6570.0 * dVar28 +
                       (dVar35 * 0.7824) / -2755.0 + (dVar34 * 0.21760000000000002) / -271.0) *
                       (0.43429448190325176 / dVar52) + dVar72 / dVar82) * 2.302585092994046 *
                      dVar68;
    local_1f28[1] = local_1f28[1] - dVar68;
    dStack_1ec0 = dStack_1ec0 - dVar68;
    local_1eb8 = local_1eb8 + dVar68;
    dVar32 = dVar32 * dVar31;
    dVar31 = dVar31 * dVar51;
    dVar53 = (1.0 / dVar82 + dVar81) * (dVar68 / dVar30);
    if (iVar2 == 2) {
      local_1670 = local_1670 - dVar53;
      local_1610 = local_1610 - dVar53;
      local_1608 = local_1608 + dVar53;
      dVar30 = local_1de8[0xd] * dVar32;
      auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ - dVar30;
      local_1560 = local_1560 - dVar30;
      local_1558 = dVar30 + local_1558;
      dVar30 = dVar53 * 5.0;
      local_1300 = local_1300 - dVar30;
      local_12a0 = local_12a0 - dVar30;
      local_1298 = dVar30 + local_1298;
      local_f90 = local_f90 - dVar53;
      local_f30 = local_f30 - dVar53;
      local_f28 = local_f28 + dVar53;
      dVar30 = dVar53 * 0.5;
      local_ee0 = local_ee0 - dVar30;
      local_e80 = local_e80 - dVar30;
      local_e78 = dVar30 + local_e78;
      local_e30 = local_e30 - dVar53;
      local_dd0 = local_dd0 - dVar53;
      local_dc8 = local_dc8 + dVar53;
      dVar32 = dVar32 * local_1de8[1];
      local_d80 = local_d80 - dVar32;
      local_d20 = local_d20 - dVar32;
      local_d18 = dVar32 + local_d18;
      local_cd0 = local_cd0 + dVar31;
      local_c70 = local_c70 + dVar31;
      local_c68 = local_c68 - dVar31;
      dVar31 = dVar53 + dVar53;
      local_a10 = local_a10 - dVar31;
      local_9b0 = local_9b0 - dVar31;
      local_9a8 = dVar31 + local_9a8;
      dVar53 = dVar53 * -0.30000000000000004;
      local_8b0 = local_8b0 - dVar53;
      local_850 = local_850 - dVar53;
      local_848 = dVar53 + local_848;
    }
    else {
      local_1b98[0] = dVar53 * 2.0;
      local_1b98[1] = local_1de8[0xd] * dVar32 + dVar53;
      local_1b98[2] = dVar53;
      local_1b98[3] = dVar53;
      local_1b98[4] = dVar53;
      local_1b98[5] = dVar53 * 6.0;
      local_1b98[8] = dVar53;
      local_1b98[9] = dVar53;
      local_1b98[6] = dVar53;
      local_1b98[7] = dVar53;
      local_1b98[10] = local_1b98[0];
      local_1b98[0xb] = dVar53 * 1.5;
      local_1b98[0xc] = local_1b98[0];
      local_1b98[0xd] = dVar32 * local_1de8[1] + dVar53;
      local_1b98[0xe] = dVar53 - dVar31;
      local_1b98[0xf] = dVar53;
      local_1b98[0x10] = dVar53;
      local_1b98[0x11] = dVar53;
      local_1b98[0x12] = dVar53 * 3.0;
      local_1b98[0x13] = dVar53;
      local_1b98[0x14] = dVar53 * 0.7;
      pdVar18 = local_1680 + 0xf;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar31 = local_1b98[lVar17];
        pdVar18[-0xd] = pdVar18[-0xd] - dVar31;
        pdVar18[-1] = pdVar18[-1] - dVar31;
        *pdVar18 = dVar31 + *pdVar18;
        pdVar18 = pdVar18 + 0x16;
      }
    }
    local_808[1] = local_808[1] - dVar33;
    dStack_7a0 = dStack_7a0 - dVar33;
    dStack_798 = dVar33 + dStack_798;
    dVar50 = local_1de8[0x12] + local_1de8[0x12] +
             local_1de8[0xb] * 0.5 +
             local_1de8[5] * 5.0 + local_1de8[0] + local_1d28 + local_1de8[10] + local_1de8[0xc];
    dVar71 = (double)local_1df8._0_8_ * 0.454;
    dVar32 = exp(dVar47 * -1308.3633310922721 + dVar71);
    dVar32 = dVar32 * 540000.0;
    dVar31 = exp((double)local_1df8._0_8_ * -4.8 + dVar47 * -2797.884661874243);
    dVar51 = ((dVar50 * 1e-12) / dVar32) * dVar31 * 2.2e+30;
    local_1e68 = log10(dVar51);
    dVar33 = exp(dVar1 / -94.0);
    dVar34 = exp(dVar1 / -1555.0);
    dVar35 = exp(dVar47 * -4200.0);
    dVar52 = dVar33 * 0.242 + dVar34 * 0.758 + dVar35;
    local_1e48 = log10(dVar52);
    dVar68 = local_1e48 * -1.27 + 0.75;
    local_1e28 = local_1e48 * -0.67 + -0.4 + local_1e68;
    local_1e38 = 1.0 / (local_1e28 * -0.14 + dVar68);
    local_1e28 = local_1e28 * local_1e38;
    dVar31 = 1.0 / (local_1e28 * local_1e28 + 1.0);
    local_1e78 = (undefined1  [8])dVar31;
    local_1e68 = pow(10.0,local_1e48 * dVar31);
    dVar30 = dStack_690;
    dVar53 = local_1de8[0xf];
    dVar31 = exp((local_1918 + local_1d18) - dStack_690);
    dVar111 = (local_1e48 + local_1e48) * (double)local_1e78 * (double)local_1e78 * local_1e28 *
              local_1e38;
    dVar68 = -dVar68 * dVar111 * local_1e38;
    dVar70 = dVar28 * 1308.3633310922721 + dVar47 * 0.454;
    dVar72 = ((dVar47 * -4.8 + dVar28 * 2797.884661874243) - dVar70) * 0.43429448190325176;
    dVar81 = dVar51 + 1.0;
    dVar82 = dVar32 / (dVar31 * dVar29);
    dVar31 = (dVar51 / dVar81) * local_1e68;
    dVar51 = (dVar32 * dVar67 * dVar123 - dVar53 * dVar82) * dVar31;
    dVar67 = (dVar70 * dVar32 * dVar67 * dVar123 -
             (dVar70 - ((h_RT[0xf] - (RVar9 + RVar10)) + 1.0) * dVar47) * dVar82 * dVar53) * dVar31
             + (dVar72 * dVar68 +
                (dVar111 * local_1e28 * -1.27 + dVar68 * -0.67 + (double)local_1e78) *
                (dVar35 * 4200.0 * dVar28 + (dVar34 * 0.758) / -1555.0 + (dVar33 * 0.242) / -94.0) *
                (0.43429448190325176 / dVar52) + dVar72 / dVar81) * 2.302585092994046 * dVar51;
    local_1f28[1] = local_1f28[1] - dVar51;
    local_1eb8 = local_1eb8 - dVar51;
    dStack_1eb0 = dStack_1eb0 + dVar51;
    dVar32 = dVar32 * dVar31;
    dVar31 = dVar31 * dVar82;
    dVar53 = (1.0 / dVar81 + dVar68) * (dVar51 / dVar50);
    if (iVar2 == 2) {
      local_1670 = local_1670 - dVar53;
      local_1608 = local_1608 - dVar53;
      local_1600 = local_1600 + dVar53;
      dVar123 = local_1de8[0xe] * dVar32;
      auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ - dVar123;
      local_1558 = local_1558 - dVar123;
      dStack_1550 = dVar123 + dStack_1550;
      dVar123 = dVar53 * 5.0;
      local_1300 = local_1300 - dVar123;
      local_1298 = local_1298 - dVar123;
      local_1290 = dVar123 + local_1290;
      local_f90 = local_f90 - dVar53;
      local_f28 = local_f28 - dVar53;
      local_f20 = local_f20 + dVar53;
      dVar123 = dVar53 * 0.5;
      local_ee0 = local_ee0 - dVar123;
      local_e78 = local_e78 - dVar123;
      local_e70 = dVar123 + local_e70;
      local_e30 = local_e30 - dVar53;
      local_dc8 = local_dc8 - dVar53;
      local_dc0 = local_dc0 + dVar53;
      dVar32 = dVar32 * local_1de8[1];
      local_cd0 = local_cd0 - dVar32;
      local_c68 = local_c68 - dVar32;
      local_c60 = dVar32 + local_c60;
      local_c20 = local_c20 + dVar31;
      local_bb8 = local_bb8 + dVar31;
      local_bb0 = local_bb0 - dVar31;
      dVar53 = dVar53 + dVar53;
      local_a10 = local_a10 - dVar53;
      local_9a8 = local_9a8 - dVar53;
      local_9a0 = dVar53 + local_9a0;
    }
    else {
      local_1b98[0] = dVar53 * 2.0;
      local_1b98[1] = local_1de8[0xe] * dVar32 + dVar53;
      local_1b98[2] = dVar53;
      local_1b98[3] = dVar53;
      local_1b98[4] = dVar53;
      local_1b98[5] = dVar53 * 6.0;
      local_1b98[8] = dVar53;
      local_1b98[9] = dVar53;
      local_1b98[6] = dVar53;
      local_1b98[7] = dVar53;
      local_1b98[10] = local_1b98[0];
      local_1b98[0xb] = dVar53 * 1.5;
      local_1b98[0xc] = local_1b98[0];
      local_1b98[0xd] = dVar53;
      local_1b98[0xe] = dVar32 * local_1de8[1] + dVar53;
      local_1b98[0xf] = dVar53 - dVar31;
      local_1b98[0x10] = dVar53;
      local_1b98[0x11] = dVar53;
      local_1b98[0x12] = dVar53 * 3.0;
      local_1b98[0x13] = dVar53;
      local_1b98[0x14] = dVar53;
      pdVar18 = local_1680 + 0x10;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar31 = local_1b98[lVar17];
        pdVar18[-0xe] = pdVar18[-0xe] - dVar31;
        pdVar18[-1] = pdVar18[-1] - dVar31;
        *pdVar18 = dVar31 + *pdVar18;
        pdVar18 = pdVar18 + 0x16;
      }
    }
    local_808[1] = local_808[1] - dVar67;
    dStack_798 = dStack_798 - dVar67;
    dStack_790 = dVar67 + dStack_790;
    dVar53 = local_1de8[1] * local_1de8[0x10];
    dVar33 = local_1de8[0x14] * -0.30000000000000004 +
             local_1de8[0x12] + local_1de8[0x12] +
             local_1de8[0xb] * 0.5 +
             local_1de8[5] * 5.0 + local_1de8[0] + local_1d28 + local_1de8[10] + local_1de8[0xc];
    dVar34 = exp(dVar71 + dVar47 * -915.8543317645905);
    dVar34 = dVar34 * 1080000.0;
    dVar31 = exp((double)local_1df8._0_8_ * -7.62 + dVar47 * -3507.4201606588986);
    dVar70 = ((dVar33 * 1e-12) / dVar34) * dVar31 * 1.2e+42;
    dVar35 = log10(dVar70);
    dVar50 = exp(dVar1 / -210.0);
    dVar51 = exp(dVar1 / -984.0);
    local_1e68 = exp(dVar47 * -4374.0);
    dVar71 = dVar50 * 0.024700000000000055 + dVar51 * 0.9753 + local_1e68;
    dVar52 = log10(dVar71);
    dVar72 = dVar52 * -1.27 + 0.75;
    dVar35 = dVar52 * -0.67 + -0.4 + dVar35;
    dVar111 = 1.0 / (dVar35 * -0.14 + dVar72);
    dVar35 = dVar35 * dVar111;
    local_1e38 = 1.0 / (dVar35 * dVar35 + 1.0);
    dVar31 = pow(10.0,dVar52 * local_1e38);
    dVar123 = local_1de8[0x11];
    dVar68 = exp((local_698 + local_1d18) - local_748);
    RVar10 = h_RT[0x11];
    RVar9 = h_RT[1];
    dVar32 = local_1de8[0x12];
    dVar67 = local_1de8[1];
    dVar126 = dVar47 * 0.454 + dVar28 * 915.8543317645905;
    dVar82 = dVar70 + 1.0;
    dVar81 = ((dVar47 * -7.62 + dVar28 * 3507.4201606588986) - dVar126) * 0.43429448190325176;
    dVar127 = (dVar52 + dVar52) * local_1e38 * local_1e38 * dVar35 * dVar111;
    dVar111 = -dVar72 * dVar127 * dVar111;
    dVar52 = dVar34 / (dVar68 * dVar29);
    dVar31 = (dVar70 / dVar82) * dVar31;
    dVar68 = (dVar34 * dVar53 - dVar123 * dVar52) * dVar31;
    dVar35 = (dVar126 * dVar34 * dVar53 -
             (dVar126 - ((h_RT[0x11] - (h_RT[0x10] + h_RT[1])) + 1.0) * dVar47) * dVar52 * dVar123)
             * dVar31 +
             (dVar81 * dVar111 +
              (dVar127 * dVar35 * -1.27 + dVar111 * -0.67 + local_1e38) *
              (local_1e68 * 4374.0 * dVar28 +
              (dVar51 * 0.9753) / -984.0 + (dVar50 * 0.024700000000000055) / -210.0) *
              (0.43429448190325176 / dVar71) + dVar81 / dVar82) * 2.302585092994046 * dVar68;
    local_1f28[1] = local_1f28[1] - dVar68;
    local_1ea8 = local_1ea8 - dVar68;
    dStack_1ea0 = dStack_1ea0 + dVar68;
    dVar34 = dVar34 * dVar31;
    dVar31 = dVar31 * dVar52;
    dVar53 = (1.0 / dVar82 + dVar111) * (dVar68 / dVar33);
    if (iVar2 == 2) {
      local_1670 = local_1670 - dVar53;
      local_15f8 = local_15f8 - dVar53;
      local_15f0 = local_15f0 + dVar53;
      dVar33 = local_1de8[0x10] * dVar34;
      auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ - dVar33;
      local_1548 = local_1548 - dVar33;
      local_1540 = dVar33 + local_1540;
      dVar33 = dVar53 * 5.0;
      local_1300 = local_1300 - dVar33;
      local_1288 = local_1288 - dVar33;
      local_1280 = dVar33 + local_1280;
      local_f90 = local_f90 - dVar53;
      local_f18 = local_f18 - dVar53;
      local_f10 = local_f10 + dVar53;
      dVar33 = dVar53 * 0.5;
      local_ee0 = local_ee0 - dVar33;
      local_e68 = local_e68 - dVar33;
      local_e60 = dVar33 + local_e60;
      local_e30 = local_e30 - dVar53;
      local_db8 = local_db8 - dVar53;
      local_db0 = local_db0 + dVar53;
      dVar34 = dVar34 * local_1de8[1];
      local_b70 = local_b70 - dVar34;
      local_af8 = local_af8 - dVar34;
      local_af0 = dVar34 + local_af0;
      local_ac0 = local_ac0 + dVar31;
      local_a48 = local_a48 + dVar31;
      local_a40 = local_a40 - dVar31;
      dVar31 = dVar53 + dVar53;
      local_a10 = local_a10 - dVar31;
      local_998 = local_998 - dVar31;
      local_990 = dVar31 + local_990;
      dVar53 = dVar53 * -0.30000000000000004;
      local_8b0 = local_8b0 - dVar53;
      local_838 = local_838 - dVar53;
      local_830 = dVar53 + local_830;
    }
    else {
      local_1b98[0] = dVar53 * 2.0;
      local_1b98[1] = local_1de8[0x10] * dVar34 + dVar53;
      local_1b98[2] = dVar53;
      local_1b98[3] = dVar53;
      local_1b98[4] = dVar53;
      local_1b98[5] = dVar53 * 6.0;
      local_1b98[8] = dVar53;
      local_1b98[9] = dVar53;
      local_1b98[6] = dVar53;
      local_1b98[7] = dVar53;
      local_1b98[10] = local_1b98[0];
      local_1b98[0xb] = dVar53 * 1.5;
      local_1b98[0xc] = local_1b98[0];
      local_1b98[0xd] = dVar53;
      local_1b98[0xe] = dVar53;
      local_1b98[0xf] = dVar53;
      local_1b98[0x10] = dVar34 * local_1de8[1] + dVar53;
      local_1b98[0x11] = dVar53 - dVar31;
      local_1b98[0x12] = dVar53 * 3.0;
      local_1b98[0x13] = dVar53;
      local_1b98[0x14] = dVar53 * 0.7;
      pdVar18 = local_1680 + 0x12;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar31 = local_1b98[lVar17];
        pdVar18[-0x10] = pdVar18[-0x10] - dVar31;
        pdVar18[-1] = pdVar18[-1] - dVar31;
        *pdVar18 = dVar31 + *pdVar18;
        pdVar18 = pdVar18 + 0x16;
      }
    }
    local_808[1] = local_808[1] - dVar35;
    dStack_788 = dStack_788 - dVar35;
    dStack_780 = dVar35 + dStack_780;
    dVar33 = local_1de8[0x14] * -0.30000000000000004 +
             local_1de8[0x12] + local_1de8[0x12] +
             local_1de8[0xb] * 0.5 +
             local_1de8[5] * 5.0 + local_1de8[0] + local_1d28 + local_1de8[10] + local_1de8[0xc];
    dVar34 = exp((double)local_1df8._0_8_ * -0.99 + dVar47 * -795.0823319714576);
    dVar34 = dVar34 * 521000000000.0;
    dVar31 = exp((double)local_1df8._0_8_ * -7.08 + dVar47 * -3364.003410904553);
    local_1e68 = ((dVar33 * 1e-12) / dVar34) * dVar31 * 1.99e+41;
    dStack_1e60 = 0.0;
    dVar35 = log10(local_1e68);
    dVar50 = exp(dVar1 / -125.0);
    dVar51 = exp(dVar1 / -2219.0);
    dVar52 = exp(dVar47 * -6882.0);
    local_1e38 = dVar50 * 0.15780000000000005 + dVar51 * 0.8422 + dVar52;
    local_1e78 = (undefined1  [8])log10(local_1e38);
    dVar71 = (double)local_1e78 * -1.27 + 0.75;
    dVar35 = (double)local_1e78 * -0.67 + -0.4 + dVar35;
    dVar81 = 1.0 / (dVar35 * -0.14 + dVar71);
    dVar35 = dVar35 * dVar81;
    local_1e28 = 1.0 / (dVar35 * dVar35 + 1.0);
    dVar68 = pow(10.0,(double)local_1e78 * local_1e28);
    dVar70 = exp((local_748 + local_1d18) - local_758);
    dVar53 = local_1de8[0xb];
    dVar31 = local_1de8[0];
    dVar72 = dVar47 * -0.99 + dVar28 * 795.0823319714576;
    dVar126 = ((double)local_1e78 + (double)local_1e78) * local_1e28 * local_1e28 * dVar35 * dVar81;
    dVar81 = -dVar71 * dVar126 * dVar81;
    dVar82 = ((dVar47 * -7.08 + dVar28 * 3364.003410904553) - dVar72) * 0.43429448190325176;
    dVar111 = local_1e68 + 1.0;
    dVar71 = dVar34 / (dVar70 * dVar29);
    dVar68 = (local_1e68 / dVar111) * dVar68;
    dVar70 = (dVar34 * dVar67 * dVar123 - dVar32 * dVar71) * dVar68;
    dVar123 = (dVar72 * dVar34 * dVar67 * dVar123 -
              (dVar72 - ((h_RT[0x12] - (RVar9 + RVar10)) + 1.0) * dVar47) * dVar71 * dVar32) *
              dVar68 + (dVar82 * dVar81 +
                        (dVar126 * dVar35 * -1.27 + dVar81 * -0.67 + local_1e28) *
                        (dVar52 * 6882.0 * dVar28 +
                        (dVar51 * 0.8422) / -2219.0 + (dVar50 * 0.15780000000000005) / -125.0) *
                        (0.43429448190325176 / local_1e38) + dVar82 / dVar111) * 2.302585092994046 *
                       dVar70;
    local_1f28[1] = local_1f28[1] - dVar70;
    dStack_1ea0 = dStack_1ea0 - dVar70;
    local_1e98 = local_1e98 + dVar70;
    dVar34 = dVar68 * dVar34;
    dVar67 = (1.0 / dVar111 + dVar81) * (dVar70 / dVar33);
    if (iVar2 == 2) {
      local_1670 = local_1670 - dVar67;
      local_15f0 = local_15f0 - dVar67;
      local_15e8[0] = local_15e8[0] + dVar67;
      dVar32 = local_1de8[0x11] * dVar34;
      auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ - dVar32;
      local_1540 = local_1540 - dVar32;
      local_1538 = dVar32 + local_1538;
      dVar32 = dVar67 * 5.0;
      local_1300 = local_1300 - dVar32;
      local_1280 = local_1280 - dVar32;
      local_1278 = dVar32 + local_1278;
      local_f90 = local_f90 - dVar67;
      local_f10 = local_f10 - dVar67;
      local_f08 = local_f08 + dVar67;
      dVar32 = dVar67 * 0.5;
      local_ee0 = local_ee0 - dVar32;
      local_e60 = local_e60 - dVar32;
      local_e58 = dVar32 + local_e58;
      local_e30 = local_e30 - dVar67;
      local_db0 = local_db0 - dVar67;
      local_da8 = local_da8 + dVar67;
      dVar34 = dVar34 * local_1de8[1];
      local_ac0 = local_ac0 - dVar34;
      local_a40 = local_a40 - dVar34;
      local_a38 = dVar34 + local_a38;
      dVar32 = (dVar67 + dVar67) - dVar71 * dVar68;
      local_a10 = local_a10 - dVar32;
      local_990 = local_990 - dVar32;
      local_988 = dVar32 + local_988;
      dVar67 = dVar67 * -0.30000000000000004;
      local_8b0 = local_8b0 - dVar67;
      local_830 = local_830 - dVar67;
      local_828 = dVar67 + local_828;
    }
    else {
      local_1b98[0] = dVar67 * 2.0;
      local_1b98[1] = local_1de8[0x11] * dVar34 + dVar67;
      local_1b98[2] = dVar67;
      local_1b98[3] = dVar67;
      local_1b98[4] = dVar67;
      local_1b98[5] = dVar67 * 6.0;
      local_1b98[8] = dVar67;
      local_1b98[9] = dVar67;
      local_1b98[6] = dVar67;
      local_1b98[7] = dVar67;
      local_1b98[10] = local_1b98[0];
      local_1b98[0xb] = dVar67 * 1.5;
      local_1b98[0xc] = local_1b98[0];
      local_1b98[0xf] = dVar67;
      local_1b98[0x10] = dVar67;
      local_1b98[0xd] = dVar67;
      local_1b98[0xe] = dVar67;
      local_1b98[0x11] = local_1de8[1] * dVar34 + dVar67;
      local_1b98[0x12] = dVar67 * 3.0 + -(dVar71 * dVar68);
      local_1b98[0x13] = dVar67;
      local_1b98[0x14] = dVar67 * 0.7;
      pdVar18 = local_1680 + 0x13;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar67 = local_1b98[lVar17];
        pdVar18[-0x11] = pdVar18[-0x11] - dVar67;
        pdVar18[-1] = pdVar18[-1] - dVar67;
        *pdVar18 = dVar67 + *pdVar18;
        pdVar18 = pdVar18 + 0x16;
      }
    }
    local_808[1] = local_808[1] - dVar123;
    dStack_780 = dStack_780 - dVar123;
    local_778 = dVar123 + local_778;
    dVar34 = local_1de8[0x14] * -0.30000000000000004 +
             local_1de8[0x12] + local_1de8[0x12] +
             local_1de8[0xb] * 0.5 +
             local_1de8[5] * 5.0 + local_1d28 + local_1de8[0] + local_1de8[10] + local_1de8[0xc];
    dVar71 = (double)local_1df8._0_8_ * 1.5;
    dVar35 = exp(dVar47 * -40056.04659805571 + dVar71);
    dVar35 = dVar35 * 43.0;
    dVar67 = exp((double)local_1df8._0_8_ * -3.42 + dVar47 * -42446.32576062813);
    dVar72 = ((dVar34 * 1e-12) / dVar35) * dVar67 * 5.07e+27;
    dVar50 = log10(dVar72);
    dVar51 = exp(dVar1 / -197.0);
    dVar52 = exp(dVar1 / -1540.0);
    local_1e68 = exp(dVar47 * -10300.0);
    dVar81 = dVar51 * 0.06799999999999995 + dVar52 * 0.932 + local_1e68;
    dVar68 = log10(dVar81);
    dVar82 = dVar68 * -1.27 + 0.75;
    dVar50 = dVar68 * -0.67 + -0.4 + dVar50;
    dVar126 = 1.0 / (dVar50 * -0.14 + dVar82);
    dVar50 = dVar50 * dVar126;
    local_1e38 = 1.0 / (dVar50 * dVar50 + 1.0);
    dVar67 = pow(10.0,dVar68 * local_1e38);
    dVar32 = local_1de8[0xe];
    dVar70 = exp((local_1858 + local_1868) - local_1918);
    dVar33 = local_1de8[0x12];
    dVar123 = local_1de8[9];
    dVar127 = (dVar68 + dVar68) * local_1e38 * local_1e38 * dVar50 * dVar126;
    dVar126 = -dVar82 * dVar127 * dVar126;
    dVar82 = dVar28 * 40056.04659805571 + dVar47 * 1.5;
    dVar83 = dVar72 + 1.0;
    dVar111 = ((dVar47 * -3.42 + dVar28 * 42446.32576062813) - dVar82) * 0.43429448190325176;
    dVar70 = dVar35 / (dVar70 * dVar29);
    dVar67 = (dVar72 / dVar83) * dVar67;
    dVar68 = (dVar35 * dVar31 * dVar53 - dVar32 * dVar70) * dVar67;
    dVar31 = (dVar82 * dVar35 * dVar31 * dVar53 -
             (dVar82 - ((h_RT[0xe] - (h_RT[0] + h_RT[0xb])) + 1.0) * dVar47) * dVar70 * dVar32) *
             dVar67 + (dVar111 * dVar126 +
                       (dVar127 * dVar50 * -1.27 + dVar126 * -0.67 + local_1e38) *
                       (local_1e68 * 10300.0 * dVar28 +
                       (dVar52 * 0.932) / -1540.0 + (dVar51 * 0.06799999999999995) / -197.0) *
                       (0.43429448190325176 / dVar81) + dVar111 / dVar83) * 2.302585092994046 *
                      dVar68;
    local_1f28[0] = local_1f28[0] - dVar68;
    dStack_1ed0 = dStack_1ed0 - dVar68;
    local_1eb8 = local_1eb8 + dVar68;
    dVar35 = dVar35 * dVar67;
    dVar67 = dVar67 * dVar70;
    dVar53 = (1.0 / dVar83 + dVar126) * (dVar68 / dVar34);
    if (iVar2 == 2) {
      dVar32 = dVar35 * local_1de8[0xb] + dVar53;
      local_1680[1] = local_1680[1] - dVar32;
      local_1620 = local_1620 - dVar32;
      local_1608 = dVar32 + local_1608;
      dVar32 = dVar53 * 5.0;
      local_1308 = local_1308 - dVar32;
      local_12b0 = local_12b0 - dVar32;
      local_1298 = dVar32 + local_1298;
      local_f98 = local_f98 - dVar53;
      dStack_f40 = dStack_f40 - dVar53;
      local_f28 = local_f28 + dVar53;
      dVar32 = dVar53 * 0.5 + dVar35 * local_1de8[0];
      local_ee8 = local_ee8 - dVar32;
      dStack_e90 = dStack_e90 - dVar32;
      local_e78 = dVar32 + local_e78;
      local_e38 = local_e38 - dVar53;
      local_de0 = local_de0 - dVar53;
      local_dc8 = local_dc8 + dVar53;
      local_cd8 = local_cd8 + dVar67;
      local_c80 = local_c80 + dVar67;
      local_c68 = local_c68 - dVar67;
      dVar67 = dVar53 + dVar53;
      local_a18 = local_a18 - dVar67;
      local_9c0 = local_9c0 - dVar67;
      local_9a8 = dVar67 + local_9a8;
      dVar53 = dVar53 * -0.30000000000000004;
      local_8b8 = local_8b8 - dVar53;
      local_860 = local_860 - dVar53;
      local_848 = dVar53 + local_848;
    }
    else {
      local_1b98[10] = dVar53 + dVar53;
      local_1b98[0] = dVar35 * local_1de8[0xb] + local_1b98[10];
      local_1b98[3] = dVar53;
      local_1b98[4] = dVar53;
      local_1b98[1] = dVar53;
      local_1b98[2] = dVar53;
      local_1b98[5] = dVar53 * 6.0;
      local_1b98[8] = dVar53;
      local_1b98[9] = dVar53;
      local_1b98[6] = dVar53;
      local_1b98[7] = dVar53;
      local_1b98[0xb] = dVar53 * 1.5 + dVar35 * local_1de8[0];
      local_1b98[0xc] = local_1b98[10];
      local_1b98[0xd] = dVar53;
      local_1b98[0xe] = dVar53 - dVar67;
      local_1b98[0xf] = dVar53;
      local_1b98[0x10] = dVar53;
      local_1b98[0x11] = dVar53;
      local_1b98[0x12] = dVar53 * 3.0;
      local_1b98[0x13] = dVar53;
      local_1b98[0x14] = dVar53 * 0.7;
      pdVar18 = local_1680 + 0xf;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar53 = local_1b98[lVar17];
        pdVar18[-0xe] = pdVar18[-0xe] - dVar53;
        pdVar18[-3] = pdVar18[-3] - dVar53;
        *pdVar18 = dVar53 + *pdVar18;
        pdVar18 = pdVar18 + 0x16;
      }
    }
    local_808[0] = local_808[0] - dVar31;
    local_7b8._8_8_ = (double)local_7b8._8_8_ - dVar31;
    dStack_798 = dVar31 + dStack_798;
    dVar52 = local_1de8[0x14] * -0.30000000000000004 +
             local_1de8[0x12] + local_1de8[0x12] +
             local_1de8[0xb] * 0.5 +
             local_1de8[5] * 5.0 + local_1de8[0] + local_1d28 + local_1de8[10] + local_1de8[0xc];
    dVar68 = exp((double)local_1df8._0_8_ * -0.97 + dVar47 * -311.9943327989264);
    dVar68 = dVar68 * 21200000000.0;
    dVar31 = exp((double)local_1df8._0_8_ * -9.67 + dVar47 * -3130.0076613053584);
    dVar54 = ((dVar52 * 1e-12) / dVar68) * dVar31 * 1.77e+50;
    dVar70 = log10(dVar54);
    dVar72 = exp(dVar1 / -151.0);
    dVar81 = exp(dVar1 / -1038.0);
    dVar82 = exp(dVar47 * -4970.0);
    dVar55 = dVar72 * 0.4675 + dVar81 * 0.5325 + dVar82;
    dVar111 = log10(dVar55);
    local_1e68 = dVar111 * -1.27 + 0.75;
    dVar70 = dVar111 * -0.67 + -0.4 + dVar70;
    dVar84 = 1.0 / (dVar70 * -0.14 + local_1e68);
    dVar70 = dVar70 * dVar84;
    local_1e38 = 1.0 / (dVar70 * dVar70 + 1.0);
    dVar126 = pow(10.0,dVar111 * local_1e38);
    dVar127 = local_1838 + local_1838;
    dVar83 = exp(dVar127 - local_758);
    dVar51 = local_1de8[0x14];
    dVar50 = local_1de8[0x12];
    dVar35 = local_1de8[0xc];
    dVar34 = local_1de8[0xb];
    dVar32 = local_1de8[10];
    dVar67 = local_1de8[5];
    dVar53 = local_1de8[2];
    dVar31 = local_1de8[1];
    dVar56 = dVar47 * -0.97 + dVar28 * 311.9943327989264;
    dVar102 = (dVar111 + dVar111) * local_1e38 * local_1e38 * dVar70 * dVar84;
    dVar84 = -local_1e68 * dVar102 * dVar84;
    dVar123 = dVar123 * dVar123;
    dVar85 = dVar54 + 1.0;
    dVar111 = ((dVar47 * -9.67 + dVar28 * 3130.0076613053584) - dVar56) * 0.43429448190325176;
    dVar83 = dVar68 / (dVar83 * dVar29);
    dVar126 = (dVar54 / dVar85) * dVar126;
    dVar54 = (dVar68 * dVar123 - dVar33 * dVar83) * dVar126;
    dVar33 = (dVar56 * dVar68 * dVar123 -
             (dVar56 - ((h_RT[0x12] - (h_RT[9] + h_RT[9])) + 1.0) * dVar47) * dVar83 * dVar33) *
             dVar126 + (dVar111 * dVar84 +
                        (dVar102 * dVar70 * -1.27 + dVar84 * -0.67 + local_1e38) *
                        (dVar82 * 4970.0 * dVar28 +
                        (dVar81 * 0.5325) / -1038.0 + (dVar72 * 0.4675) / -151.0) *
                        (0.43429448190325176 / dVar55) + dVar111 / dVar85) * 2.302585092994046 *
                       dVar54;
    dStack_1ee0 = dStack_1ee0 - (dVar54 + dVar54);
    local_1e98 = local_1e98 + dVar54;
    dVar68 = dVar68 * dVar126;
    dVar123 = (1.0 / dVar85 + dVar84) * (dVar54 / dVar52);
    if (iVar2 == 2) {
      dVar52 = dVar123 * -2.0;
      local_1630 = local_1630 + dVar52;
      local_15e8[0] = local_15e8[0] + dVar123;
      dVar70 = dVar123 * 5.0;
      local_12c0 = local_12c0 - (dVar70 + dVar70);
      local_1278 = dVar70 + local_1278;
      dVar68 = (dVar68 + dVar68) * local_1de8[9];
      local_1000 = local_1000 - (dVar68 + dVar68);
      local_fb8 = dVar68 + local_fb8;
      local_f50 = local_f50 + dVar52;
      local_f08 = local_f08 + dVar123;
      dVar68 = dVar123 * 0.5;
      local_ea0 = local_ea0 - (dVar68 + dVar68);
      local_e58 = dVar68 + local_e58;
      local_df0 = dVar52 + local_df0;
      local_da8 = local_da8 + dVar123;
      dVar52 = (dVar123 + dVar123) - dVar126 * dVar83;
      local_9d0 = local_9d0 - (dVar52 + dVar52);
      local_988 = dVar52 + local_988;
      dVar123 = dVar123 * -0.30000000000000004;
      local_870 = local_870 - (dVar123 + dVar123);
      local_828 = dVar123 + local_828;
    }
    else {
      local_1b98[0] = dVar123 * 2.0;
      local_1b98[3] = dVar123;
      local_1b98[4] = dVar123;
      local_1b98[1] = dVar123;
      local_1b98[2] = dVar123;
      local_1b98[5] = dVar123 * 6.0;
      local_1b98[6] = dVar123;
      local_1b98[7] = dVar123;
      local_1b98[8] = dVar123;
      local_1b98[9] = (dVar68 + dVar68) * local_1de8[9] + dVar123;
      local_1b98[10] = local_1b98[0];
      local_1b98[0xb] = dVar123 * 1.5;
      local_1b98[0xc] = local_1b98[0];
      local_1b98[0xf] = dVar123;
      local_1b98[0x10] = dVar123;
      local_1b98[0xd] = dVar123;
      local_1b98[0xe] = dVar123;
      local_1b98[0x11] = dVar123;
      local_1b98[0x12] = dVar123 * 3.0 - dVar126 * dVar83;
      local_1b98[0x13] = dVar123;
      local_1b98[0x14] = dVar123 * 0.7;
      pdVar18 = local_1680 + 10;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar123 = local_1b98[lVar17];
        *pdVar18 = *pdVar18 - (dVar123 + dVar123);
        pdVar18[9] = dVar123 + pdVar18[9];
        pdVar18 = pdVar18 + 0x16;
      }
    }
    local_808[9] = local_808[9] - (dVar33 + dVar33);
    local_778 = dVar33 + local_778;
    dVar68 = local_1de8[0] + local_1d28;
    dVar70 = dVar49 - (double)local_1df8._0_8_;
    dVar123 = exp(dVar70);
    dVar52 = local_1de8[4];
    local_1e68 = dStack_740;
    dStack_1e60 = dStack_740;
    local_1e38 = dStack_1850;
    dStack_1e30 = dStack_1850;
    dVar72 = exp((dStack_740 + local_1d18) - dStack_1850);
    dVar33 = local_1de8[3];
    dVar123 = dVar123 * 500000.0;
    local_1e48 = local_1e58 - dVar47;
    dVar111 = dVar123 / (dVar72 * dVar29);
    local_1a78 = h_RT[1];
    local_1e28 = h_RT[2];
    dVar81 = dVar51 * -0.30000000000000004 +
             dVar34 * 0.5 + dVar67 * 5.0 + dVar68 + dVar32 + dVar35 + dVar50 + dVar50;
    dVar72 = dVar53 * dVar31 * dVar123 + -dVar111 * dVar52;
    dVar83 = dVar81 * dVar72;
    dStack_1e40 = dStack_1e50;
    dVar82 = local_1f28[1] - dVar83;
    dVar126 = local_1f28[2] - dVar83;
    local_1f28[1] = dVar82;
    local_1f28[2] = dVar126;
    local_1f28[4] = dVar83 + local_1f28[4];
    dVar52 = (local_1e48 * dVar123 * dVar53 * dVar31 -
             (local_1e48 - ((h_RT[4] - (h_RT[1] + h_RT[2])) + 1.0) * dVar47) * dVar111 * dVar52) *
             dVar81;
    dVar123 = dVar123 * dVar81;
    dVar81 = dVar81 * dVar111;
    if (iVar2 == 2) {
      local_1670 = local_1670 - dVar72;
      dStack_1668 = dStack_1668 - dVar72;
      local_1658 = local_1658 + dVar72;
      dVar111 = dVar123 * dVar53;
      auStack_15c0._8_8_ = (double)auStack_15c0._8_8_ - dVar111;
      auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ - dVar111;
      dStack_15a8 = dVar111 + dStack_15a8;
      dVar123 = dVar123 * dVar31;
      local_1510 = local_1510 - dVar123;
      dStack_1508 = dStack_1508 - dVar123;
      dStack_14f8 = dVar123 + dStack_14f8;
      local_13b0 = dVar81 + local_13b0;
      dStack_13a8 = dVar81 + dStack_13a8;
      local_13a0._8_8_ = (double)local_13a0._8_8_ - dVar81;
      dVar123 = dVar72 * 5.0;
      local_1300 = local_1300 - dVar123;
      dStack_12f8 = dStack_12f8 - dVar123;
      local_12e8 = dVar123 + local_12e8;
      local_f90 = local_f90 - dVar72;
      dStack_f88 = dStack_f88 - dVar72;
      local_f78 = local_f78 + dVar72;
      dVar123 = dVar72 * 0.5;
      local_ee0 = local_ee0 - dVar123;
      dStack_ed8 = dStack_ed8 - dVar123;
      local_ec8 = dVar123 + local_ec8;
      local_e30 = local_e30 - dVar72;
      dStack_e28 = dStack_e28 - dVar72;
      local_e18 = local_e18 + dVar72;
      dVar123 = dVar72 + dVar72;
      local_a10 = local_a10 - dVar123;
      dStack_a08 = dStack_a08 - dVar123;
      local_9f8 = dVar123 + local_9f8;
      dVar72 = dVar72 * -0.30000000000000004;
      local_8b0 = local_8b0 - dVar72;
      dStack_8a8 = dStack_8a8 - dVar72;
      local_898 = dVar72 + local_898;
    }
    else {
      local_1b98[0] = dVar72 * 2.0;
      local_1b98[1] = dVar123 * dVar53 + dVar72;
      local_1b98[2] = dVar123 * dVar31 + dVar72;
      local_1b98[3] = dVar72;
      local_1b98[4] = dVar72 - dVar81;
      local_1b98[5] = dVar72 * 6.0;
      local_1b98[8] = dVar72;
      local_1b98[9] = dVar72;
      local_1b98[6] = dVar72;
      local_1b98[7] = dVar72;
      local_1b98[10] = local_1b98[0];
      local_1b98[0xb] = dVar72 * 1.5;
      local_1b98[0xc] = local_1b98[0];
      local_1b98[0xf] = dVar72;
      local_1b98[0x10] = dVar72;
      local_1b98[0xd] = dVar72;
      local_1b98[0xe] = dVar72;
      local_1b98[0x11] = dVar72;
      local_1b98[0x12] = dVar72 * 3.0;
      local_1b98[0x13] = dVar72;
      local_1b98[0x14] = dVar72 * 0.7;
      pdVar18 = local_1680 + 2;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar123 = local_1b98[lVar17];
        *pdVar18 = *pdVar18 - dVar123;
        pdVar18[1] = pdVar18[1] - dVar123;
        pdVar18[3] = dVar123 + pdVar18[3];
        pdVar18 = pdVar18 + 0x16;
      }
    }
    dVar72 = local_808[1] - dVar52;
    dVar54 = local_808[2] - dVar52;
    local_808[4] = dVar52 + local_808[4];
    dVar81 = (double)local_1df8._0_8_ * 0.0;
    local_808[1] = dVar72;
    local_808[2] = dVar54;
    local_1e78 = (undefined1  [8])exp(dVar47 * -1509.64999741416 + dVar81);
    dVar52 = exp((local_1858 + local_1e68) - local_1d38);
    dVar55 = dVar51 * -0.5 +
             dVar50 + dVar50 +
             dVar35 * 2.5 + dVar34 * 0.5 + dVar67 * 5.0 + dVar33 * 5.0 + dVar68 + dVar32;
    dVar123 = (double)local_1e78 * 602.0;
    dVar111 = dVar47 * 0.0;
    dVar68 = dVar28 * 1509.64999741416 + dVar111;
    dVar83 = dVar123 / (dVar52 * dVar29);
    dVar32 = dVar123 * dVar34 * dVar53 - dVar35 * dVar83;
    dVar52 = (dVar68 * dVar123 * dVar34 * dVar53 -
             (dVar68 - ((h_RT[0xc] - (local_1e28 + h_RT[0xb])) + 1.0) * dVar47) * dVar83 * dVar35) *
             dVar55;
    dVar123 = dVar123 * dVar55;
    dVar68 = dVar55 * dVar32;
    local_1f28[2] = dVar126 - dVar68;
    dStack_1ed0 = dStack_1ed0 - dVar68;
    local_1ec8 = dVar68 + local_1ec8;
    if (iVar2 == 2) {
      dStack_1668 = dStack_1668 - dVar32;
      local_1620 = local_1620 - dVar32;
      local_1618 = local_1618 + dVar32;
      dVar68 = dVar123 * dVar34;
      dStack_1508 = dStack_1508 - dVar68;
      local_14c0 = local_14c0 - dVar68;
      local_14b8 = dVar68 + local_14b8;
      dVar68 = dVar32 * 5.0;
      dStack_1458 = dStack_1458 - dVar68;
      local_1410 = local_1410 - dVar68;
      local_1408 = local_1408 + dVar68;
      dStack_12f8 = dStack_12f8 - dVar68;
      local_12b0 = local_12b0 - dVar68;
      local_12a8 = dVar68 + local_12a8;
      dStack_f88 = dStack_f88 - dVar32;
      dStack_f40 = dStack_f40 - dVar32;
      local_f38 = local_f38 + dVar32;
      dVar53 = dVar32 * 0.5 + dVar53 * dVar123;
      dStack_ed8 = dStack_ed8 - dVar53;
      dStack_e90 = dStack_e90 - dVar53;
      dStack_e88 = dVar53 + dStack_e88;
      dVar53 = dVar32 * 2.5 - dVar83 * dVar55;
      dStack_e28 = dStack_e28 - dVar53;
      local_de0 = local_de0 - dVar53;
      local_dd8 = dVar53 + local_dd8;
      dVar53 = dVar32 + dVar32;
      dStack_a08 = dStack_a08 - dVar53;
      local_9c0 = local_9c0 - dVar53;
      local_9b8 = dVar53 + local_9b8;
      dVar32 = dVar32 * -0.5;
      dStack_8a8 = dStack_8a8 - dVar32;
      local_860 = local_860 - dVar32;
      local_858 = dVar32 + local_858;
      local_808[2] = dVar54;
    }
    else {
      local_1b98[0] = dVar32 + dVar32;
      local_1b98[1] = dVar32;
      local_1b98[2] = dVar123 * dVar34 + dVar32;
      local_1b98[3] = dVar32 * 6.0;
      local_1b98[4] = dVar32;
      local_1b98[5] = dVar32 * 6.0;
      local_1b98[8] = dVar32;
      local_1b98[9] = dVar32;
      local_1b98[6] = dVar32;
      local_1b98[7] = dVar32;
      local_1b98[10] = dVar32 + dVar32;
      local_1b98[0xb] = dVar32 * 1.5 + dVar53 * dVar123;
      local_1b98[0xc] = dVar32 * 3.5 + -(dVar83 * dVar55);
      local_1b98[0xf] = dVar32;
      local_1b98[0x10] = dVar32;
      local_1b98[0xd] = dVar32;
      local_1b98[0xe] = dVar32;
      local_1b98[0x11] = dVar32;
      local_1b98[0x12] = dVar32 * 3.0;
      local_1b98[0x13] = dVar32;
      local_1b98[0x14] = dVar32 * 0.5;
      pdVar18 = local_1680 + 0xd;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar53 = local_1b98[lVar17];
        pdVar18[-10] = pdVar18[-10] - dVar53;
        pdVar18[-1] = pdVar18[-1] - dVar53;
        *pdVar18 = dVar53 + *pdVar18;
        pdVar18 = pdVar18 + 0x16;
      }
    }
    local_808[2] = local_808[2] - dVar52;
    local_7b8._8_8_ = (double)local_7b8._8_8_ - dVar52;
    dVar68 = local_1808 * -0.0;
    local_7a8 = dVar52 + local_7a8;
    dVar53 = (dVar50 * 0.5 + dVar35 * 0.5 + dVar34 * -0.25 + ((local_1d28 - dVar33) - dVar67)) -
             local_1de8[0x13];
    dVar123 = exp((double)local_1df8._0_8_ * -0.86 + dVar49);
    local_1e28 = local_1de8[6];
    dVar32 = (local_1c28 + local_1d18) - (double)local_1ce8._0_8_;
    dVar34 = exp(dVar32);
    RVar9 = h_RT[6];
    dVar53 = dVar53 - dVar51;
    dVar51 = dVar33 * dVar31;
    dVar123 = dVar123 * 2800000.0;
    dVar50 = dVar47 * -0.86 + local_1e58;
    dVar35 = dVar123 / (dVar34 * dVar29);
    local_1d08 = h_RT[3];
    local_1818 = local_1a78 + h_RT[3];
    dVar34 = dVar123 * dVar51 - local_1e28 * dVar35;
    local_1cf8 = dVar53 * dVar34;
    dVar52 = (dVar50 * dVar123 * dVar51 -
             (dVar50 - ((h_RT[6] - (local_1a78 + h_RT[3])) + 1.0) * dVar47) * dVar35 * local_1e28) *
             dVar53;
    dVar82 = dVar82 - local_1cf8;
    local_1f28[1] = dVar82;
    dVar50 = local_1f28[3] - local_1cf8;
    local_1f28[3] = dVar50;
    local_1cf8 = local_1cf8 + local_1f28[6];
    local_1f28[6] = local_1cf8;
    dVar123 = dVar123 * dVar53;
    dVar35 = dVar35 * dVar53;
    dVar53 = dVar123 * dVar33;
    if (iVar2 == 2) {
      local_2108 = (double)auStack_15c0._0_8_ - dVar53;
      auStack_15c0._0_8_ = local_2108;
      local_15b0 = local_15b0 - dVar53;
      local_1598 = dVar53 + local_1598;
      dVar53 = dVar123 * dVar31 - dVar34;
      local_2118 = local_1460 - dVar53;
      local_1460 = local_2118;
      local_1450 = local_1450 - dVar53;
      dStack_1438 = dVar53 + dStack_1438;
      local_1300 = local_1300 + dVar34;
      local_12f0 = local_12f0 + dVar34;
      local_12d8 = local_12d8 - dVar34;
      local_1250 = local_1250 + dVar35;
      local_1240 = local_1240 + dVar35;
      dStack_1228 = dStack_1228 - dVar35;
      dVar53 = dVar34 * -0.25;
      local_ee0 = local_ee0 - dVar53;
      local_ed0 = local_ed0 - dVar53;
      local_eb8 = dVar53 + local_eb8;
      dVar53 = dVar34 * 0.5;
      local_e30 = local_e30 - dVar53;
      local_e20 = local_e20 - dVar53;
      local_e08 = local_e08 + dVar53;
      local_a10 = local_a10 - dVar53;
      local_a00 = local_a00 - dVar53;
      local_9e8 = dVar53 + local_9e8;
      local_960 = local_960 + dVar34;
      local_950 = local_950 + dVar34;
      local_938 = local_938 - dVar34;
      local_8b0 = local_8b0 + dVar34;
      local_8a0 = local_8a0 + dVar34;
      local_888 = local_888 - dVar34;
    }
    else {
      local_1b98[0] = dVar34;
      local_1b98[1] = dVar53 + dVar34;
      local_1b98[2] = dVar34;
      local_1b98[3] = dVar123 * dVar31;
      local_1b98[4] = dVar34;
      local_1b98[6] = dVar34 - dVar35;
      local_1b98[9] = dVar34;
      local_1b98[10] = dVar34;
      local_1b98[7] = dVar34;
      local_1b98[8] = dVar34;
      local_1b98[0xb] = dVar34 * 0.75;
      local_1b98[0xc] = dVar34 * 1.5;
      local_1b98[0xf] = dVar34;
      local_1b98[0x10] = dVar34;
      local_1b98[0xd] = dVar34;
      local_1b98[0xe] = dVar34;
      local_1b98[0x11] = dVar34;
      local_1b98[0x12] = dVar34 * 1.5;
      pdVar18 = local_1680 + 2;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar53 = local_1b98[lVar17];
        *pdVar18 = *pdVar18 - dVar53;
        pdVar18[2] = pdVar18[2] - dVar53;
        pdVar18[5] = dVar53 + pdVar18[5];
        pdVar18 = pdVar18 + 0x16;
      }
      local_2108 = (double)auStack_15c0._0_8_;
      local_2118 = local_1460;
      dVar72 = local_808[1];
    }
    dVar123 = dStack_1228;
    dVar55 = local_1240;
    dVar54 = local_1250;
    dVar53 = dStack_1438;
    dVar83 = local_1450;
    dVar126 = local_15b0;
    dVar56 = local_808[3] - dVar52;
    local_6b8 = dVar52 + local_808[6];
    uStack_6b0 = 0;
    local_1e08 = local_568 * -0.0;
    dStack_1e00 = (double)uStack_560;
    local_6c8 = dVar31 * dVar33 * dVar33;
    dVar85 = (double)local_1df8._0_8_ * -1.72 + dVar49;
    local_1e18 = (undefined1  [8])local_1598;
    dVar34 = exp(dVar85);
    dVar34 = dVar34 * 300000000.0;
    local_1e78 = (undefined1  [8])(dVar47 * -1.72 + local_1e58);
    uStack_1e70 = 0.0;
    local_1828 = dVar33 * local_1e28;
    dVar35 = exp(dVar32);
    dVar35 = dVar34 / (dVar35 * dVar29);
    dVar112 = dVar34 * local_6c8 - local_1828 * dVar35;
    dVar86 = (double)local_1e78 * dVar34 * local_6c8 -
             ((double)local_1e78 -
             (((local_1d08 + RVar9) - (local_1d08 + local_1d08 + local_1a78)) + 1.0) * dVar47) *
             dVar35 * local_1828;
    local_1a78 = dVar112 + local_1cf8;
    dVar87 = dVar33 * dVar33 * dVar34;
    dVar88 = dVar87 + (double)local_1e18;
    dVar102 = (dVar34 * dVar31 + dVar34 * dVar31) * dVar33 - dVar35 * local_1e28;
    dVar33 = -dVar35 * dVar33;
    dVar103 = dVar86 + local_6b8;
    local_1cf8 = exp((double)local_1df8._0_8_ * -0.76 + dVar49);
    local_1cf8 = local_1cf8 * 9380000.0;
    dVar31 = dVar47 * -0.76 + local_1e58;
    dVar35 = dVar67 * local_1e28;
    dVar84 = exp(dVar32);
    dVar34 = local_1de8[0x13];
    dVar84 = local_1cf8 / (dVar84 * dVar29);
    dVar104 = local_1cf8 * dVar51 * dVar67 - dVar35 * dVar84;
    dVar120 = dVar31 * local_1cf8 * dVar51 * dVar67 -
              (dVar31 - (((h_RT[5] + RVar9) - (local_1818 + h_RT[5])) + 1.0) * dVar47) * dVar84 *
              dVar35;
    dVar105 = dVar104 + local_1a78;
    dVar116 = local_1cf8 * local_1de8[3] * local_1de8[5];
    local_1d08 = local_1de8[1];
    dVar89 = -dVar84 * local_1de8[5];
    dVar117 = local_1de8[5] * local_1cf8 * local_1de8[1];
    local_1818 = dVar117 + dVar102 + dVar53;
    local_1e28 = local_1de8[6];
    local_1e18 = (undefined1  [8])local_1de8[3];
    dVar31 = local_1cf8 * local_1de8[1] * local_1de8[3] - dVar84 * local_1de8[6];
    local_1300 = local_1300 - dVar31;
    local_12f0 = local_12f0 - dVar31;
    local_12d8 = dVar31 + local_12d8;
    local_1cf8 = dVar89 + dVar33 + dVar123;
    uStack_1cf0 = 0x8000000000000000;
    dVar51 = local_1de8[3] * local_1de8[1];
    dVar31 = dVar51 * local_1de8[0x13];
    dVar53 = exp(dVar85);
    dVar53 = dVar53 * 375000000.0;
    dVar67 = local_1e28 * dVar34;
    dVar123 = exp(dVar32);
    RVar9 = h_RT[6];
    dVar35 = local_1de8[0x14];
    dVar123 = dVar53 / (dVar123 * dVar29);
    local_1a78 = h_RT[1] + h_RT[3];
    dVar106 = dVar53 * dVar31 - dVar67 * dVar123;
    dVar84 = (double)local_1e78 * dVar53 * dVar31 -
             ((double)local_1e78 -
             (((h_RT[0x13] + h_RT[6]) - (local_1a78 + h_RT[0x13])) + 1.0) * dVar47) * dVar123 *
             dVar67;
    dVar85 = dVar53 * (double)local_1e18 * dVar34;
    dVar90 = dVar34 * dVar53 * local_1d08;
    dVar91 = dVar90 + local_1818;
    dVar34 = -dVar123 * dVar34;
    dVar92 = dVar34 + local_1cf8;
    dVar31 = dVar53 * local_1d08 * (double)local_1e18 - dVar123 * local_1e28;
    local_960 = local_960 - dVar31;
    local_950 = local_950 - dVar31;
    local_938 = dVar31 + local_938;
    local_1e78 = (undefined1  [8])(dVar84 + dVar120 + dVar103);
    dVar51 = dVar51 * local_1de8[0x14];
    dVar69 = exp(dVar69);
    dVar31 = local_1de8[6];
    dVar69 = dVar69 * 700000.0;
    local_1e28 = local_1de8[6] * dVar35;
    dVar32 = exp(dVar32);
    dVar53 = local_1de8[0x12];
    dVar67 = local_1de8[5];
    dVar123 = local_1de8[0];
    dVar32 = dVar69 / (dVar32 * dVar29);
    local_1f28[6] = dVar69 * dVar51 - local_1e28 * dVar32;
    local_808[6] = dVar115 * dVar69 * dVar51 -
                   (dVar115 - (((h_RT[0x14] + RVar9) - (local_1a78 + h_RT[0x14])) + 1.0) * dVar47) *
                   dVar32 * local_1e28;
    dVar51 = (((dVar82 - dVar112) - dVar104) - dVar106) - local_1f28[6];
    local_1f28[3] = (((dVar50 - dVar112) - dVar104) - dVar106) - local_1f28[6];
    local_1f28[6] = local_1f28[6] + dVar106 + dVar105;
    local_1598 = dVar69 * local_1de8[3] * dVar35;
    local_2108 = (((local_2108 - dVar87) - dVar116) - dVar85) - local_1598;
    auStack_15c0._0_8_ = local_2108;
    local_15b0 = (((dVar126 - dVar87) - dVar116) - dVar85) - local_1598;
    local_1598 = local_1598 + dVar85 + dVar116 + dVar88;
    local_1e28 = local_1de8[1];
    dStack_1438 = dVar35 * dVar69 * local_1de8[1];
    local_1460 = (((local_2118 - dVar102) - dVar117) - dVar90) - dStack_1438;
    local_1450 = (((dVar83 - dVar102) - dVar117) - dVar90) - dStack_1438;
    dStack_1438 = dStack_1438 + dVar91;
    dStack_1228 = -dVar32 * dVar35;
    local_1250 = (((dVar54 - dVar33) - dVar89) - dVar34) - dStack_1228;
    local_1240 = (((dVar55 - dVar33) - dVar89) - dVar34) - dStack_1228;
    dStack_1228 = dStack_1228 + dVar92;
    dVar31 = dVar69 * local_1de8[1] * local_1de8[3] - dVar32 * dVar31;
    dVar69 = local_8b0 - dVar31;
    local_8a0 = local_8a0 - dVar31;
    local_888 = dVar31 + local_888;
    local_2078 = ((((dVar72 - dVar52) - dVar86) - dVar120) - dVar84) - local_808[6];
    local_808[3] = (((dVar56 - dVar86) - dVar120) - dVar84) - local_808[6];
    local_808[6] = local_808[6] + (double)local_1e78;
    dVar31 = (((local_1d28 - local_1de8[0]) - local_1de8[5]) + local_1de8[10]) - local_1de8[0xc];
    local_1f28[1] = dVar51;
    local_8b0 = dVar69;
    local_808[1] = local_2078;
    dVar33 = exp(dVar70);
    dVar34 = (local_1d18 + local_1d18) - local_1868;
    dVar50 = exp(dVar34);
    dVar32 = local_6a8;
    RVar9 = h_RT[0];
    dVar31 = dVar35 * -0.37 + dVar53 + dVar53 + dVar31;
    dVar72 = local_1e28 * local_1e28;
    dVar33 = dVar33 * 1000000.0;
    dVar50 = dVar33 / (dVar50 * dVar29);
    dVar53 = h_RT[1] + h_RT[1];
    dVar35 = dVar33 * dVar72 - dVar123 * dVar50;
    dVar70 = dVar31 * dVar35;
    dVar52 = local_1f28[0] + dVar70;
    local_1e48 = (local_1e48 * dVar33 * dVar72 -
                 (local_1e48 - ((h_RT[0] - dVar53) + 1.0) * dVar47) * dVar50 * dVar123) * dVar31;
    dVar33 = dVar33 * dVar31;
    if (iVar2 == 2) {
      dVar31 = -dVar31 * dVar50 - dVar35;
      local_20e8 = local_1680[1] + dVar31;
      local_20a8 = local_1670 - (dVar31 + dVar31);
      dVar31 = (dVar33 + dVar33) * local_1e28;
      local_20d8 = local_15d0[1] + dVar31;
      local_2108 = local_2108 - (dVar31 + dVar31);
      local_1a78 = local_1308 - dVar35;
      dVar31 = dVar35 + dVar35;
      local_1300 = local_1300 + dVar31;
      local_f98 = local_f98 + dVar35;
      local_f90 = local_f90 - dVar31;
      local_e38 = local_e38 - dVar35;
      local_e30 = local_e30 + dVar31;
      local_a18 = local_a18 + dVar31;
      local_a10 = local_a10 - (dVar31 + dVar31);
      dVar35 = dVar35 * -0.37;
      local_8b8 = local_8b8 + dVar35;
      local_8b0 = dVar69 - (dVar35 + dVar35);
    }
    else {
      local_1b98[0] = -dVar31 * dVar50;
      local_1b98[1] = (dVar33 + dVar33) * local_1e28 + dVar35;
      local_1b98[2] = dVar35;
      local_1b98[3] = dVar35;
      local_1b98[4] = dVar35;
      local_1b98[8] = dVar35;
      local_1b98[9] = dVar35;
      local_1b98[6] = dVar35;
      local_1b98[7] = dVar35;
      local_1b98[10] = dVar35 + dVar35;
      local_1b98[0xb] = dVar35;
      local_1b98[0xf] = dVar35;
      local_1b98[0x10] = dVar35;
      local_1b98[0xd] = dVar35;
      local_1b98[0xe] = dVar35;
      local_1b98[0x11] = dVar35;
      local_1b98[0x12] = dVar35 * 3.0;
      local_1b98[0x13] = dVar35;
      local_1b98[0x14] = dVar35 * 0.63;
      pdVar18 = local_1b98;
      for (lVar17 = 1; lVar17 != 0x1cf; lVar17 = lVar17 + 0x16) {
        dVar31 = *pdVar18;
        local_1680[lVar17] = local_1680[lVar17] + dVar31;
        local_1680[lVar17 + 1] = local_1680[lVar17 + 1] - (dVar31 + dVar31);
        pdVar18 = pdVar18 + 1;
      }
      local_2078 = local_808[1];
      local_20e8 = local_1680[1];
      local_20a8 = local_1670;
      local_20d8 = local_15d0[1];
      local_2108 = (double)auStack_15c0._0_8_;
      local_1a78 = local_1308;
    }
    local_1e08 = local_1e08 + dVar68 + dVar1 * -0.0 + dVar26 * -2.5 + dVar47 * -745.375 + -1.866;
    dVar115 = local_808[0] + local_1e48;
    dVar26 = exp((double)local_1df8._0_8_ * -0.6 + dVar49);
    dVar31 = exp(dVar34);
    local_1aa8._0_8_ = dVar31;
    local_1cf8 = exp((double)local_1df8._0_8_ * -1.25 + dVar49);
    dVar33 = exp(dVar34);
    dVar82 = local_1300;
    local_1828 = h_RT[5];
    local_1d08 = local_1de8[0xc];
    local_1818 = (double)local_1df8._0_8_ + (double)local_1df8._0_8_;
    uStack_1810 = local_1df8._8_8_;
    dVar69 = dVar49 - local_1818;
    dVar126 = exp(dVar69);
    dVar31 = local_1de8[0];
    dVar126 = dVar126 * 550000000.0;
    dVar34 = exp(dVar34);
    RVar10 = h_RT[1];
    dVar68 = local_1de8[5];
    dVar50 = local_1de8[4];
    dVar35 = local_1de8[1];
    dVar83 = dVar126 / (dVar34 * dVar29);
    local_1a98 = h_RT[0xc];
    local_1a88 = h_RT[0] + h_RT[0xc];
    dVar34 = local_1de8[1] * local_1de8[1] * dVar126 - dVar31 * dVar83;
    local_e38 = local_e38 + dVar34;
    local_e30 = local_e30 - (dVar34 + dVar34);
    dVar56 = local_1de8[5] * 2.65 + dVar31 * -0.27 + local_1d28 + local_1de8[10];
    local_6b8 = local_1de8[0x12];
    uStack_1e70 = 0.0;
    local_1e78 = (undefined1  [8])local_1de8[0x14];
    local_1e18 = (undefined1  [8])exp(dVar69);
    uVar8 = local_1ce8._8_8_;
    local_6c8 = exp((local_1e38 + local_1d18) - (double)local_1ce8._8_8_);
    RVar11 = h_RT[5];
    dVar69 = local_1de8[0xd];
    uStack_6c0 = extraout_XMM0_Qb_00;
    dVar54 = local_1e48 + local_1e48;
    dVar26 = dVar26 * 90000.0;
    dVar84 = dVar26 / ((double)local_1aa8._0_8_ * dVar29);
    dVar34 = dVar47 * -0.6 + local_1e58;
    dVar87 = dVar26 * dVar123 * dVar72 - dVar123 * dVar123 * dVar84;
    dVar55 = dVar34 * dVar26 * dVar123 * dVar72 -
             (dVar34 - (((RVar9 + RVar9) - (dVar53 + RVar9)) + 1.0) * dVar47) * dVar84 *
             dVar123 * dVar123;
    dVar84 = dVar26 * dVar72 + dVar84 * -2.0 * dVar123;
    dVar85 = (dVar26 * dVar123 + dVar26 * dVar123) * local_1e28;
    dVar53 = dVar53 + local_1828;
    dVar34 = local_1828 + RVar9;
    dVar86 = dVar47 * -1.25 + local_1e58;
    local_1e48 = dVar47 + dVar47;
    dStack_1e40 = 0.0;
    dVar26 = local_1e58 - local_1e48;
    local_1828 = dVar72 * local_1d08;
    uStack_1820 = 0;
    dVar88 = dVar26 * dVar126 * local_1828 -
             (dVar26 - ((local_1a88 - (RVar10 + RVar10 + local_1a98)) + 1.0) * dVar47) * dVar83 *
             dVar31 * local_1d08;
    local_1a88 = dVar31 * local_1d08 * dVar83;
    dVar102 = -dVar83 * local_1d08;
    dVar31 = (dVar126 + dVar126) * dVar35 * local_1d08;
    dVar83 = (double)local_1e78 * -0.62 + local_6b8 + local_6b8 + dVar56;
    auVar108._0_8_ = dVar33 * dVar29;
    auVar108._8_8_ = local_6c8 * dVar29;
    dVar56 = local_1cf8 * 60000000.0;
    dVar33 = (double)local_1e18 * 22000000000.0;
    auVar131._8_8_ = dVar33;
    auVar131._0_8_ = dVar56;
    auVar132 = divpd(auVar131,auVar108);
    dVar89 = auVar132._0_8_;
    dVar86 = dVar86 * dVar56 * dVar67 * dVar72 -
             (dVar86 - ((dVar34 - dVar53) + 1.0) * dVar47) * dVar89 * dVar123 * dVar67;
    dVar90 = auVar132._8_8_;
    dVar53 = dVar56 * dVar67 * dVar72 - dVar123 * dVar67 * dVar89;
    dVar34 = dVar33 * dVar50 * dVar35 - dVar68 * dVar90;
    dVar29 = dVar67 * -dVar89;
    dVar67 = (dVar56 + dVar56) * local_1e28 * dVar67;
    dVar123 = dVar72 * dVar56 + -dVar89 * dVar123;
    local_1308 = local_1a78 + dVar123;
    local_1300 = dVar82 - (dVar123 + dVar123);
    dVar123 = local_1828 * dVar126 - local_1a88;
    local_1680[1] = local_20e8 + dVar84 + dVar29 + dVar102;
    local_1670 = ((local_20a8 - (dVar84 + dVar84)) - (dVar29 + dVar29)) - (dVar102 + dVar102);
    local_15d0[1] = local_20d8 + dVar85 + dVar67 + dVar31;
    dVar29 = ((local_2108 - (dVar85 + dVar85)) - (dVar67 + dVar67)) - (dVar31 + dVar31);
    auStack_15c0._0_8_ = dVar29;
    local_808[0] = dVar115 + dVar55 + dVar86 + dVar88;
    dVar31 = dVar83 * dVar34;
    dVar67 = ((((dVar51 - (dVar70 + dVar70)) - (dVar87 + dVar87)) - (dVar53 + dVar53)) -
             (dVar123 + dVar123)) - dVar31;
    local_1f28[0] = dVar52 + dVar87 + dVar53 + dVar123;
    local_1f28[1] = dVar67;
    local_1f28[4] = local_1f28[4] - dVar31;
    local_1f28[5] = dVar31 + local_1f28[5];
    local_808[1] = (((local_2078 - dVar54) - (dVar55 + dVar55)) - (dVar86 + dVar86)) -
                   (dVar88 + dVar88);
    dVar26 = (dVar50 * dVar35 * dVar26 * dVar33 -
             (dVar26 - ((h_RT[5] - (h_RT[4] + RVar10)) + 1.0) * dVar47) * dVar90 * dVar68) * dVar83;
    dVar33 = dVar33 * dVar83;
    if (iVar2 == 2) {
      dVar31 = dVar34 * -0.27;
      local_1670 = local_1670 - dVar31;
      local_1658 = local_1658 - dVar31;
      local_1650 = dVar31 + local_1650;
      dVar50 = dVar50 * dVar33;
      auStack_15c0._0_8_ = dVar29 - dVar50;
      dStack_15a8 = dStack_15a8 - dVar50;
      local_15a0 = dVar50 + local_15a0;
      dVar33 = dVar33 * dVar35;
      local_13b0 = local_13b0 - dVar33;
      local_13a0._8_8_ = (double)local_13a0._8_8_ - dVar33;
      local_1390 = dVar33 + local_1390;
      dVar29 = dVar34 * 2.65 - dVar90 * dVar83;
      local_2118 = local_1300 - dVar29;
      local_12e8 = local_12e8 - dVar29;
      local_12e0 = dVar29 + local_12e0;
      local_f90 = local_f90 - dVar34;
      local_f78 = local_f78 - dVar34;
      local_f70 = local_f70 + dVar34;
      dVar29 = dVar34 + dVar34;
      local_a10 = local_a10 - dVar29;
      local_9f8 = local_9f8 - dVar29;
      local_9f0 = dVar29 + local_9f0;
      dVar34 = dVar34 * -0.62;
      local_8b0 = local_8b0 - dVar34;
      local_898 = local_898 - dVar34;
      local_890 = dVar34 + local_890;
    }
    else {
      local_1b98[0] = dVar34 * 0.73;
      local_1b98[1] = dVar50 * dVar33 + dVar34;
      local_1b98[2] = dVar34;
      local_1b98[3] = dVar34;
      local_1b98[4] = dVar34 + dVar35 * dVar33;
      local_1b98[5] = -(dVar90 * dVar83) + dVar34 * 3.65;
      local_1b98[8] = dVar34;
      local_1b98[9] = dVar34;
      local_1b98[6] = dVar34;
      local_1b98[7] = dVar34;
      local_1b98[10] = dVar34 + dVar34;
      local_1b98[0xd] = dVar34;
      local_1b98[0xe] = dVar34;
      local_1b98[0xb] = dVar34;
      local_1b98[0xc] = dVar34;
      local_1b98[0xf] = dVar34;
      local_1b98[0x10] = dVar34;
      local_1b98[0x11] = dVar34;
      local_1b98[0x12] = dVar34 * 3.0;
      local_1b98[0x13] = dVar34;
      local_1b98[0x14] = dVar34 * 0.38;
      pdVar18 = local_1680 + 6;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar29 = local_1b98[lVar17];
        pdVar18[-4] = pdVar18[-4] - dVar29;
        pdVar18[-1] = pdVar18[-1] - dVar29;
        *pdVar18 = dVar29 + *pdVar18;
        pdVar18 = pdVar18 + 0x16;
      }
      local_2118 = local_1300;
    }
    uVar14 = auStack_15c0._0_8_;
    dVar70 = local_808[1] - dVar26;
    local_808[4] = local_808[4] - dVar26;
    local_808[5] = dVar26 + local_808[5];
    dVar50 = dVar32 * -0.0 + local_1e08;
    uStack_1e70 = 0.0;
    local_1e78 = (undefined1  [8])(dVar68 * local_1de8[0xd]);
    dVar26 = dVar47 * -8554.68331868024 - (double)local_1df8._0_8_;
    dVar123 = exp(dVar26);
    dVar53 = local_1de8[0xb];
    dVar123 = dVar123 * 2244000000000.0;
    dVar32 = dVar28 * 8554.68331868024 - dVar47;
    local_1e08 = dVar35 * dVar68 * local_1de8[0xb];
    dStack_1e00 = 0.0;
    dVar51 = -local_1d18;
    RStack_1e20 = (Real)((ulong)dStack_1d10 ^ 0x8000000000000000);
    local_1e28 = (dVar51 - local_1858) + local_1848;
    dVar31 = exp(local_1e28);
    RVar13 = h_RT[0xd];
    RVar12 = h_RT[0xb];
    dVar29 = local_1de8[0];
    dVar31 = dVar123 / (dVar31 * local_19a8);
    dVar55 = dVar123 * (double)local_1e78 - local_1e08 * dVar31;
    dVar33 = dVar32 * dVar123 * (double)local_1e78 -
             (dVar32 - (((RVar10 + RVar11 + h_RT[0xb]) - (RVar11 + h_RT[0xd])) + -1.0) * dVar47) *
             dVar31 * local_1e08;
    dVar82 = dVar68 * -dVar31 * dVar53;
    local_1cf8 = local_1570 + dVar82;
    local_1d08 = local_1560 - dVar82;
    dVar35 = -dVar31 * dVar35;
    dVar56 = dVar123 * dVar69 + dVar53 * dVar35;
    local_12b0 = local_12b0 + dVar56;
    dVar115 = local_12a0 - dVar56;
    dVar35 = dVar35 * dVar68;
    dVar126 = local_ee0 + dVar35;
    dVar83 = dStack_e90 + dVar35;
    dVar35 = local_e80 - dVar35;
    dVar123 = dVar123 * dVar68;
    dVar52 = local_d80 + dVar123;
    local_1a78 = local_d30 + dVar123;
    dVar123 = local_d20 - dVar123;
    dVar70 = dVar70 + dVar33;
    dVar72 = (double)local_7b8._8_8_ + dVar33;
    local_7b8._8_8_ = dVar72;
    dVar33 = dStack_7a0 - dVar33;
    dVar31 = local_1d28 + local_1de8[0];
    local_1d28 = dStack_1ed0 + dVar55;
    dVar84 = dVar53 * 0.5 + (dVar31 - dVar68) + local_1de8[10] + local_1de8[0xc];
    local_1e08 = dStack_1ec0;
    local_1e78 = (undefined1  [8])local_1de8[0x12];
    local_1570 = local_1cf8;
    local_1560 = local_1d08;
    local_1300 = local_2118 + dVar56;
    local_12a0 = dVar115;
    local_ee0 = dVar126;
    dStack_e90 = dVar83;
    local_e80 = dVar35;
    local_d80 = dVar52;
    local_d30 = local_1a78;
    local_d20 = dVar123;
    local_808[1] = dVar70;
    dStack_7a0 = dVar33;
    auStack_15c0._0_8_ = (double)uVar14 + dVar82;
    local_1e18 = (undefined1  [8])local_12b0;
    dVar26 = exp(dVar26);
    dVar31 = local_1de8[1];
    dVar34 = exp(local_1e28);
    RVar9 = h_RT[1];
    dVar84 = (double)local_1e78 + (double)local_1e78 + dVar84;
    dVar26 = dVar26 * 187000000000.0;
    dVar68 = dVar26 / (dVar34 * local_19a8);
    dVar34 = dVar26 * dVar69 - dVar53 * dVar31 * dVar68;
    dVar54 = dVar84 * dVar34;
    dVar67 = dVar67 + dVar55 + dVar54;
    local_1f28[1] = dVar67;
    dStack_1ed0 = local_1d28 + dVar54;
    dStack_1ec0 = (local_1e08 - dVar55) - dVar54;
    dVar53 = (dVar32 * dVar26 * dVar69 -
             (dVar32 - (((RVar12 + h_RT[1]) - RVar13) + -1.0) * dVar47) * dVar68 * dVar53 * dVar31)
             * dVar84;
    dVar26 = dVar26 * dVar84;
    dVar68 = dVar68 * dVar84;
    if (iVar2 == 2) {
      local_1670 = local_1670 + dVar34;
      local_1620 = local_1620 + dVar34;
      local_1610 = local_1610 - dVar34;
      local_1560 = -dVar68 * local_1de8[0xb];
      auStack_15c0._0_8_ = (double)uVar14 + dVar82 + local_1560;
      local_1570 = local_1cf8 + local_1560;
      local_1560 = local_1d08 - local_1560;
      local_1300 = (local_2118 + dVar56) - dVar34;
      local_12b0 = (double)local_1e18 - dVar34;
      local_12a0 = dVar115 + dVar34;
      local_f90 = local_f90 + dVar34;
      dStack_f40 = dStack_f40 + dVar34;
      local_f30 = local_f30 - dVar34;
      local_e80 = dVar34 * 0.5 - dVar68 * dVar31;
      local_ee0 = dVar126 + local_e80;
      dStack_e90 = dVar83 + local_e80;
      local_e80 = dVar35 - local_e80;
      local_e30 = local_e30 + dVar34;
      local_de0 = local_de0 + dVar34;
      local_dd0 = local_dd0 - dVar34;
      local_d80 = dVar52 + dVar26;
      local_d30 = local_1a78 + dVar26;
      local_d20 = dVar123 - dVar26;
      dVar34 = dVar34 + dVar34;
      local_a10 = local_a10 + dVar34;
      local_9c0 = local_9c0 + dVar34;
      local_9b0 = local_9b0 - dVar34;
      dStack_7a0 = dVar33;
      local_808[1] = dVar70;
    }
    else {
      local_1b98[0] = dVar34 + dVar34;
      local_1b98[1] = dVar34 - dVar68 * local_1de8[0xb];
      local_1b98[2] = dVar34;
      local_1b98[3] = dVar34;
      local_1b98[4] = dVar34;
      local_1b98[8] = dVar34;
      local_1b98[9] = dVar34;
      local_1b98[6] = dVar34;
      local_1b98[7] = dVar34;
      local_1b98[10] = local_1b98[0];
      local_1b98[0xb] = dVar34 * 1.5 - dVar31 * dVar68;
      local_1b98[0xc] = local_1b98[0];
      local_1b98[0xd] = dVar26 + dVar34;
      local_1b98[0x10] = dVar34;
      local_1b98[0x11] = dVar34;
      local_1b98[0xe] = dVar34;
      local_1b98[0xf] = dVar34;
      local_1b98[0x12] = dVar34 * 3.0;
      local_1b98[0x13] = dVar34;
      local_1b98[0x14] = dVar34;
      pdVar18 = local_1680 + 0xe;
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        dVar26 = local_1b98[lVar17];
        pdVar18[-0xc] = pdVar18[-0xc] + dVar26;
        pdVar18[-2] = pdVar18[-2] + dVar26;
        *pdVar18 = *pdVar18 - dVar26;
        pdVar18 = pdVar18 + 0x16;
      }
    }
    uVar14 = auStack_15c0._0_8_;
    dVar123 = local_1670;
    local_808[1] = local_808[1] + dVar53;
    local_7b8._8_8_ = (double)local_7b8._8_8_ + dVar53;
    dStack_7a0 = dStack_7a0 - dVar53;
    local_1d28 = local_1de8[2];
    uStack_1d20 = 0;
    dVar33 = dVar29 * local_1de8[2];
    dVar52 = exp((double)local_1df8._0_8_ * 2.67 + dVar47 * -3165.232827911689);
    dVar26 = local_1de8[4];
    dVar52 = dVar52 * 0.05;
    dVar34 = dVar47 * 2.67 + dVar28 * 3165.232827911689;
    dVar35 = dVar31 * local_1de8[4];
    local_1e28 = local_1868 - local_1d18;
    dVar53 = exp((local_1e68 + local_1e28) - local_1e38);
    dVar32 = local_1de8[6];
    dVar53 = dVar52 / dVar53;
    dVar70 = dVar52 * dVar33 - dVar35 * dVar53;
    local_1f28[0] = local_1f28[0] - dVar70;
    local_1f28[1] = dVar67 + dVar70;
    dVar67 = dVar52 * local_1d28;
    local_1680[1] = local_1680[1] - dVar67;
    local_1670 = dVar123 + dVar67;
    dStack_1668 = dStack_1668 - dVar67;
    local_1658 = dVar67 + local_1658;
    dVar26 = dVar26 * -dVar53;
    local_15d0[1] = local_15d0[1] - dVar26;
    auStack_15c0._0_8_ = (double)uVar14 + dVar26;
    auStack_15c0._8_8_ = (double)auStack_15c0._8_8_ - dVar26;
    local_1898 = local_1f28[2] - dVar70;
    dVar70 = dVar70 + local_1f28[4];
    dStack_15a8 = dVar26 + dStack_15a8;
    dVar68 = dVar34 * dVar52 * dVar33 -
             (dVar34 - ((RVar9 + h_RT[4]) - (h_RT[0] + h_RT[2])) * dVar47) * dVar53 * dVar35;
    dVar52 = dVar52 * dVar29;
    local_1518 = local_1518 - dVar52;
    local_1510 = local_1510 + dVar52;
    dVar85 = dStack_1508 - dVar52;
    dVar52 = dVar52 + dStack_14f8;
    dVar31 = -dVar53 * dVar31;
    local_13b8 = local_13b8 - dVar31;
    local_13b0 = local_13b0 + dVar31;
    local_16f8 = dStack_13a8 - dVar31;
    dVar31 = dVar31 + (double)local_13a0._8_8_;
    local_808[0] = local_808[0] - dVar68;
    local_808[1] = local_808[1] + dVar68;
    local_16b8 = local_808[2] - dVar68;
    dVar68 = dVar68 + local_808[4];
    dVar49 = dVar49 + dVar81;
    dVar69 = exp(dVar49);
    dVar123 = local_1de8[3];
    local_6c8 = local_1de8[4];
    uStack_6c0 = 0;
    dVar26 = exp(((local_1e68 - local_1c28) - local_1e38) + (double)local_1ce8._0_8_);
    dVar35 = local_1500;
    RVar10 = h_RT[4];
    RVar9 = h_RT[3];
    dVar53 = local_1de8[2];
    local_1738 = h_RT[2];
    RStack_1730 = h_RT[3];
    local_18b8._0_8_ = local_1f28[3];
    local_1a58._0_8_ = local_14e8;
    local_1728 = dStack_1458;
    local_738 = dStack_1438;
    local_1708 = (double)local_13a0._0_8_;
    local_728 = local_1388;
    local_1998 = local_1248;
    local_18f8 = dStack_1228;
    local_1a78 = local_1de8[7];
    dStack_1a70 = 0.0;
    dStack_1700 = dVar31;
    local_18b8._8_8_ = dVar70;
    dVar70 = exp(dVar49);
    dVar33 = local_1de8[0xd];
    dVar31 = local_1de8[1];
    dVar102 = local_1e68 - local_1d18;
    auVar36._0_8_ = exp((dStack_1bc0 + dVar102) - local_1848);
    uVar14 = auStack_15c0._8_8_;
    local_1798 = h_RT[0xd] + h_RT[1];
    dStack_1790 = RVar10 + RVar9;
    dVar70 = dVar70 * 80000000.0;
    dVar69 = dVar69 * 20000000.0;
    auVar36._8_8_ = dVar26;
    auVar107._8_8_ = dVar69;
    auVar107._0_8_ = dVar70;
    auVar108 = divpd(auVar107,auVar36);
    local_18c8 = dVar33 * dVar31;
    dStack_18c0 = local_6c8 * dVar123;
    local_18d8 = dVar53 * local_1a78;
    dStack_18d0 = dVar32 * local_1d28;
    dVar72 = -auVar108._0_8_;
    local_5f8 = dVar70 * local_18d8 - local_18c8 * auVar108._0_8_;
    dStack_5f0 = dVar69 * dStack_18d0 - dStack_18c0 * auVar108._8_8_;
    local_17e8 = local_1f28[1] + local_5f8;
    local_17c8 = dStack_1ec0 + local_5f8;
    dVar33 = dVar33 * dVar72;
    local_6b8 = (double)auStack_15c0._0_8_ + dVar33;
    dVar82 = local_1560 + dVar33;
    local_1a78 = local_1a78 * dVar70;
    local_678 = local_1510 + local_1a78;
    local_1a98 = local_14b0 + local_1a78;
    local_588 = dVar70 * dVar53;
    local_688 = local_11a0 + local_588;
    local_17f8 = local_1140 + local_588;
    dVar31 = dVar31 * dVar72;
    local_1a88 = local_d80 + dVar31;
    local_1828 = local_d20 + dVar31;
    local_608 = local_1590;
    local_5e8 = local_14e0;
    local_1680[0] = local_1198;
    local_5d8 = dStack_1170;
    local_5a8 = local_d78;
    local_5b8 = local_d50;
    local_17d8 = local_808[1];
    local_1758 = dStack_7a0;
    local_17a8 = local_1de8[8];
    uStack_17a0 = 0;
    _local_18e8 = auVar108;
    dStack_580 = dVar69;
    dVar115 = exp(dVar49);
    dVar34 = local_1de8[0xd];
    local_1aa8._8_8_ = 0;
    local_1aa8._0_8_ = local_1de8[1];
    dVar126 = exp((local_1bc8 + dVar102) - local_1848);
    RVar11 = h_RT[8];
    RVar10 = h_RT[2];
    RVar9 = h_RT[1];
    local_638 = h_RT[0xd];
    RStack_630 = h_RT[0xe];
    local_1748 = local_1588;
    local_17b8 = local_14d8;
    local_1788 = local_10f0;
    local_1778 = local_10e8;
    local_1ab0 = local_10b8;
    local_1768 = local_1090;
    local_1908 = local_d48;
    local_598 = local_1de8[2];
    RStack_590 = 0.0;
    local_5c8 = local_1de8[9];
    uStack_5c0 = 0;
    dVar83 = exp(dVar49);
    local_628 = local_1de8[1];
    uStack_620 = 0;
    local_618 = local_1de8[0xe];
    uStack_610 = 0;
    dVar54 = exp((local_1838 + dVar102) - local_1918);
    dVar67 = local_1de8[2];
    dVar55 = dVar47 * 1.5 + dVar28 * 4327.663325920592;
    local_18a8 = (double)local_1df8._0_8_ * 1.83 + dVar47 * -110.7076664770384;
    uStack_18a0 = local_1df8._8_8_;
    local_1a68 = dVar47 * 1.83 + dVar28 * 110.7076664770384;
    uStack_1a60 = 0;
    local_1988 = (double)local_1df8._0_8_ * 1.92 + dVar47 * -2863.302828428857;
    uStack_1980 = local_1df8._8_8_;
    local_1978 = dVar47 * 1.92 + dVar28 * 2863.302828428857;
    uStack_1970 = 0;
    dVar56 = local_1d18 - local_1868;
    local_1a28._0_8_ = (double)local_1df8._0_8_ * 1.62 + dVar47 * -5454.868657323165;
    local_1a28._8_8_ = local_1df8._8_8_;
    local_1a18 = dVar47 * 1.62 + dVar28 * 5454.868657323165;
    uStack_1a10 = 0;
    local_1888 = (double)local_1df8._0_8_ * 1.05 + dVar47 * -1648.034580510458;
    uStack_1880 = local_1df8._8_8_;
    local_1e18 = (undefined1  [8])(dVar47 * 1.05 + dVar28 * 1648.034580510458);
    uStack_1e10 = 0.0;
    local_16e8 = (double)local_1df8._0_8_ * 1.9 + dVar47 * -3789.2214935095417;
    uStack_16e0 = local_1df8._8_8_;
    local_16d8._0_8_ = dVar47 * 1.9 + dVar28 * 3789.2214935095417;
    local_16d8._8_8_ = 0;
    local_16c8._0_8_ = (double)local_1df8._0_8_ * 1.51 + dVar47 * -1726.0331637101897;
    local_16c8._8_8_ = local_1df8._8_8_;
    local_1948 = (double)local_1df8._0_8_ * 2.4 + dVar47 * 1061.7871648479593;
    uStack_1940 = local_1df8._8_8_;
    local_1a08 = dVar47 * -2727.4343286615826 + (double)local_1df8._0_8_ * 1.6;
    uStack_1a00 = 0;
    local_19c8 = dVar47 * -1570.0359973107265 + (double)local_1df8._0_8_ * 1.6;
    dStack_19c0 = 0.0;
    local_19f8 = dVar28 * 2727.4343286615826 + dVar47 * 1.6;
    dStack_19f0 = 0.0;
    local_1d08 = dVar28 * 1570.0359973107265 + dVar47 * 1.6;
    uStack_1d00 = 0;
    dVar90 = (double)local_1df8._0_8_ * 1.228;
    local_1cf8 = dVar47 * 1.228 + dVar28 * 35.225166606330404;
    uStack_1cf0 = 0;
    local_1ae8 = (double)local_1df8._0_8_ * 1.18 + dVar47 * 224.93784961470985;
    RStack_1ae0 = (Real)local_1df8._8_8_;
    local_1ac8 = dVar47 * 1.18 + dVar28 * -224.93784961470985;
    RStack_1ac0 = 0.0;
    local_1ad8 = (double)local_1df8._0_8_ * 2.12 + dVar47 * -437.79849925010643;
    RStack_1ad0 = (Real)local_1df8._8_8_;
    local_19b8 = dVar47 * 2.12 + dVar28 * 437.79849925010643;
    dStack_19b0 = 0.0;
    local_6f8 = dVar47 * -3638.256493768126 + local_1818;
    uStack_6f0 = 0;
    local_668 = dVar47 * -4161.601826205035 + local_1818;
    uStack_660 = 0;
    dVar87 = dVar28 * 3638.256493768126 + local_1e48;
    local_1818 = dVar28 * 4161.601826205035 + local_1e48;
    uStack_1810 = 0;
    dVar84 = local_1bc8 - dStack_1bc0;
    local_6d8 = (dVar84 + dVar48 + dVar27) - (dVar48 + dVar27);
    dStack_6d0 = dStack_1bc0;
    local_658 = (dVar84 + dVar50) - dVar50;
    dStack_650 = dStack_1bc0;
    dVar50 = local_1e68 - local_1e38;
    local_1718 = (local_1858 + (local_1c28 - local_1e68)) - local_1d38;
    uVar124 = local_1ce8._12_4_;
    dVar27 = local_1ce8._0_8_;
    dVar91 = local_1c28 - dVar27;
    local_1a48 = ((local_1d18 - local_1e68) + local_1c28) - local_1e38;
    uStack_1a40 = (ulong)dStack_1d10;
    local_1a38 = (dVar56 - local_1c28) + dVar27;
    uStack_1a30 = (ulong)dStack_1d10;
    local_1958 = (local_1d18 - (local_1e38 + local_1e38)) + dVar27;
    RStack_1950 = dStack_1d10;
    dVar48 = local_1e38 - local_1d18;
    local_718 = (local_1e38 + local_1e28) - (double)uVar8;
    local_1920 = ((local_1e38 + local_1e38) - local_1e68) - (double)uVar8;
    local_708 = ((local_1e38 - local_1c28) - (double)uVar8) + dVar27;
    dVar138 = dVar27 - local_1e38;
    dVar103 = local_1e38 - (double)uVar8;
    dVar29 = (dVar48 + local_1858) - local_1d38;
    local_1e48 = local_1838 + dVar138;
    local_1938 = (dVar138 + local_1858) - local_1d38;
    dVar26 = (dVar84 + local_1d38) - local_1d38;
    dVar116 = (local_1bc8 - local_1858) + local_1d38;
    local_248 = (double)local_1df8._0_8_ * 0.1 + dVar47 * -5334.096657530033;
    uStack_240 = local_1df8._8_8_;
    local_1868 = dVar47 * 0.1 + dVar28 * 5334.096657530033;
    uStack_1860 = 0;
    dVar88 = (dVar50 - local_1838) + local_648;
    dVar86 = local_1e68 - local_1838;
    local_1968 = (dVar56 - local_1838) + local_648;
    RStack_1960 = dStack_1d10;
    dVar117 = (local_1d18 - local_1e38) - local_1838;
    local_1878 = (dVar103 - dStack_1bc0) + local_1838;
    local_16a8 = (dVar103 - local_1bc8) + local_1838;
    local_19e8 = (dVar103 - local_1838) + local_648;
    local_1ce8._8_4_ = local_1ce8._8_4_;
    local_1ce8._0_8_ = ((dVar27 - local_1c28) + local_1838) - local_648;
    local_1ce8._12_4_ = uVar124;
    local_1698 = (dStack_1bc0 + local_1e28) - local_1838;
    dVar89 = (dStack_1bc0 - local_1d18) + local_1838;
    local_6e8 = local_1838 * -2.0 + dStack_1bc0 + local_648;
    local_1e28 = (local_1e28 + local_1bc8) - local_1838;
    dVar105 = (local_1bc8 - local_1d18) + local_1838;
    local_578 = local_1838 * -2.0 + local_1bc8 + local_648;
    local_1d28 = (local_1c28 - local_1e68) + local_1838;
    dVar106 = (local_1c28 - local_1e38) + local_1838;
    local_1838 = local_1838 - local_648;
    dVar32 = dVar32 * dVar69;
    local_14e8 = (double)local_1a58._0_8_ - dVar32;
    local_1500 = dVar32 + dVar35;
    dStack_14f8 = dVar32 + dVar52;
    auVar93._8_8_ = dVar54;
    auVar93._0_8_ = dVar126;
    auVar37._0_8_ = dVar115 * 15000000.0;
    auVar37._8_8_ = dVar83 * 84300000.0;
    auVar132 = divpd(auVar37,auVar93);
    dVar54 = (double)local_1aa8._0_8_ * dVar34;
    dVar104 = local_618 * local_628;
    dVar126 = dVar28 * 1781.3869969487089 + dVar111;
    local_1a58._0_8_ = dVar28 * 319.54258278599724 + dVar111;
    local_1a58._8_8_ = 0;
    dVar83 = dVar28 * -251.60833290236002 + dVar111;
    local_1e68 = dVar28 * 301.929999482832 + dVar111;
    dStack_1e60 = 0.0;
    dVar112 = dVar28 * -286.8334995086904 + dVar111;
    local_648 = dVar28 * 14492.639975175936 + dVar111;
    dStack_640 = 0.0;
    dVar92 = local_1e58 + dVar111;
    dStack_1e50 = dVar28 * 4498.756992294197 + dVar111;
    dVar35 = auVar132._0_8_;
    dVar115 = auVar132._8_8_;
    local_638 = (dVar92 - ((RVar9 + local_638) - (RVar10 + RVar11)) * dVar47) * dVar35 * dVar54;
    RStack_630 = (dVar92 - ((h_RT[0xe] + h_RT[1]) - (h_RT[9] + h_RT[2])) * dVar47) * dVar115 *
                 dVar104;
    local_618 = local_618 * -dVar115;
    dVar52 = -dVar115 * local_628;
    dVar27 = dVar69 * dVar53;
    local_1248 = local_1998 - dVar27;
    local_628 = local_cd0;
    dStack_1228 = local_18f8 - dVar27;
    local_1240 = dVar27 + local_1240;
    dStack_1238 = dVar27 + dStack_1238;
    local_1f28[3] = dStack_5f0 + (double)local_18b8._0_8_;
    local_1f28[4] = dStack_5f0 + (double)local_18b8._8_8_;
    uStack_384 = (undefined4)((ulong)dVar72 >> 0x20);
    uStack_380 = auVar108._8_4_;
    local_6c8 = local_6c8 * (double)CONCAT44(uStack_384,uStack_380);
    dVar27 = local_1728 - local_6c8;
    dStack_1438 = local_738 - local_6c8;
    local_1450 = local_6c8 + local_1450;
    dStack_1448 = local_6c8 + dStack_1448;
    dVar123 = dVar123 * (double)CONCAT44(uStack_384,uStack_380);
    dStack_13a8 = local_16f8 - dVar123;
    local_1388 = local_728 - dVar123;
    local_13a0._0_8_ = dVar123 + local_1708;
    local_13a0._8_8_ = dVar123 + dStack_1700;
    local_1f28[6] = local_1f28[6] - dStack_5f0;
    auStack_1ef0 = (undefined1  [8])((double)auStack_1ef0 - local_5f8);
    local_1590 = local_608 - dVar33;
    local_14e0 = local_5e8 - local_1a78;
    local_11a0 = local_688;
    local_1198 = local_1680[0] - local_588;
    dStack_1170 = local_5d8 - local_588;
    local_1140 = local_17f8;
    local_d50 = local_5b8 - dVar31;
    dVar70 = dVar70 * dVar92 * local_18d8 -
             (dVar92 - (local_1798 - (h_RT[7] + local_1738)) * dVar47) * (double)local_18e8 *
             local_18c8;
    dVar69 = dVar69 * dVar92 * dStack_18d0 -
             (dVar92 - (dStack_1790 - (h_RT[6] + local_1738)) * dVar47) * uStack_18e0 * dStack_18c0;
    local_808[4] = dVar69 + dVar68;
    local_808[3] = local_808[3] + dVar69;
    dVar68 = auVar37._8_8_ * local_5c8;
    dStack_1ec0 = auVar37._0_8_ * dVar53 * local_17a8 - dVar54 * dVar35;
    dVar72 = auVar37._8_8_ * local_5c8 * local_598 - dVar104 * dVar115;
    local_808[6] = local_808[6] - dVar69;
    local_808[7] = local_808[7] - dVar70;
    dVar123 = local_17a8 * auVar37._0_8_;
    dStack_1508 = ((dVar85 - dVar32) - local_1a78) - dVar123;
    local_14d8 = local_17b8 - dVar123;
    local_14b0 = dVar123 + local_1a98;
    local_1090 = local_598 * auVar37._0_8_;
    local_10f0 = local_1788 + local_1090;
    local_10e8 = local_1778 - local_1090;
    local_10b8 = local_1ab0 - local_1090;
    local_1090 = local_1090 + local_1768;
    dVar34 = dVar34 * -dVar35;
    local_1588 = local_1748 - dVar34;
    local_1560 = dVar34 + dVar82;
    local_1aa8._0_8_ = -dVar35 * (double)local_1aa8._0_8_;
    local_d80 = local_1a88 + (double)local_1aa8._0_8_;
    local_d78 = (local_5a8 - dVar31) - (double)local_1aa8._0_8_;
    local_d48 = local_1908 - (double)local_1aa8._0_8_;
    local_d20 = (double)local_1aa8._0_8_ + local_1828;
    local_1f28[1] = local_17e8 + dStack_1ec0 + dVar72;
    local_1f28[2] = (((local_1898 - dStack_5f0) - local_5f8) - dStack_1ec0) - dVar72;
    local_1ee8 = local_1ee8 - dStack_1ec0;
    dStack_1ee0 = dStack_1ee0 - dVar72;
    dStack_1ec0 = local_17c8 + dStack_1ec0;
    local_1eb8 = local_1eb8 + dVar72;
    auStack_15c0._0_8_ = local_6b8 + dVar34 + local_618;
    auStack_15c0._8_8_ = (((double)uVar14 - dVar33) - dVar34) - local_618;
    local_1558 = local_1558 + local_618;
    dStack_1580 = dStack_1580 - local_618;
    local_1510 = local_678 + dVar123 + dVar68;
    local_14a8 = local_14a8 + dVar68;
    local_1998 = dStack_1508 - dVar68;
    dVar68 = local_14d0 - dVar68;
    dVar31 = auVar37._8_8_ * local_1de8[2];
    local_1040 = local_1040 + dVar31;
    local_1038 = local_1038 - dVar31;
    dStack_fd8 = dStack_fd8 + dVar31;
    local_1000 = local_1000 - dVar31;
    dStack_7a0 = auVar37._0_8_ * dVar92 * dVar53 * local_17a8 - local_638;
    dVar31 = auVar37._8_8_ * dVar92 * local_5c8 * local_598 - RStack_630;
    local_cd0 = local_cd0 + dVar52;
    local_cc8 = local_cc8 - dVar52;
    local_c68 = local_c68 + dVar52;
    local_c90 = local_c90 - dVar52;
    local_808[1] = local_17d8 + dVar70 + dStack_7a0 + dVar31;
    local_808[2] = (((local_16b8 - dVar69) - dVar70) - dStack_7a0) - dVar31;
    local_808[8] = local_808[8] - dStack_7a0;
    local_808[9] = local_808[9] - dVar31;
    dStack_7a0 = dVar70 + local_1758 + dStack_7a0;
    dStack_798 = dStack_798 + dVar31;
    local_1680[0] = (dVar50 - local_1858) + local_1848;
    dVar33 = (dVar102 - local_1d38) + local_1848;
    local_1748 = dVar47 * -1781.3869969487089 + dVar81;
    RStack_1740 = 0.0;
    local_1908 = (dVar50 - local_1848) + local_1918;
    local_18f8 = (dVar86 - local_1848) + local_698;
    dVar82 = (dVar86 - local_1918) + local_748;
    dVar72 = (dVar50 - local_748) + local_758;
    local_18e8 = (undefined1  [8])(dVar47 * -24053.756625465616 + dVar81);
    uStack_18e0 = 0.0;
    local_18d8 = dVar47 * -20128.6666321888 + dVar81;
    dStack_18d0 = 0.0;
    local_18c8 = (dVar91 - local_1848) + local_1918;
    local_1738 = dVar47 * -7252.86180424343 + dVar81;
    RStack_1730 = 0.0;
    local_18b8._0_8_ = dVar28 * 537.435399079441;
    local_18b8._8_8_ = dVar28 * 7252.86180424343;
    local_1728 = dVar47 * -537.435399079441 + dVar81;
    uStack_1720 = 0;
    local_738 = dVar47 * -319.54258278599724 + dVar81;
    uStack_730 = 0;
    local_728 = (dVar56 - local_1858) + local_1848;
    uStack_720 = (ulong)dStack_1d10;
    local_1708 = (dVar56 - local_1848) + local_1918;
    dStack_1700 = dStack_1d10;
    dVar120 = (dVar56 - local_748) + local_758;
    local_16f8 = dVar28 * 1726.0331637101897;
    dStack_16f0 = dVar28 * -1061.7871648479593;
    local_1898 = dVar47 * 251.60833290236002 + dVar81;
    uStack_1890 = 0;
    dVar128 = (dStack_1bc0 + dVar48) - local_1918;
    dVar129 = (local_1bc8 + dVar48) - local_1918;
    local_16b8 = (dVar103 - local_1858) + local_1848;
    dVar135 = (dVar103 - local_1848) + local_1918;
    dVar130 = (dVar103 - local_748) + local_758;
    local_1e08 = (dStack_1bc0 + dVar138) - local_1918;
    local_1e48 = local_1e48 - dVar30;
    local_1aa8._8_8_ = 0;
    local_1aa8._0_8_ = dVar47 * -11875.913312991392 + dVar81;
    local_1a88 = dVar28 * 11875.913312991392;
    dStack_1a80 = dVar28 * 754.82499870708;
    local_1a98 = dVar47 * -754.82499870708 + dVar81;
    dStack_1a90 = 0.0;
    local_1d38 = (dStack_1bc0 + (local_1c28 - local_1e38)) - local_1848;
    dVar89 = dVar89 - local_698;
    dVar85 = dVar47 * -301.929999482832 + dVar81;
    local_1e78 = (undefined1  [8])
                 ((((local_1c28 - local_1d18) - local_1e38) + local_1bc8) - local_1858);
    dVar102 = ((local_1c28 - (double)uVar8) + local_1bc8) - local_1858;
    dVar104 = dVar47 * 286.8334995086904 + dVar81;
    dVar105 = dVar105 - local_698;
    local_1e38 = (local_1858 + dVar84) - local_1858;
    dVar116 = dVar116 - local_1918;
    local_1828 = dVar47 * -14492.639975175936 + dVar81;
    uStack_1820 = 0;
    local_1d28 = local_1d28 - dVar30;
    local_6c8 = dVar47 * -4498.756992294197 + dVar81;
    uStack_6c0 = 0;
    local_1d18 = dVar106 - local_1918;
    dVar86 = (dVar127 + dVar51) - local_748;
    local_6b8 = (local_1838 - local_1858) + local_1848;
    local_618 = local_1de8[10];
    uStack_610 = 0;
    local_1e58 = dVar92;
    local_1a78 = dVar28;
    dStack_1a70 = dVar28;
    dStack_1458 = dVar27;
    local_19d8._0_8_ = dVar29;
    local_638 = exp(dVar71 + dVar47 * -4327.663325920592);
    dVar31 = local_1de8[9];
    dVar27 = local_1de8[4];
    local_628 = exp(dVar88);
    RVar9 = h_RT[10];
    dVar123 = local_1de8[0xd];
    dVar48 = local_1de8[2];
    local_608 = h_RT[2];
    RStack_600 = h_RT[3];
    local_5e8 = h_RT[4];
    RStack_5e0 = h_RT[5];
    local_5f8 = h_RT[9];
    dStack_5f0 = h_RT[10];
    local_17e8 = local_1f28[2];
    local_17d8 = local_1f28[4];
    local_17c8 = dStack_1ee0;
    local_5d8 = dStack_14f8;
    local_5a8 = local_14c8;
    local_17b8 = dStack_13a8;
    local_17a8 = (double)local_13a0._8_8_;
    local_1798 = local_1370;
    local_1788 = local_1368;
    local_1778 = local_1038;
    local_1ab0 = local_1028;
    local_1768 = local_1000;
    local_1758 = local_ff8;
    local_5c8 = dStack_f88;
    local_5b8 = local_f78;
    local_598 = local_f50;
    local_588 = local_f48;
    local_688 = local_808[2];
    local_678 = local_808[4];
    local_17f8 = local_808[9];
    dVar34 = exp(dVar49);
    dVar53 = local_1de8[0xb];
    dVar29 = local_1de8[4];
    dVar35 = exp(local_1680[0]);
    dVar32 = local_1de8[0xd];
    auVar94._8_8_ = dVar35;
    auVar94._0_8_ = local_628;
    dVar127 = local_638 * 1020.0;
    dVar34 = dVar34 * 30000000.0;
    auVar57._8_8_ = dVar34;
    auVar57._0_8_ = dVar127;
    auVar132 = divpd(auVar57,auVar94);
    dVar35 = dVar27 * dVar31;
    dVar50 = dVar53 * dVar29;
    dVar115 = dVar127 * local_618;
    dVar71 = dVar123 * dVar48;
    dVar69 = local_608 + RVar9;
    dVar70 = local_5e8 + local_5f8;
    dVar51 = auVar132._0_8_;
    dVar52 = auVar132._8_8_;
    dVar53 = dVar53 * -dVar52;
    dVar29 = dVar29 * -dVar52;
    dStack_1508 = local_1998 - dVar115;
    local_608 = dStack_ed8;
    local_5f8 = local_e80;
    local_1998 = local_d78;
    local_5e8 = local_d68;
    local_1680[0] = local_d30;
    local_14d0 = dVar68 + dVar115;
    local_14c8 = local_5a8 - dVar115;
    dVar48 = dVar48 * dVar127;
    dStack_f88 = local_5c8 - dVar48;
    local_f78 = local_5b8 + dVar48;
    local_f50 = local_598 + dVar48;
    local_f48 = local_588 - dVar48;
    dVar68 = dVar55 * dVar127 * dVar67 * local_618 -
             (dVar55 - (dVar70 - dVar69) * dVar47) * dVar51 * dVar35;
    dVar69 = local_1e58 * dVar34 * dVar71 -
             (local_1e58 - ((h_RT[0xb] + h_RT[4]) - (h_RT[0xd] + h_RT[2])) * dVar47) * dVar52 *
             dVar50;
    local_808[9] = local_17f8 + dVar68;
    dVar48 = dVar67 * local_618 * dVar127 - dVar35 * dVar51;
    dVar67 = dVar71 * dVar34 - dVar50 * dVar52;
    dStack_1ee0 = local_17c8 + dVar48;
    dVar31 = dVar31 * -dVar51;
    local_1370 = local_1798 + dVar31;
    local_1368 = local_1788 - dVar31;
    dVar27 = -dVar51 * dVar27;
    local_1038 = local_1778 - dVar27;
    local_1028 = local_1ab0 + dVar27;
    local_1000 = local_1768 + dVar27;
    local_ff8 = local_1758 - dVar27;
    local_1f28[2] = (local_17e8 - dVar48) - dVar67;
    local_1f28[4] = local_17d8 + dVar48 + dVar67;
    local_1ed8 = (undefined1  [8])((double)local_1ed8 - dVar48);
    dStack_1ed0 = dVar67 + dStack_1ed0;
    dStack_1ec0 = dStack_1ec0 - dVar67;
    dVar123 = dVar123 * dVar34;
    dStack_1508 = dStack_1508 - dVar123;
    local_14c0 = local_14c0 + dVar123;
    local_14b0 = local_14b0 - dVar123;
    dStack_14f8 = dVar123 + local_5d8 + dVar115;
    dStack_13a8 = (local_17b8 - dVar31) - dVar53;
    local_1360 = local_1360 + dVar53;
    local_1350 = local_1350 - dVar53;
    local_13a0._8_8_ = dVar53 + local_17a8 + dVar31;
    dStack_ed8 = dStack_ed8 - dVar29;
    local_ec8 = local_ec8 + dVar29;
    dStack_e90 = dStack_e90 + dVar29;
    local_e80 = local_e80 - dVar29;
    dVar34 = dVar34 * local_1de8[2];
    local_d78 = local_d78 - dVar34;
    local_d68 = local_d68 + dVar34;
    local_d30 = local_d30 + dVar34;
    local_d20 = local_d20 - dVar34;
    local_808[2] = (local_688 - dVar68) - dVar69;
    local_808[4] = local_678 + dVar68 + dVar69;
    local_7b8._0_8_ = (double)local_7b8._0_8_ - dVar68;
    local_7b8._8_8_ = dVar69 + (double)local_7b8._8_8_;
    dStack_7a0 = dStack_7a0 - dVar69;
    dVar34 = local_1de8[2] * local_1de8[0xd];
    dVar31 = exp(dVar49);
    dVar48 = local_1de8[0xc];
    dVar27 = local_1de8[1];
    dVar31 = dVar31 * 30000000.0;
    dVar53 = local_1de8[1] * local_1de8[0xc];
    dVar67 = exp(dVar33);
    dVar29 = local_1de8[0xe];
    dVar67 = dVar31 / dVar67;
    dVar123 = dVar31 * dVar34 - dVar53 * dVar67;
    dVar53 = local_1e58 * dVar31 * dVar34 -
             (local_1e58 - ((h_RT[1] + h_RT[0xc]) - (h_RT[2] + h_RT[0xd])) * dVar47) * dVar67 *
             dVar53;
    local_1f28[1] = local_1f28[1] + dVar123;
    local_1f28[2] = local_1f28[2] - dVar123;
    dStack_1ec0 = dStack_1ec0 - dVar123;
    local_1ec8 = dVar123 + local_1ec8;
    dVar48 = dVar48 * -dVar67;
    auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ + dVar48;
    auStack_15c0._8_8_ = (double)auStack_15c0._8_8_ - dVar48;
    local_1568 = local_1568 + dVar48;
    local_1560 = local_1560 - dVar48;
    dVar32 = dVar32 * dVar31;
    local_1510 = local_1510 + dVar32;
    dVar35 = dStack_1508 - dVar32;
    local_14b8 = local_14b8 + dVar32;
    dVar32 = local_14b0 - dVar32;
    dVar27 = -dVar67 * dVar27;
    local_e30 = local_e30 + dVar27;
    dStack_e28 = dStack_e28 - dVar27;
    local_dd8 = local_dd8 + dVar27;
    local_dd0 = local_dd0 - dVar27;
    dVar31 = dVar31 * local_1de8[2];
    local_d80 = local_d80 + dVar31;
    dVar34 = local_d78 - dVar31;
    local_d28 = local_d28 + dVar31;
    dVar31 = local_d20 - dVar31;
    local_808[1] = local_808[1] + dVar53;
    local_808[2] = local_808[2] - dVar53;
    local_7a8 = local_7a8 + dVar53;
    dStack_7a0 = dStack_7a0 - dVar53;
    dVar50 = local_1de8[2] * local_1de8[0xe];
    dVar67 = exp(local_1748);
    dVar48 = local_1de8[0xd];
    dVar27 = local_1de8[4];
    dVar67 = dVar67 * 39000000.0;
    dVar123 = local_1de8[4] * local_1de8[0xd];
    dVar33 = exp(local_1908);
    dVar53 = local_1de8[2];
    dVar33 = dVar67 / dVar33;
    dVar51 = dVar67 * dVar50 - dVar123 * dVar33;
    dVar123 = dVar126 * dVar67 * dVar50 -
              (dVar126 - ((h_RT[4] + h_RT[0xd]) - (h_RT[2] + h_RT[0xe])) * dVar47) * dVar33 *
              dVar123;
    local_1f28[2] = local_1f28[2] - dVar51;
    local_1f28[4] = local_1f28[4] + dVar51;
    local_1eb8 = local_1eb8 - dVar51;
    dStack_1ec0 = dVar51 + dStack_1ec0;
    dVar29 = dVar29 * dVar67;
    dStack_1508 = dVar35 - dVar29;
    dStack_14f8 = dStack_14f8 + dVar29;
    local_14b0 = dVar32 + dVar29;
    local_14a8 = local_14a8 - dVar29;
    dVar48 = dVar48 * -dVar33;
    dStack_13a8 = dStack_13a8 - dVar48;
    local_13a0._8_8_ = (double)local_13a0._8_8_ + dVar48;
    local_1350 = local_1350 + dVar48;
    local_1348 = local_1348 - dVar48;
    dVar27 = -dVar33 * dVar27;
    local_d78 = dVar34 - dVar27;
    local_d68 = local_d68 + dVar27;
    local_d20 = dVar31 + dVar27;
    local_d18 = local_d18 - dVar27;
    dVar67 = dVar67 * local_1de8[2];
    local_cc8 = local_cc8 - dVar67;
    local_cb8 = local_cb8 + dVar67;
    local_c70 = local_c70 + dVar67;
    local_c68 = local_c68 - dVar67;
    local_808[2] = local_808[2] - dVar123;
    local_808[4] = local_808[4] + dVar123;
    dStack_7a0 = dStack_7a0 + dVar123;
    dStack_798 = dStack_798 - dVar123;
    local_588 = local_1de8[0x10];
    dStack_580 = 0.0;
    dVar51 = exp(local_18a8);
    dVar32 = local_1de8[0xd];
    dVar27 = local_1de8[9];
    local_5c8 = exp(local_18f8);
    dVar50 = dStack_1508;
    dVar29 = local_1de8[0x11];
    dVar67 = local_1de8[2];
    dVar31 = dStack_1ee0;
    local_5a8 = h_RT[2];
    RStack_5a0 = h_RT[3];
    local_5b8 = h_RT[0x10];
    RStack_5b0 = h_RT[0x11];
    local_688 = h_RT[9];
    RStack_680 = h_RT[10];
    local_598 = h_RT[0xd];
    RStack_590 = h_RT[0xe];
    local_18a8 = local_1f28[2];
    local_17c8 = local_14d0;
    local_17b8 = local_14b0;
    local_17a8 = local_1498;
    local_1778 = local_1038;
    local_1ab0 = local_1000;
    local_1768 = local_fe0;
    local_1758 = local_fc8;
    local_1998 = local_d78;
    local_1748 = local_d40;
    local_1908 = local_d20;
    local_18f8 = local_d08;
    local_678 = local_b68;
    local_17f8 = dStack_b30;
    local_17e8 = local_b10;
    local_17d8 = local_af8;
    local_1798 = local_808[2];
    local_1788 = local_808[9];
    local_5d8 = exp(dVar49);
    dVar33 = local_1de8[0xe];
    dVar123 = local_1de8[9];
    dVar48 = exp(dVar82);
    dVar35 = local_1a68;
    dVar34 = local_1de8[0x12];
    auVar95._8_8_ = dVar48;
    auVar95._0_8_ = local_5c8;
    dVar51 = dVar51 * (double)0x4033333333333333;
    dVar52 = local_5d8 * 132000000.0;
    auVar73._8_8_ = dVar52;
    auVar73._0_8_ = dVar51;
    auVar132 = divpd(auVar73,auVar95);
    dVar71 = dVar27 * dVar32;
    dVar82 = dVar33 * dVar123;
    dVar68 = dVar51 * local_588;
    dVar115 = dVar29 * dVar67;
    dVar48 = local_1a68 - ((local_688 + local_598) - (local_5a8 + local_5b8)) * dVar47;
    dVar69 = auVar132._0_8_;
    dVar70 = auVar132._8_8_;
    dVar33 = dVar33 * -dVar70;
    dVar123 = dVar123 * -dVar70;
    local_1a68 = local_c50;
    local_14b0 = local_17b8 + dVar68;
    local_1498 = local_17a8 - dVar68;
    dVar67 = dVar67 * dVar51;
    local_b68 = local_678 - dVar67;
    dStack_b30 = local_17f8 + dVar67;
    local_b10 = local_17e8 + dVar67;
    local_af8 = local_17d8 - dVar67;
    dVar48 = dVar35 * dVar51 * dVar53 * local_588 - dVar48 * dVar69 * dVar71;
    dVar67 = local_1e58 * dVar52 * dVar115 -
             (local_1e58 - ((h_RT[0xe] + h_RT[9]) - (h_RT[0x11] + h_RT[2])) * dVar47) * dVar70 *
             dVar82;
    dVar53 = dVar53 * local_588 * dVar51 - dVar71 * dVar69;
    dVar35 = dVar115 * dVar52 - dVar82 * dVar70;
    dVar32 = dVar32 * -dVar69;
    local_fe0 = local_1768 + dVar32;
    local_fc8 = local_1758 - dVar32;
    dVar27 = -dVar69 * dVar27;
    local_d78 = local_1998 - dVar27;
    local_d40 = local_1748 + dVar27;
    local_d20 = local_1908 + dVar27;
    local_d08 = local_18f8 - dVar27;
    local_1f28[2] = (local_18a8 - dVar53) - dVar35;
    dStack_1ee0 = dVar35 + dVar31 + dVar53;
    dStack_1ec0 = dStack_1ec0 + dVar53;
    local_1eb8 = local_1eb8 + dVar35;
    local_1ea8 = local_1ea8 - dVar53;
    dStack_1ea0 = dStack_1ea0 - dVar35;
    dVar29 = dVar29 * dVar52;
    dStack_1508 = (dVar50 - dVar68) - dVar29;
    local_14a8 = local_14a8 + dVar29;
    local_1490 = local_1490 - dVar29;
    local_14d0 = dVar29 + local_17c8 + dVar68;
    local_1038 = (local_1778 - dVar32) - dVar33;
    dStack_fd8 = dStack_fd8 + dVar33;
    local_fc0 = local_fc0 - dVar33;
    local_1000 = dVar33 + local_1ab0 + dVar32;
    local_cc8 = local_cc8 - dVar123;
    local_c90 = local_c90 + dVar123;
    local_c68 = local_c68 + dVar123;
    local_c50 = local_c50 - dVar123;
    dVar52 = dVar52 * local_1de8[2];
    local_a80 = local_a80 + dVar52;
    local_a58 = local_a58 + dVar52;
    dVar32 = local_ab8 - dVar52;
    dVar52 = local_a40 - dVar52;
    local_808[2] = (local_1798 - dVar48) - dVar67;
    local_808[9] = local_1788 + dVar48 + dVar67;
    dStack_7a0 = dStack_7a0 + dVar48;
    dStack_798 = dStack_798 + dVar67;
    dStack_788 = dStack_788 - dVar48;
    dStack_780 = dStack_780 - dVar67;
    dVar35 = local_1de8[2] * local_1de8[0x12];
    dVar29 = exp(local_1988);
    dVar48 = local_1de8[0x11];
    dVar27 = local_1de8[4];
    dVar29 = dVar29 * 89.8;
    dVar67 = local_1de8[4] * local_1de8[0x11];
    dVar123 = exp(dVar72);
    dVar53 = local_1de8[3];
    dVar31 = local_1de8[2];
    dVar123 = dVar29 / dVar123;
    dVar33 = dVar29 * dVar35 - dVar67 * dVar123;
    local_1f28[2] = local_1f28[2] - dVar33;
    local_1f28[4] = local_1f28[4] + dVar33;
    local_1e98 = local_1e98 - dVar33;
    dStack_1ea0 = dVar33 + dStack_1ea0;
    dVar67 = local_1978 * dVar29 * dVar35 -
             (local_1978 - ((h_RT[4] + h_RT[0x11]) - (h_RT[2] + h_RT[0x12])) * dVar47) * dVar123 *
             dVar67;
    dVar34 = dVar34 * dVar29;
    dStack_1508 = dStack_1508 - dVar34;
    dStack_14f8 = dStack_14f8 + dVar34;
    local_1490 = local_1490 + dVar34;
    local_1488 = local_1488 - dVar34;
    dVar48 = dVar48 * -dVar123;
    dStack_13a8 = dStack_13a8 - dVar48;
    local_13a0._8_8_ = (double)local_13a0._8_8_ + dVar48;
    local_1330 = local_1330 + dVar48;
    local_1328 = local_1328 - dVar48;
    dVar27 = -dVar123 * dVar27;
    local_ab8 = dVar32 - dVar27;
    local_aa8 = local_aa8 + dVar27;
    local_a40 = dVar52 + dVar27;
    local_a38 = local_a38 - dVar27;
    dVar29 = dVar29 * local_1de8[2];
    dStack_a08 = dStack_a08 - dVar29;
    local_9f8 = local_9f8 + dVar29;
    local_990 = local_990 + dVar29;
    local_988 = local_988 - dVar29;
    local_808[2] = local_808[2] - dVar67;
    local_808[4] = local_808[4] + dVar67;
    dStack_780 = dStack_780 + dVar67;
    local_778 = local_778 - dVar67;
    local_17a8 = local_1de8[0xb];
    uStack_17a0 = 0;
    local_17c8 = exp((double)local_18e8);
    local_17d8 = exp(local_1718);
    dVar68 = local_dd8;
    dVar52 = local_de0;
    dVar50 = local_e20;
    dVar35 = dStack_e28;
    dVar34 = local_1450;
    dVar33 = local_14b8;
    dVar32 = local_14c0;
    dVar123 = local_1500;
    dVar67 = dStack_1508;
    dVar29 = local_1de8[0xe];
    local_1798 = h_RT[3];
    dStack_1790 = h_RT[4];
    local_17b8 = h_RT[0xb];
    RStack_17b0 = h_RT[0xc];
    local_1788 = h_RT[2];
    RStack_1780 = h_RT[3];
    local_1718 = local_1f28[2];
    local_1988 = local_1f28[3];
    local_1978 = dStack_1ed0;
    local_1778 = dStack_1458;
    local_1ab0 = local_1410;
    local_1768 = local_1408;
    local_1758 = dStack_ed8;
    local_1998 = local_ed0;
    local_1748 = dStack_e90;
    local_1908 = dStack_e88;
    local_18f8 = local_808[2];
    local_18e8 = (undefined1  [8])local_808[3];
    local_18a8 = (double)local_7b8._8_8_;
    local_1a68 = local_1de8[2];
    local_17e8 = local_1de8[3];
    uStack_17e0 = 0;
    local_17f8 = exp(local_18d8);
    local_18d8 = local_1de8[6];
    dStack_18d0 = 0.0;
    dVar27 = exp(local_18c8);
    dVar51 = local_1de8[3];
    auVar58._8_8_ = dVar27;
    auVar58._0_8_ = local_17d8;
    dVar55 = local_17c8 * 2500000.0;
    dVar56 = local_17f8 * 100000000.0;
    auVar96._8_8_ = dVar56;
    auVar96._0_8_ = dVar55;
    auVar132 = divpd(auVar96,auVar58);
    dVar84 = dVar55 * local_17a8;
    dVar88 = dVar53 * local_17a8;
    dVar103 = dVar29 * local_17e8;
    dVar27 = local_1798 + local_17b8;
    dVar70 = local_18d8 * local_1de8[0xd];
    dVar127 = auVar132._0_8_;
    dVar54 = auVar132._8_8_;
    dVar115 = dVar55 * dVar88 - dVar31 * local_1de8[0xc] * dVar127;
    dVar126 = dVar56 * dVar103 - dVar70 * dVar54;
    dVar69 = local_1788 + h_RT[0xc];
    dVar71 = dVar28 * 24053.756625465616 + dVar111;
    dVar82 = dVar28 * 20128.6666321888 + dVar111;
    dVar48 = -dVar54 * local_18d8;
    dVar29 = dVar29 * dVar56;
    dVar72 = dVar56 * local_17e8;
    dStack_1458 = local_1778 + dVar84;
    local_17f8 = local_1240;
    local_17c8 = local_11e8;
    local_17b8 = local_d70;
    local_1788 = local_d18;
    local_1778 = local_cc0;
    local_18d8 = local_c68;
    local_17e8 = local_d58;
    local_17d8 = local_d20;
    local_17a8 = local_ca8;
    local_1798 = local_c70;
    local_1410 = local_1ab0 - dVar84;
    local_1408 = dVar84 + local_1768;
    dVar53 = dVar53 * dVar55;
    dStack_ed8 = local_1758 + dVar53;
    local_ed0 = local_1998 - dVar53;
    dStack_e90 = local_1748 - dVar53;
    dStack_e88 = dVar53 + local_1908;
    dVar27 = dVar55 * dVar71 * dVar88 -
             (dVar71 - (dVar69 - dVar27) * dVar47) * dVar127 * dVar31 * local_1de8[0xc];
    dVar31 = dVar56 * dVar82 * dVar103 -
             (dVar82 - ((h_RT[6] + h_RT[0xd]) - (h_RT[0xe] + h_RT[3])) * dVar47) * dVar54 * dVar70;
    local_808[2] = local_18f8 + dVar27;
    local_7b8._8_8_ = local_18a8 - dVar27;
    local_1f28[2] = local_1718 + dVar115;
    dStack_1ed0 = local_1978 - dVar115;
    local_14b8 = local_1de8[0xc] * -dVar127;
    dVar53 = local_1de8[0xd] * -dVar54;
    dStack_1508 = dVar67 + local_14b8;
    local_1500 = dVar123 - local_14b8;
    local_14c0 = dVar32 - local_14b8;
    local_14b8 = local_14b8 + dVar33;
    local_dd8 = -dVar127 * local_1a68;
    dStack_e28 = dVar35 + local_dd8;
    local_e20 = dVar50 - local_dd8;
    local_de0 = dVar52 - local_dd8;
    local_dd8 = local_dd8 + dVar68;
    local_1f28[3] = (local_1988 - dVar115) - dVar126;
    local_1f28[6] = local_1f28[6] + dVar126;
    local_1ec8 = dVar115 + local_1ec8;
    dStack_1ec0 = dVar126 + dStack_1ec0;
    local_1eb8 = local_1eb8 - dVar126;
    local_1450 = (dVar34 - dVar84) - dVar29;
    dStack_1438 = dStack_1438 + dVar29;
    local_1400 = local_1400 + dVar29;
    local_13f8 = local_13f8 - dVar29;
    local_1240 = local_1240 - dVar53;
    dStack_1228 = dStack_1228 + dVar53;
    local_11f0 = local_11f0 + dVar53;
    local_11e8 = local_11e8 - dVar53;
    local_d70 = local_d70 - dVar48;
    local_d58 = local_d58 + dVar48;
    local_d20 = local_d20 + dVar48;
    local_d18 = local_d18 - dVar48;
    local_cc0 = local_cc0 - dVar72;
    local_ca8 = local_ca8 + dVar72;
    local_c70 = local_c70 + dVar72;
    local_c68 = local_c68 - dVar72;
    local_808[3] = ((double)local_18e8 - dVar27) - dVar31;
    local_808[6] = local_808[6] + dVar31;
    local_7a8 = dVar27 + local_7a8;
    dStack_7a0 = dVar31 + dStack_7a0;
    dStack_798 = dStack_798 - dVar31;
    local_18c8 = local_1de8[1];
    dStack_18c0 = 0.0;
    dVar67 = exp(local_1738);
    dVar52 = local_1de8[4];
    local_1a48 = exp(local_1a48);
    dVar72 = local_808[3];
    dVar71 = local_808[2];
    dVar70 = local_808[1];
    RVar9 = h_RT[4];
    dVar68 = local_1de8[6];
    dVar35 = local_1de8[1];
    dVar33 = local_1f28[3];
    dVar32 = local_1f28[2];
    dVar123 = local_1f28[1];
    local_1988 = h_RT[1];
    uStack_1980 = 0;
    local_1a68 = h_RT[3];
    uStack_1a60 = 0;
    local_1978 = exp(local_1728);
    dVar34 = local_1de8[0];
    auVar38._0_8_ = exp(local_1a38);
    dVar69 = local_1de8[6];
    dVar50 = local_1de8[1];
    dVar115 = local_1988 + local_1a68;
    auVar38._8_8_ = local_1a48;
    dVar48 = local_1978 * 28000000.0;
    dVar67 = dVar67 * 83000000.0;
    auVar136._8_8_ = dVar67;
    auVar136._0_8_ = dVar48;
    auVar132 = divpd(auVar136,auVar38);
    dVar53 = local_1de8[3] * dVar34;
    dVar126 = local_1de8[2] * dVar52;
    dVar55 = dVar35 * dVar68;
    dVar56 = dVar51 * local_18c8;
    dVar51 = dVar51 * dVar67;
    dStack_15a8 = dStack_15a8 + dVar51;
    dVar27 = dVar51 + (double)auStack_15c0._8_8_;
    dVar82 = (double)auStack_15c0._0_8_ - dVar51;
    dVar127 = (double)local_18b8._0_8_ + dVar111;
    dVar84 = auVar132._0_8_;
    dVar88 = auVar132._8_8_;
    dVar29 = dVar48 * dVar55 - dVar53 * dVar84;
    dVar31 = dVar67 * dVar56 - dVar126 * dVar88;
    local_18a8 = local_1670;
    local_1718 = local_1648;
    local_1a48 = dStack_1438;
    local_1a38 = local_808[0];
    local_1738 = local_1680[1];
    local_1728 = local_1660;
    local_18b8._0_8_ = local_15d0[1];
    local_1a68 = local_1468;
    local_1978 = local_1258;
    local_1988 = local_1240;
    auStack_15c0._8_4_ = SUB84(dVar27,0);
    auStack_15c0._0_8_ = dVar82;
    auStack_15c0._12_4_ = (int)((ulong)dVar27 >> 0x20);
    dVar54 = dVar67 * local_18c8;
    dStack_1448 = dVar54 + dStack_1448;
    auVar5._8_4_ = SUB84(dStack_1458 + dVar54,0);
    auVar5._0_8_ = local_1460 - dVar54;
    auVar5._12_4_ = (int)((ulong)(dStack_1458 + dVar54) >> 0x20);
    dVar68 = dVar68 * dVar48;
    dVar35 = dVar35 * dVar48;
    dVar53 = dVar48 * dVar127 * dVar55 -
             (dVar127 - ((h_RT[3] + h_RT[0]) - (h_RT[6] + h_RT[1])) * dVar47) * dVar84 * dVar53;
    dVar67 = dVar67 * ((double)local_18b8._8_8_ + dVar111) * dVar56 -
             (((double)local_18b8._8_8_ + dVar111) - ((h_RT[2] + RVar9) - dVar115) * dVar47) *
             dVar88 * dVar126;
    local_808[1] = dVar70 - dVar67;
    local_808[2] = dVar71 + dVar67;
    local_1f28[2] = dVar32 + dVar31;
    dVar32 = local_1de8[3] * -dVar84;
    dVar34 = dVar34 * -dVar84;
    dVar52 = dVar52 * -dVar88;
    local_1510 = local_1510 - dVar52;
    dStack_1508 = dStack_1508 + dVar52;
    dStack_14f8 = dVar52 + dStack_14f8;
    local_1500 = local_1500 - dVar52;
    dVar27 = local_1de8[2] * -dVar88;
    local_13b0 = local_13b0 - dVar27;
    dStack_13a8 = dStack_13a8 + dVar27;
    dVar48 = dVar27 + (double)local_13a0._8_8_;
    local_13a0._8_4_ = SUB84(dVar48,0);
    local_13a0._0_8_ = (double)local_13a0._0_8_ - dVar27;
    local_13a0._12_4_ = (int)((ulong)dVar48 >> 0x20);
    local_1f28[0] = local_1f28[0] + dVar29;
    local_1f28[1] = (dVar123 - dVar31) - dVar29;
    local_1f28[3] = (dVar33 - dVar31) + dVar29;
    local_1f28[4] = local_1f28[4] + dVar31;
    local_1f28[6] = local_1f28[6] - dVar29;
    local_1680[1] = local_1680[1] + dVar32;
    local_1670 = local_1670 - dVar32;
    local_1660 = local_1660 + dVar32;
    local_1648 = local_1648 - dVar32;
    local_15d0[1] = local_15d0[1] + dVar68;
    dVar32 = local_1598 - dVar68;
    local_15b0 = dVar68 + (local_15b0 - dVar51);
    local_1468 = local_1468 + dVar34;
    local_1460 = (local_1460 - dVar54) - dVar34;
    dStack_1458 = auVar5._8_8_;
    dStack_1438 = dStack_1438 - dVar34;
    local_1450 = dVar34 + (local_1450 - dVar54);
    local_1258 = local_1258 + dVar35;
    local_1240 = local_1240 + dVar35;
    dVar33 = local_1250 - dVar35;
    dVar35 = dStack_1228 - dVar35;
    local_808[0] = local_808[0] + dVar53;
    dVar48 = local_808[1] - dVar53;
    local_808[3] = (dVar72 - dVar67) + dVar53;
    local_808[4] = local_808[4] + dVar67;
    dVar53 = local_808[6] - dVar53;
    dVar29 = local_1de8[1] * local_1de8[6];
    dVar31 = exp(local_738);
    dVar27 = local_1de8[4];
    dVar31 = dVar31 * 134000000.0;
    dVar67 = local_1de8[4] * local_1de8[4];
    dVar123 = exp(local_1958);
    RVar9 = h_RT[1];
    dVar123 = dVar31 / dVar123;
    dVar34 = dVar31 * dVar29 - dVar67 * dVar123;
    dVar29 = (double)local_1a58._0_8_ * dVar31 * dVar29 -
             ((double)local_1a58._0_8_ - ((h_RT[4] + h_RT[4]) - (h_RT[6] + h_RT[1])) * dVar47) *
             dVar123 * dVar67;
    dVar115 = local_1f28[1] - dVar34;
    local_1f28[6] = local_1f28[6] - dVar34;
    local_1f28[4] = dVar34 + dVar34 + local_1f28[4];
    dVar69 = dVar69 * dVar31;
    local_1598 = dVar32 - dVar69;
    dStack_15a8 = dVar69 + dVar69 + dStack_15a8;
    dVar27 = dVar123 * -2.0 * dVar27;
    local_13b0 = local_13b0 - dVar27;
    local_1388 = local_1388 - dVar27;
    dVar31 = dVar31 * dVar50;
    local_1250 = dVar33 - dVar31;
    dStack_1228 = dVar35 - dVar31;
    dStack_1238 = dVar31 + dVar31 + dStack_1238;
    local_808[1] = dVar48 - dVar29;
    local_808[6] = dVar53 - dVar29;
    local_808[4] = dVar29 + dVar29 + local_808[4];
    local_1908 = local_1de8[10];
    uStack_1900 = 0;
    local_13a0._8_8_ = dVar27 + dVar27 + (double)local_13a0._8_8_;
    local_1998 = exp((double)local_1a28._0_8_);
    dVar123 = local_1de8[9];
    dVar53 = local_1de8[0];
    local_1758 = exp(local_1968);
    dVar51 = local_ff8;
    dVar35 = local_1000;
    dVar34 = local_15d0[1];
    dVar33 = local_1de8[0xd];
    dVar48 = local_1de8[1];
    local_1748 = h_RT[10];
    RStack_1740 = h_RT[0xb];
    local_18e8 = (undefined1  [8])h_RT[0];
    uStack_18e0 = h_RT[1];
    local_18f8 = h_RT[9];
    RStack_18f0 = h_RT[10];
    local_1988 = local_1f28[0];
    local_1978 = dStack_1ee0;
    local_1a58._0_8_ = local_1680[1];
    local_1a48 = local_1670;
    local_1a38 = local_1630;
    local_1968 = local_1628;
    local_1738 = dStack_1580;
    local_18b8._0_8_ = local_1578;
    local_1958 = local_1048;
    local_1a28._0_8_ = local_1040;
    local_18d8 = local_f98;
    local_18c8 = local_f90;
    local_1728 = local_f50;
    local_738 = local_f48;
    local_18a8 = local_808[0];
    local_1718 = local_808[1];
    local_1a68 = local_808[9];
    local_1768 = exp(dVar49);
    dVar32 = local_1de8[0xb];
    dVar67 = local_1de8[0];
    dVar27 = exp(local_728);
    dVar29 = local_1a18;
    auVar97._8_8_ = dVar27;
    auVar97._0_8_ = local_1758;
    dVar126 = local_1998 * 660.0;
    dVar71 = local_1768 * 73400000.0;
    auVar59._8_8_ = dVar71;
    auVar59._0_8_ = dVar126;
    auVar132 = divpd(auVar59,auVar97);
    dVar31 = dVar53 * dVar123;
    dVar52 = dVar32 * dVar67;
    dVar127 = dVar126 * local_1908;
    dVar50 = dVar50 * local_1908;
    dVar54 = dVar33 * dVar48;
    dVar27 = local_1a18 - (((double)local_18e8 + local_18f8) - (RVar9 + local_1748)) * dVar47;
    dVar70 = auVar132._0_8_;
    dVar72 = auVar132._8_8_;
    dVar32 = dVar32 * -dVar72;
    dVar67 = dVar67 * -dVar72;
    local_18f8 = local_1560;
    local_18e8 = (undefined1  [8])local_ee0;
    local_1a18 = local_e80;
    local_1908 = dStack_e90;
    local_728 = local_d30;
    dStack_1580 = local_1738 + dVar127;
    local_1578 = (double)local_18b8._0_8_ - dVar127;
    dVar48 = dVar48 * dVar126;
    local_f98 = local_18d8 + dVar48;
    local_f90 = local_18c8 - dVar48;
    local_f50 = local_1728 + dVar48;
    local_f48 = local_738 - dVar48;
    dVar27 = dVar29 * dVar126 * dVar50 - dVar27 * dVar70 * dVar31;
    dVar48 = local_1e58 * dVar71 * dVar54 -
             (local_1e58 - ((h_RT[0xb] + h_RT[0]) - (h_RT[0xd] + h_RT[1])) * dVar47) * dVar72 *
             dVar52;
    local_808[9] = local_1a68 + dVar27;
    dVar29 = dVar50 * dVar126 - dVar31 * dVar70;
    dVar31 = dVar54 * dVar71 - dVar52 * dVar72;
    dStack_1ee0 = local_1978 + dVar29;
    dVar123 = dVar123 * -dVar70;
    local_1630 = local_1a38 + dVar123;
    local_1628 = local_1968 - dVar123;
    dVar53 = -dVar70 * dVar53;
    local_1048 = local_1958 + dVar53;
    local_1040 = (double)local_1a28._0_8_ - dVar53;
    local_1000 = dVar35 + dVar53;
    local_ff8 = dVar51 - dVar53;
    local_1f28[0] = local_1988 + dVar29 + dVar31;
    local_1f28[1] = (dVar115 - dVar29) - dVar31;
    dVar53 = dVar31 + dStack_1ed0;
    unique0x10006d5c = SUB84(dVar53,0);
    local_1ed8 = (undefined1  [8])((double)local_1ed8 - dVar29);
    unique0x10006d60 = (int)((ulong)dVar53 >> 0x20);
    dStack_1ec0 = dStack_1ec0 - dVar31;
    local_1680[1] = (double)local_1a58._0_8_ + dVar123 + dVar32;
    local_1670 = (local_1a48 - dVar123) - dVar32;
    local_1620 = local_1620 + dVar32;
    local_1610 = local_1610 - dVar32;
    dVar33 = dVar33 * dVar71;
    local_15d0[1] = dVar34 + dVar127 + dVar33;
    auStack_15c0._0_8_ = (((dVar82 - dVar68) - dVar69) - dVar127) - dVar33;
    local_1570 = local_1570 + dVar33;
    local_1560 = local_1560 - dVar33;
    local_ee8 = local_ee8 + dVar67;
    local_ee0 = local_ee0 - dVar67;
    dStack_e90 = dStack_e90 + dVar67;
    local_e80 = local_e80 - dVar67;
    local_1a38 = local_1de8[1];
    dVar71 = dVar71 * local_1de8[1];
    dVar51 = local_d88 + dVar71;
    local_d30 = local_d30 + dVar71;
    dVar50 = local_d80 - dVar71;
    dVar71 = local_d20 - dVar71;
    local_808[0] = local_18a8 + dVar27 + dVar48;
    local_808[1] = (local_1718 - dVar27) - dVar48;
    dVar29 = dVar48 + (double)local_7b8._8_8_;
    local_7b8._8_4_ = SUB84(dVar29,0);
    local_7b8._0_8_ = (double)local_7b8._0_8_ - dVar27;
    local_7b8._12_4_ = (int)((ulong)dVar29 >> 0x20);
    dStack_7a0 = dStack_7a0 - dVar48;
    local_1738 = exp(local_1888);
    dVar27 = local_1de8[0];
    local_1a48 = local_1de8[0xd];
    local_1728 = local_1de8[0] * local_1de8[0xd];
    local_18d8 = exp(local_1708);
    dVar33 = dStack_798;
    dVar32 = dStack_7a0;
    dVar123 = local_808[1];
    dVar67 = local_808[0];
    dVar53 = local_c68;
    uVar14 = auStack_15c0._0_8_;
    local_18c8 = (double)local_1e18 - ((h_RT[0] + h_RT[0xd]) - (h_RT[1] + h_RT[0xe])) * dVar47;
    dStack_18c0 = uStack_1e10;
    local_18b8._0_8_ = local_1f28[0];
    local_1718 = local_1f28[1];
    local_738 = dStack_1ec0;
    local_18a8 = local_1eb8;
    local_728 = local_1680[1];
    local_1a68 = local_1670;
    local_1988 = local_1610;
    local_1978 = local_1608;
    local_1708 = local_15d0[1];
    local_1a58._0_8_ = local_1560;
    local_1968 = local_d18;
    local_1958 = local_1de8[1];
    local_1a28._0_8_ = local_cd8;
    local_1a18 = local_cd0;
    local_1888 = local_c70;
    local_18e8 = (undefined1  [8])exp(dVar49);
    dVar29 = local_1de8[9];
    dVar48 = local_1de8[4];
    dVar34 = local_1de8[4] * local_1de8[9];
    uStack_18e0 = (double)extraout_XMM0_Qb_01;
    dVar35 = exp(dVar117 + dVar30);
    dVar31 = local_1de8[0x12];
    local_c68 = local_1738 * 23000.0;
    dVar82 = (double)local_18e8 * 32000000.0;
    dVar52 = local_c68 / local_18d8;
    dVar70 = local_c68 * local_1a38 * local_1de8[0xe] - local_1728 * dVar52;
    dVar72 = (double)local_1e18 * local_c68 * local_1a38 * local_1de8[0xe] -
             dVar52 * local_18c8 * local_1728;
    local_1f28[0] = (double)local_18b8._0_8_ + dVar70;
    dStack_1ec0 = local_738 + dVar70;
    local_1eb8 = local_18a8 - dVar70;
    local_1608 = local_1a48 * -dVar52;
    local_1680[1] = local_728 + local_1608;
    local_1670 = local_1a68 - local_1608;
    local_1610 = local_1988 + local_1608;
    local_1608 = local_1978 - local_1608;
    dVar68 = local_c68 * local_1de8[0xe];
    dVar69 = dVar82 * local_1de8[0xf];
    local_15d0[1] = local_1708 + dVar68;
    local_1560 = (double)local_1a58._0_8_ + dVar68;
    dVar27 = -dVar52 * dVar27;
    local_d88 = dVar51 + dVar27;
    local_d80 = dVar50 - dVar27;
    local_d20 = dVar71 + dVar27;
    local_d18 = local_1968 - dVar27;
    local_c68 = local_c68 * local_1958;
    local_cd8 = (double)local_1a28._0_8_ + local_c68;
    local_cd0 = local_1a18 - local_c68;
    local_c70 = local_1888 + local_c68;
    local_c68 = dVar53 - local_c68;
    local_808[0] = dVar67 + dVar72;
    dStack_7a0 = dVar32 + dVar72;
    dStack_798 = dVar33 - dVar72;
    dVar35 = dVar82 / dVar35;
    dVar53 = dVar82 * local_1de8[0xf] * local_1958 - dVar34 * dVar35;
    dVar27 = local_1e58 * dVar82 * local_1de8[0xf] * local_1958 -
             dVar35 * (local_1e58 - ((h_RT[4] + h_RT[9]) - (h_RT[1] + h_RT[0xf])) * dVar47) * dVar34
    ;
    local_1f28[1] = (local_1718 - dVar70) - dVar53;
    local_1f28[4] = local_1f28[4] + dVar53;
    dStack_1eb0 = dStack_1eb0 - dVar53;
    dStack_1ee0 = dVar53 + dStack_1ee0;
    dStack_15a8 = dStack_15a8 + dVar69;
    dStack_1580 = dStack_1580 + dVar69;
    auStack_15c0._0_8_ = ((double)uVar14 - dVar68) - dVar69;
    local_1558 = local_1558 - dVar68;
    dStack_1550 = dStack_1550 - dVar69;
    dVar29 = dVar29 * -dVar35;
    local_13b0 = local_13b0 - dVar29;
    local_13a0._8_8_ = (double)local_13a0._8_8_ + dVar29;
    local_1370 = local_1370 + dVar29;
    local_1340 = local_1340 - dVar29;
    dVar48 = -dVar35 * dVar48;
    local_1040 = local_1040 - dVar48;
    local_1028 = local_1028 + dVar48;
    local_1000 = local_1000 + dVar48;
    local_fd0 = local_fd0 - dVar48;
    dVar82 = dVar82 * local_1de8[1];
    local_c20 = local_c20 - dVar82;
    local_c08 = local_c08 + dVar82;
    local_be0 = local_be0 + dVar82;
    local_bb0 = local_bb0 - dVar82;
    local_808[1] = (dVar123 - dVar72) - dVar27;
    local_808[4] = local_808[4] + dVar27;
    local_808[9] = local_808[9] + dVar27;
    dStack_790 = dStack_790 - dVar27;
    dVar33 = local_1de8[1] * local_1de8[0x12];
    dVar53 = exp(local_16e8);
    dVar48 = local_1de8[0x11];
    dVar27 = local_1de8[0];
    dVar53 = dVar53 * 115.0;
    dVar67 = local_1de8[0] * local_1de8[0x11];
    dVar123 = exp(dVar120);
    dVar50 = local_1de8[4];
    dVar35 = local_1de8[1];
    dVar29 = local_1de8[0];
    dVar123 = dVar53 / dVar123;
    dVar32 = dVar53 * dVar33 - dVar67 * dVar123;
    dVar67 = (double)local_16d8._0_8_ * dVar53 * dVar33 -
             ((double)local_16d8._0_8_ - ((h_RT[0] + h_RT[0x11]) - (h_RT[1] + h_RT[0x12])) * dVar47)
             * dVar123 * dVar67;
    local_1f28[0] = local_1f28[0] + dVar32;
    local_1f28[1] = local_1f28[1] - dVar32;
    local_1e98 = local_1e98 - dVar32;
    dStack_1ea0 = dVar32 + dStack_1ea0;
    dVar48 = dVar48 * -dVar123;
    local_1680[1] = local_1680[1] + dVar48;
    local_1670 = local_1670 - dVar48;
    local_15f0 = local_15f0 + dVar48;
    local_15e8[0] = local_15e8[0] - dVar48;
    dVar31 = dVar31 * dVar53;
    local_15d0[1] = local_15d0[1] + dVar31;
    auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ - dVar31;
    local_1540 = local_1540 + dVar31;
    local_1538 = local_1538 - dVar31;
    dVar27 = -dVar123 * dVar27;
    local_ac8 = local_ac8 + dVar27;
    local_ac0 = local_ac0 - dVar27;
    local_a40 = local_a40 + dVar27;
    local_a38 = local_a38 - dVar27;
    dVar53 = dVar53 * local_1de8[1];
    local_a18 = local_a18 + dVar53;
    local_a10 = local_a10 - dVar53;
    local_990 = local_990 + dVar53;
    local_988 = local_988 - dVar53;
    local_808[0] = local_808[0] + dVar67;
    local_808[1] = local_808[1] - dVar67;
    dStack_780 = dStack_780 + dVar67;
    local_778 = local_778 - dVar67;
    dVar71 = exp((double)local_16c8._0_8_);
    local_1888 = local_1de8[5];
    uStack_1880 = 0;
    local_1a48 = exp(local_718);
    dVar70 = local_808[4];
    dVar69 = local_12e8;
    dVar68 = local_1390;
    uVar14 = local_13a0._8_8_;
    dVar34 = local_1f28[5];
    dVar33 = local_1f28[4];
    dVar32 = local_1f28[1];
    dVar123 = local_1f28[0];
    dStack_710 = h_RT[1] + h_RT[5];
    local_718 = (dStack_710 - (h_RT[0] + h_RT[4])) * dVar47;
    local_1a68 = local_1680[1];
    local_1988 = local_1670;
    local_1978 = local_1658;
    local_1708 = local_1650;
    local_1a38 = local_15d0[1];
    local_1968 = (double)auStack_15c0._0_8_;
    local_1958 = dStack_15a8;
    local_1a28._0_8_ = local_15a0;
    local_1a58._0_8_ = local_13b8;
    local_1a18 = local_1308;
    local_16c8._0_8_ = local_12e0;
    local_16e8 = local_808[0];
    local_16d8._0_8_ = local_808[5];
    uStack_1e10 = 0.0;
    local_1e18 = (undefined1  [8])local_1de8[4];
    dVar72 = exp(local_1948);
    dVar51 = local_1de8[5];
    dVar72 = dVar72 * 0.0357;
    dVar27 = exp(local_1920);
    RVar9 = h_RT[5];
    dVar52 = local_1de8[6];
    local_1948 = h_RT[4];
    uStack_1940 = 0;
    dVar71 = dVar71 * 216.0;
    local_1650 = dVar71 * dVar50;
    local_1680[1] = local_1a68 - local_1650;
    local_1670 = local_1988 + local_1650;
    local_1658 = local_1978 - local_1650;
    local_1650 = local_1650 + local_1708;
    dVar54 = dVar71 * dVar29;
    dVar55 = dVar72 * 2.0 * (double)local_1e18;
    local_13b8 = (double)local_1a58._0_8_ - dVar54;
    local_13b0 = local_13b0 + dVar54;
    dStack_13a8 = dStack_13a8 + dVar55;
    auVar109._8_8_ = dVar27;
    auVar109._0_8_ = local_1a48;
    dVar27 = dVar47 * 1.51 + local_16f8;
    dVar48 = dVar47 * 2.4 + dStack_16f0;
    auVar98._8_8_ = dVar72;
    auVar98._0_8_ = dVar71;
    auVar132 = divpd(auVar98,auVar109);
    local_16f8 = -auVar132._0_8_;
    dStack_16f0 = -auVar132._8_8_;
    dVar31 = dStack_16f0 * dVar51;
    dStack_1508 = dStack_1508 + dVar31;
    dStack_14f8 = dStack_14f8 - (dVar31 + dVar31);
    local_14f0 = dVar31 + local_14f0;
    local_15a0 = local_1888 * local_16f8;
    local_15d0[1] = local_1a38 - local_15a0;
    auStack_15c0._0_8_ = local_1968 + local_15a0;
    dStack_15a8 = local_1958 - local_15a0;
    local_15a0 = local_15a0 + (double)local_1a28._0_8_;
    dVar31 = local_1de8[1] * local_16f8;
    dVar53 = local_1de8[2] * dStack_16f0;
    local_1308 = local_1a18 - dVar31;
    local_1300 = local_1300 + dVar31;
    dStack_12f8 = dStack_12f8 + dVar53;
    local_16c8._8_4_ = SUB84(dVar53,0);
    local_16c8._0_8_ = dVar53 + (double)local_16c8._0_8_ + dVar31;
    local_16c8._12_4_ = (int)((ulong)dVar53 >> 0x20);
    dVar50 = dVar50 * dVar29;
    dVar126 = (double)local_1e18 * (double)local_1e18;
    dVar29 = -(dVar27 - local_718) * auVar132._0_8_;
    dVar67 = dVar51 * local_1de8[2];
    local_1a28._8_4_ = SUB84(dVar67,0);
    local_1a28._0_8_ = dVar29;
    local_1a28._12_4_ = (int)((ulong)dVar67 >> 0x20);
    dVar88 = dVar71 * dVar50 + local_1888 * dVar35 * local_16f8;
    dVar27 = dVar27 * dVar71 * dVar50 + dVar29 * local_1888 * dVar35;
    dVar29 = dVar48 * dVar72 * dVar126 +
             dVar67 * -(dVar48 - ((h_RT[2] + h_RT[5]) - (h_RT[4] + h_RT[4])) * dVar47) *
                      auVar132._8_8_;
    local_1f28[0] = dVar123 - dVar88;
    local_1f28[1] = dVar32 + dVar88;
    local_808[0] = local_16e8 - dVar27;
    local_808[1] = local_808[1] + dVar27;
    local_808[2] = local_808[2] + dVar29;
    local_16d8._8_4_ = SUB84(dVar29,0);
    local_16d8._0_8_ = dVar29 + (double)local_16d8._0_8_ + dVar27;
    local_16d8._12_4_ = (int)((ulong)dVar29 >> 0x20);
    local_1f28[4] = dVar33 - dVar88;
    local_1f28[5] = dVar88 + dVar34;
    local_1a38 = exp(local_1898);
    dVar67 = local_1de8[3];
    local_1a48 = exp(local_708);
    dVar35 = local_1de8[7];
    dVar32 = local_1de8[4];
    local_1968 = h_RT[6];
    RStack_1960 = h_RT[7];
    local_1958 = h_RT[3];
    RStack_1950 = h_RT[4];
    local_1898 = local_1f28[3];
    local_1a18 = local_1de8[5];
    uStack_1a10 = 0;
    local_1888 = (double)local_13a0._0_8_;
    local_718 = local_1388;
    local_1920 = local_12f0;
    local_16e8 = local_12d8;
    local_708 = local_808[3];
    local_1708 = exp(dVar49);
    dVar50 = local_1de8[0xe];
    local_1a58._8_8_ = 0;
    local_1a58._0_8_ = local_1de8[1];
    dVar48 = exp(dVar128);
    auVar60._8_8_ = dVar48;
    auVar60._0_8_ = local_1a48;
    dVar84 = local_1a38 * 29000000.0;
    dVar123 = local_1708 * 20000000.0;
    auVar99._8_8_ = dVar123;
    auVar99._0_8_ = dVar84;
    auVar132 = divpd(auVar99,auVar60);
    dVar51 = dVar51 * dVar67;
    dVar127 = dVar50 * (double)local_1a58._0_8_;
    dVar71 = (double)local_1e18 * dVar52;
    dVar56 = dVar35 * dVar32;
    dVar82 = auVar132._0_8_;
    dVar48 = dVar84 * dVar71 - dVar51 * dVar82;
    dVar51 = dVar83 * dVar84 * dVar71 -
             (dVar83 - ((RVar9 + local_1958) - (local_1948 + local_1968)) * dVar47) * dVar82 *
             dVar51;
    dVar71 = local_1e58 * dVar123 * dVar56 -
             (local_1e58 - ((h_RT[0xe] + h_RT[1]) - (h_RT[7] + h_RT[4])) * dVar47) * auVar132._8_8_
             * dVar127;
    dVar115 = -auVar132._8_8_;
    dVar127 = dVar56 * dVar123 + dVar115 * dVar127;
    dVar72 = dVar126 * dVar72 + dStack_16f0 * (double)local_1a28._8_8_;
    dVar50 = dVar50 * dVar115;
    dVar115 = dVar115 * (double)local_1a58._0_8_;
    local_1f28[3] = local_1898 + dVar48;
    local_1a18 = local_1a18 * -dVar82;
    local_1450 = local_1450 + local_1a18;
    dStack_1448 = dStack_1448 - local_1a18;
    local_1440 = local_1a18 + local_1440;
    dStack_1438 = dStack_1438 - local_1a18;
    local_1a28._0_8_ = dStack_1380;
    local_1948 = local_1188;
    local_1e18 = (undefined1  [8])dStack_1170;
    local_1898 = local_1138;
    dVar52 = dVar52 * dVar84;
    local_13a0._0_8_ = local_1888 + dVar52;
    local_1390 = dVar55 + dVar68 + dVar54 + dVar52;
    local_1388 = local_718 - dVar52;
    dVar67 = -dVar82 * dVar67;
    local_12f0 = local_1920 + dVar67;
    local_12e8 = ((dVar69 - dVar31) - (dVar53 + dVar53)) - dVar67;
    local_12e0 = (double)local_16c8._0_8_ + dVar67;
    local_12d8 = local_16e8 - dVar67;
    dVar35 = dVar35 * dVar123;
    dVar123 = dVar123 * dVar32;
    dVar84 = dVar84 * dVar32;
    local_1240 = local_1240 + dVar84;
    dStack_1238 = dStack_1238 - dVar84;
    local_1230 = dVar84 + local_1230;
    dStack_1228 = dStack_1228 - dVar84;
    local_808[3] = local_708 + dVar51;
    local_808[5] = (double)local_16d8._0_8_ + dVar51;
    local_1f28[5] = dVar72 + dVar88 + dVar34 + dVar48;
    local_1f28[1] = local_1f28[1] + dVar127;
    local_1f28[2] = local_1f28[2] + dVar72;
    local_1f28[4] = (((dVar33 - dVar88) - (dVar72 + dVar72)) - dVar48) - dVar127;
    local_1eb8 = local_1eb8 + dVar127;
    local_1f28[6] = local_1f28[6] - dVar48;
    auStack_1ef0 = (undefined1  [8])((double)auStack_1ef0 - dVar127);
    auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ + dVar50;
    dStack_15a8 = dStack_15a8 - dVar50;
    local_1558 = local_1558 + dVar50;
    local_1590 = local_1590 - dVar50;
    local_13b0 = local_13b0 + dVar35;
    local_13a0._8_8_ = ((((double)uVar14 - dVar54) - (dVar55 + dVar55)) - dVar52) - dVar35;
    local_1348 = local_1348 + dVar35;
    dStack_1380 = dStack_1380 - dVar35;
    local_11a0 = local_11a0 + dVar123;
    local_1188 = local_1188 - dVar123;
    local_1138 = local_1138 + dVar123;
    dStack_1170 = dStack_1170 - dVar123;
    local_cd0 = local_cd0 + dVar115;
    local_cb8 = local_cb8 - dVar115;
    local_c68 = local_c68 + dVar115;
    dStack_ca0 = dStack_ca0 - dVar115;
    local_808[1] = local_808[1] + dVar71;
    local_808[4] = (((dVar70 - dVar27) - (dVar29 + dVar29)) - dVar51) - dVar71;
    local_808[6] = local_808[6] - dVar51;
    local_808[7] = local_808[7] - dVar71;
    dStack_798 = dStack_798 + dVar71;
    local_1a48 = local_1de8[4];
    uStack_1a40 = 0;
    local_1a18 = local_1de8[8];
    uStack_1a10 = 0;
    local_1a28._0_8_ = exp(dVar49);
    dVar50 = local_1de8[0xe];
    dVar67 = local_1de8[1];
    local_1a28._8_8_ = extraout_XMM0_Qb_02;
    local_1898 = exp(dVar129);
    dVar115 = dStack_798;
    dVar82 = local_808[4];
    dVar72 = local_c68;
    dVar71 = local_c98;
    dVar70 = local_cb8;
    dVar69 = local_cd0;
    uVar15 = local_13a0._8_8_;
    dVar68 = local_1558;
    dVar52 = local_1588;
    dVar51 = dStack_15a8;
    uVar14 = auStack_15c0._0_8_;
    dVar34 = local_1de8[9];
    dVar53 = local_1eb8;
    dVar31 = local_1f28[4];
    local_1e18 = (undefined1  [8])local_1f28[1];
    local_1888 = local_13b0;
    local_718 = local_1378;
    local_1920 = local_1348;
    local_16e8 = local_10f0;
    local_16d8._0_8_ = local_10d8;
    local_16c8._0_8_ = local_10b8;
    local_1948 = local_1088;
    local_708 = local_808[1];
    local_16f8 = local_1de8[4];
    dStack_16f0 = 0.0;
    local_1958 = h_RT[1];
    RStack_1950 = 0.0;
    local_1a38 = h_RT[4];
    uStack_1a30 = 0;
    local_1a58._8_8_ = 0;
    local_1a58._0_8_ = h_RT[8];
    local_1968 = h_RT[0xe];
    RStack_1960 = 0.0;
    local_1a08 = exp(local_1a08);
    dVar33 = local_1de8[7];
    dVar32 = local_1de8[5];
    auVar39._0_8_ = exp(local_1878);
    dVar35 = local_1de8[9];
    dVar123 = local_1de8[4];
    auVar39._8_8_ = local_1898;
    local_1a08 = local_1a08 * 56.0;
    local_1088 = (double)local_1a28._0_8_ * 30000000.0;
    auVar113._8_8_ = local_1088;
    auVar113._0_8_ = local_1a08;
    auVar132 = divpd(auVar113,auVar39);
    dVar27 = dVar33 * dVar32;
    dVar126 = dVar50 * dVar67;
    dVar127 = local_16f8 * dVar34;
    dVar54 = auVar132._0_8_;
    dVar55 = auVar132._8_8_;
    dVar48 = local_19f8 * local_1a08 * dVar127 -
             (local_19f8 - ((h_RT[7] + h_RT[5]) - (h_RT[9] + h_RT[4])) * dVar47) * dVar54 * dVar27;
    dVar29 = local_1e58 * local_1088 * local_1a18 * local_1a48 -
             (local_1e58 -
             ((local_1968 + local_1958) - (local_1a38 + (double)local_1a58._0_8_)) * dVar47) *
             dVar55 * dVar126;
    dVar127 = dVar127 * local_1a08 - dVar27 * dVar54;
    dVar83 = local_1a18 * local_1a48 * local_1088 - dVar126 * dVar55;
    dVar34 = dVar34 * local_1a08;
    dVar27 = local_1a08 * local_16f8;
    dVar126 = local_1a18 * local_1088;
    local_13b0 = local_1888 + dVar126;
    local_1a38 = local_12e8;
    local_16f8 = local_12c0;
    local_1898 = local_1188;
    local_1878 = local_1160;
    local_1a08 = local_1028;
    local_19f8 = local_1000;
    local_1968 = local_1180;
    local_1958 = dStack_1170;
    local_1888 = local_1020;
    local_1a28._0_8_ = local_1010;
    local_1a18 = local_808[5];
    local_1378 = local_718 - dVar126;
    local_1348 = dVar126 + local_1920;
    local_1088 = local_1088 * local_1a48;
    local_10f0 = local_16e8 + local_1088;
    local_10d8 = (double)local_16d8._0_8_ - local_1088;
    local_10b8 = (double)local_16c8._0_8_ - local_1088;
    local_1088 = local_1088 + local_1948;
    local_808[1] = local_708 + dVar29;
    dStack_798 = dVar29 + dVar115;
    local_1f28[1] = (double)local_1e18 + dVar83;
    local_1eb8 = dVar83 + dVar53;
    dVar33 = dVar33 * -dVar54;
    dVar32 = dVar32 * -dVar54;
    dVar50 = dVar50 * -dVar55;
    auStack_15c0._0_8_ = (double)uVar14 + dVar50;
    dStack_15a8 = dVar51 - dVar50;
    local_1588 = dVar52 - dVar50;
    local_1558 = dVar50 + dVar68;
    dVar67 = dVar67 * -dVar55;
    local_cd0 = dVar69 + dVar67;
    local_cb8 = dVar70 - dVar67;
    local_c98 = dVar71 - dVar67;
    local_c68 = dVar67 + dVar72;
    local_1f28[4] = (dVar31 - dVar83) - dVar127;
    local_1f28[5] = local_1f28[5] + dVar127;
    auStack_1ef0 = (undefined1  [8])((double)auStack_1ef0 + dVar127);
    local_1ee8 = local_1ee8 - dVar83;
    dStack_1ee0 = dStack_1ee0 - dVar127;
    local_13a0._8_8_ = ((double)uVar15 - dVar126) - dVar34;
    local_1390 = local_1390 + dVar34;
    dStack_1380 = dStack_1380 + dVar34;
    local_1370 = local_1370 - dVar34;
    local_12e8 = local_12e8 - dVar33;
    local_12e0 = local_12e0 + dVar33;
    local_12d0 = local_12d0 + dVar33;
    local_12c0 = local_12c0 - dVar33;
    local_1188 = local_1188 - dVar32;
    local_1180 = local_1180 + dVar32;
    dStack_1170 = dStack_1170 + dVar32;
    local_1160 = local_1160 - dVar32;
    local_1028 = local_1028 - dVar27;
    local_1020 = local_1020 + dVar27;
    local_1010 = local_1010 + dVar27;
    local_1000 = local_1000 - dVar27;
    local_808[5] = local_808[5] + dVar48;
    local_808[4] = (dVar82 - dVar29) - dVar48;
    local_808[7] = local_808[7] + dVar48;
    local_808[8] = local_808[8] - dVar29;
    local_808[9] = local_808[9] - dVar48;
    dVar29 = local_1de8[4] * local_1de8[9];
    dVar31 = exp(dVar49);
    dVar48 = local_1de8[8];
    dVar27 = local_1de8[5];
    dVar31 = dVar31 * 25010000.0;
    dVar53 = local_1de8[5] * local_1de8[8];
    dVar67 = exp(local_16a8);
    dVar67 = dVar31 / dVar67;
    dVar32 = dVar31 * dVar29 - dVar53 * dVar67;
    dVar29 = local_1e58 * dVar31 * dVar29 -
             (local_1e58 - ((h_RT[5] + h_RT[8]) - (h_RT[4] + h_RT[9])) * dVar47) * dVar67 * dVar53;
    local_1f28[4] = local_1f28[4] - dVar32;
    local_1f28[5] = local_1f28[5] + dVar32;
    dStack_1ee0 = dStack_1ee0 - dVar32;
    local_1ee8 = dVar32 + local_1ee8;
    dVar35 = dVar35 * dVar31;
    local_13a0._8_8_ = (double)local_13a0._8_8_ - dVar35;
    local_1390 = local_1390 + dVar35;
    local_1378 = local_1378 + dVar35;
    local_1370 = local_1370 - dVar35;
    dVar48 = dVar48 * -dVar67;
    local_12e8 = local_12e8 - dVar48;
    local_12e0 = local_12e0 + dVar48;
    local_12c8 = local_12c8 + dVar48;
    local_12c0 = local_12c0 - dVar48;
    dVar27 = -dVar67 * dVar27;
    local_10d8 = local_10d8 - dVar27;
    local_10d0 = local_10d0 + dVar27;
    local_10b8 = local_10b8 + dVar27;
    local_10b0 = local_10b0 - dVar27;
    dVar31 = dVar31 * dVar123;
    local_708 = local_1028 - dVar31;
    local_16c8._0_8_ = local_1020 + dVar31;
    local_1008 = local_1008 + dVar31;
    local_16e8 = local_1000 - dVar31;
    local_808[4] = local_808[4] - dVar29;
    local_808[5] = local_808[5] + dVar29;
    local_808[8] = local_808[8] + dVar29;
    local_808[9] = local_808[9] - dVar29;
    local_17a8 = local_1de8[4];
    uStack_17a0 = 0;
    dVar29 = exp(local_19c8);
    local_17d8 = local_1de8[5];
    uStack_17d0 = 0;
    local_17c8 = local_1de8[9];
    uStack_17c0 = 0;
    dVar53 = exp(local_19e8);
    local_17e8 = local_1d08 - ((h_RT[5] + h_RT[9]) - (h_RT[4] + h_RT[10])) * dVar47;
    uStack_17e0 = uStack_1d00;
    local_17b8 = local_1f28[4];
    local_1798 = dStack_1ee0;
    local_1788 = (double)local_13a0._8_8_;
    local_1768 = local_1390;
    local_1758 = local_1370;
    local_1748 = local_1368;
    local_1908 = local_12e8;
    local_18f8 = local_12e0;
    local_18d8 = local_12c0;
    local_1728 = local_12b8;
    local_728 = local_ff8;
    local_1708 = local_f78;
    local_1a48 = local_f70;
    local_1968 = local_f50;
    local_1958 = local_f48;
    local_1898 = local_808[4];
    local_1a28._0_8_ = local_808[5];
    local_1a18 = local_808[9];
    local_718 = (double)local_7b8._0_8_;
    dVar67 = exp(dVar90 + dVar47 * -35.225166606330404);
    dVar48 = local_1de8[0xc];
    dVar31 = local_1de8[1];
    auVar40._0_8_ = exp((double)local_19d8._0_8_);
    dVar71 = dStack_e90;
    dVar69 = local_ec8;
    dVar68 = local_ee0;
    dVar35 = local_1de8[0xd];
    dVar27 = local_1de8[4];
    local_1718 = local_1cf8 - ((h_RT[1] + h_RT[0xc]) - (h_RT[4] + h_RT[0xb])) * dVar47;
    uStack_1710 = uStack_1cf0;
    local_16d8._0_8_ = local_1f28[1];
    local_1a68 = dStack_15a8;
    local_1978 = local_1570;
    local_16f8 = local_13b0;
    local_1888 = local_1360;
    local_1920 = local_1358;
    auVar61._0_8_ = dVar67 * 47.6;
    auVar61._8_8_ = dVar29 * 100.0;
    auVar40._8_8_ = dVar53;
    auVar132 = divpd(auVar61,auVar40);
    dVar127 = auVar132._0_8_;
    dVar123 = auVar132._8_8_;
    local_17f8 = -dVar127;
    dStack_17f0 = -dVar123;
    local_1778 = dVar48 * local_17f8;
    uStack_1770 = 0;
    local_1ab0 = (double)auStack_15c0._0_8_ + local_1778;
    local_1998 = local_1568 + local_1778;
    local_1738 = dVar31 * local_17f8;
    RStack_1730 = 0.0;
    local_738 = local_e30 + local_1738;
    local_18a8 = local_dd8 + local_1738;
    local_18e8 = (undefined1  [8])local_e18;
    local_18c8 = local_de0;
    local_19f8 = local_808[1];
    local_19e8 = (double)local_7b8._8_8_;
    local_19d8._0_8_ = local_7a8;
    dVar82 = exp(dVar49);
    local_1a38 = local_1de8[0xb];
    uStack_1a30 = 0;
    dVar53 = exp(local_16b8);
    dVar72 = local_e80;
    dVar70 = local_ec0;
    dVar52 = local_12a0;
    dVar51 = local_1350;
    dVar50 = local_1de8[0xe];
    dVar32 = local_1de8[4];
    local_1e18 = (undefined1  [8])dStack_1ec0;
    local_19c8 = local_12b0;
    local_1878 = local_d68;
    local_16a8 = local_d60;
    local_1948 = local_d30;
    local_16b8 = local_d20;
    local_1a08 = dStack_7a0;
    local_678 = h_RT[4];
    uStack_670 = 0;
    local_1a58._8_8_ = 0;
    local_1a58._0_8_ = h_RT[5];
    local_18b8._8_8_ = 0;
    local_18b8._0_8_ = h_RT[0xb];
    local_688 = h_RT[0xd];
    RStack_680 = 0.0;
    dVar115 = exp(local_1ae8);
    dVar34 = local_1de8[5];
    local_1988 = local_1de8[0xd];
    uStack_1980 = 0;
    auVar41._0_8_ = exp(dVar135);
    dVar33 = local_1de8[4];
    dVar29 = (double)local_1a58._0_8_ + (double)local_18b8._0_8_;
    auVar41._8_8_ = dVar53;
    dVar115 = dVar115 * 3430.0;
    dVar82 = dVar82 * 50000000.0;
    auVar74._8_8_ = dVar82;
    auVar74._0_8_ = dVar115;
    local_18b8 = divpd(auVar74,auVar41);
    dVar55 = dVar32 * dVar50;
    dVar56 = dVar35 * dVar27;
    local_1a58._8_4_ = SUB84(dVar82,0);
    local_1a58._0_8_ = dVar82;
    local_1a58._12_4_ = (int)((ulong)dVar82 >> 0x20);
    dVar35 = dVar35 * dVar82;
    dVar48 = dVar48 * dVar31;
    dVar83 = local_1d08 * auVar61._8_8_ * local_17a8 * local_1de8[10] -
             local_17c8 * local_17d8 * dVar123 * local_17e8;
    dVar67 = local_1de8[4] * local_1de8[0xb] * auVar61._0_8_ - dVar48 * dVar127;
    dVar123 = local_17a8 * local_1de8[10] * auVar61._8_8_ - local_17c8 * local_17d8 * dVar123;
    local_1ae8 = local_1eb8;
    dStack_1ee0 = dVar123 + local_1798;
    dVar88 = auVar61._8_8_ * local_1de8[10];
    local_1d08 = local_c70;
    local_1370 = local_1758 + dVar88;
    local_1368 = local_1748 - dVar88;
    dVar54 = local_17c8 * (double)CONCAT44(local_17f8._4_4_,dStack_17f0._0_4_);
    local_12c0 = local_18d8 + dVar54;
    local_12b8 = local_1728 - dVar54;
    local_ff8 = local_17d8 * (double)CONCAT44(local_17f8._4_4_,dStack_17f0._0_4_);
    local_1028 = local_708 - local_ff8;
    local_1020 = (double)local_16c8._0_8_ + local_ff8;
    local_1000 = local_16e8 + local_ff8;
    local_ff8 = local_728 - local_ff8;
    local_f48 = auVar61._8_8_ * local_17a8;
    local_f78 = local_1708 - local_f48;
    local_f70 = local_1a48 + local_f48;
    local_f50 = local_1968 + local_f48;
    local_f48 = local_1958 - local_f48;
    local_808[9] = local_1a18 + dVar83;
    local_7b8._0_8_ = local_718 - dVar83;
    auStack_15c0._0_8_ = local_1ab0;
    dStack_15a8 = local_1a68 - local_1778;
    local_1570 = local_1978 - local_1778;
    local_1568 = local_1998;
    dVar126 = local_1de8[0xb] * auVar61._0_8_;
    local_13b0 = local_16f8 + dVar126;
    local_1358 = dVar126 + local_1920;
    local_e30 = local_738;
    local_e18 = (double)local_18e8 - local_1738;
    local_de0 = local_18c8 - local_1738;
    local_dd8 = local_18a8;
    local_1360 = (local_1888 - dVar126) + dVar35;
    dVar31 = local_1de8[4] * local_1de8[0xb] * local_1cf8 * auVar61._0_8_ -
             dVar127 * local_1718 * dVar48;
    local_1f28[1] = (double)local_16d8._0_8_ + dVar67;
    dVar48 = local_1988 * dVar34;
    dVar53 = -(double)local_18b8._8_8_ * local_1a38;
    dVar127 = dVar55 * dVar115 - dVar48 * (double)local_18b8._0_8_;
    dVar84 = dVar56 * dVar82 - local_1de8[5] * local_1a38 * (double)local_18b8._8_8_;
    local_1ed8 = (undefined1  [8])((double)local_1ed8 - dVar123);
    local_808[1] = local_19f8 + dVar31;
    local_7a8 = dVar31 + (double)local_19d8._0_8_;
    dVar27 = dVar82 * dVar27;
    local_d30 = local_1948 + dVar27;
    dVar48 = local_1ac8 * dVar115 * dVar55 -
             (local_1ac8 - ((h_RT[0xd] + h_RT[5]) - (h_RT[0xe] + h_RT[4])) * dVar47) *
             (double)local_18b8._0_8_ * dVar48;
    dVar29 = local_1e58 * dVar82 * dVar56 -
             (local_1e58 - (dVar29 - (local_678 + local_688)) * dVar47) * (double)local_18b8._8_8_ *
             local_1de8[5] * local_1a38;
    local_7b8._8_8_ = (local_19e8 - dVar31) + dVar29;
    local_12b0 = local_19c8 + dVar53;
    dVar82 = auVar61._0_8_ * local_1de8[4];
    local_e80 = -(double)local_18b8._8_8_ * local_1de8[5];
    local_ee0 = dVar68 + dVar82;
    dStack_e90 = (dVar71 - dVar82) + local_e80;
    dStack_e88 = dStack_e88 + dVar82;
    dStack_1ed0 = dVar84 + (dStack_1ed0 - dVar67);
    local_1ec8 = dVar67 + local_1ec8;
    local_ec8 = (dVar69 - dVar82) - local_e80;
    local_ec0 = dVar70 + local_e80;
    local_e80 = dVar72 - local_e80;
    local_1f28[4] = (((local_17b8 - dVar123) - dVar67) - dVar84) - dVar127;
    local_1f28[5] = local_1f28[5] + dVar123 + dVar84 + dVar127;
    dStack_1ec0 = ((double)local_1e18 - dVar84) + dVar127;
    local_1eb8 = local_1eb8 - dVar127;
    dVar32 = dVar32 * dVar115;
    dVar115 = dVar115 * dVar50;
    local_13a0._8_8_ = (((local_1788 - dVar88) - dVar126) - dVar35) - dVar115;
    local_1390 = local_1768 + dVar88 + dVar35 + dVar115;
    local_1348 = local_1348 - dVar115;
    local_1350 = dVar115 + (dVar51 - dVar35);
    local_12a0 = local_1988 * -(double)local_18b8._0_8_;
    local_12e8 = ((local_1908 - dVar54) - dVar53) - local_12a0;
    local_12e0 = local_18f8 + dVar54 + dVar53 + local_12a0;
    local_1298 = local_1298 - local_12a0;
    local_12a0 = local_12a0 + (dVar52 - dVar53);
    dVar34 = -(double)local_18b8._0_8_ * dVar34;
    local_d68 = (local_1878 - dVar27) - dVar34;
    local_d60 = local_16a8 + dVar27 + dVar34;
    local_d20 = (local_16b8 - dVar27) + dVar34;
    local_d18 = local_d18 - dVar34;
    local_cb8 = local_cb8 - dVar32;
    local_cb0 = local_cb0 + dVar32;
    local_c70 = local_c70 + dVar32;
    local_c68 = local_c68 - dVar32;
    local_808[4] = (((local_1898 - dVar83) - dVar31) - dVar29) - dVar48;
    local_808[5] = (double)local_1a28._0_8_ + dVar83 + dVar29 + dVar48;
    dStack_7a0 = (local_1a08 - dVar29) + dVar48;
    dStack_798 = dStack_798 - dVar48;
    local_19d8._8_8_ = 0;
    local_19d8._0_8_ = local_1de8[0x12];
    dVar127 = exp(local_1ad8);
    dVar32 = local_1de8[0x11];
    local_19e8 = exp(dVar130);
    dVar126 = local_988;
    dVar115 = local_a38;
    dVar82 = local_a40;
    dVar72 = local_aa0;
    dVar71 = local_aa8;
    dVar70 = local_1278;
    dVar69 = local_1280;
    dVar68 = local_12e0;
    dVar52 = local_12e8;
    dVar51 = local_1328;
    dVar50 = local_1330;
    dVar35 = local_1390;
    uVar14 = local_13a0._8_8_;
    dVar67 = local_1de8[7];
    dVar53 = local_1de8[6];
    dVar31 = local_1e98;
    dVar29 = dStack_1ea0;
    dVar48 = local_1f28[4];
    local_1ae8 = local_9f8;
    local_1ac8 = local_9f0;
    local_1ad8 = local_990;
    local_1e18 = (undefined1  [8])local_808[4];
    local_1d08 = dStack_780;
    local_1cf8 = local_778;
    local_1878 = h_RT[4];
    dStack_1870 = 0.0;
    local_1a08 = h_RT[0x11];
    uStack_1a00 = 0;
    local_16a8 = h_RT[0x12];
    uStack_16a0 = 0;
    local_19f8 = exp(dVar49);
    local_19c8 = local_1de8[0xe];
    dStack_19c0 = 0.0;
    auVar42._0_8_ = exp(local_1e08);
    dVar34 = local_19b8;
    dVar123 = local_1de8[6];
    auVar42._8_8_ = local_19e8;
    dVar83 = local_19f8 * 20000000.0;
    dVar127 = dVar127 * 3.54;
    auVar118._8_8_ = dVar127;
    auVar118._0_8_ = dVar83;
    auVar132 = divpd(auVar118,auVar42);
    dVar54 = dVar67 * dVar53;
    dVar55 = (double)local_19d8._0_8_ * dVar33;
    dVar27 = local_19b8 - ((local_1a08 + h_RT[5]) - (local_16a8 + local_1878)) * dVar47;
    dVar84 = dVar32 * local_1de8[5];
    dVar103 = auVar132._0_8_;
    dVar106 = auVar132._8_8_;
    dVar88 = dVar83 * dVar54 - local_19c8 * local_1de8[4] * dVar103;
    dVar90 = dVar127 * dVar55 - dVar84 * dVar106;
    dVar56 = (double)local_19d8._0_8_ * dVar127;
    local_19e8 = dStack_1228;
    dStack_19e0 = dStack_1220;
    local_19b8 = local_1178;
    dStack_19b0 = dStack_1170;
    local_1e08 = local_ca8;
    dStack_1e00 = dStack_ca0;
    local_1a08 = local_1188;
    local_19f8 = local_1138;
    local_19d8._0_8_ = local_cb8;
    local_1390 = dVar35 + dVar56;
    local_1330 = dVar50 + dVar56;
    local_1328 = dVar51 - dVar56;
    dVar33 = dVar127 * dVar33;
    local_9f8 = local_1ae8 - dVar33;
    local_9f0 = local_1ac8 + dVar33;
    local_990 = local_1ad8 + dVar33;
    local_988 = dVar126 - dVar33;
    dVar67 = dVar67 * dVar83;
    dVar53 = dVar53 * dVar83;
    dVar126 = local_1e58 * dVar83 * dVar54 -
              (local_1e58 - ((h_RT[0xe] + h_RT[4]) - (h_RT[7] + h_RT[6])) * dVar47) * dVar103 *
              local_19c8 * local_1de8[4];
    dVar33 = dVar34 * dVar127 * dVar55 - dVar27 * dVar106 * dVar84;
    dStack_780 = local_1d08 + dVar33;
    local_778 = local_1cf8 - dVar33;
    dStack_1ea0 = dVar29 + dVar90;
    local_1e98 = dVar31 - dVar90;
    dVar29 = local_1de8[4] * -dVar103;
    local_a38 = local_1de8[5] * -dVar106;
    dVar27 = local_19c8 * -dVar103;
    dVar32 = -dVar106 * dVar32;
    local_12e8 = dVar52 - dVar32;
    local_12e0 = dVar68 + dVar32;
    local_1280 = dVar69 + dVar32;
    local_1278 = dVar70 - dVar32;
    local_aa8 = dVar71 - local_a38;
    local_aa0 = dVar72 + local_a38;
    local_a40 = dVar82 + local_a38;
    local_a38 = dVar115 - local_a38;
    local_1f28[4] = (dVar48 - dVar90) + dVar88;
    local_1f28[5] = local_1f28[5] + dVar90;
    local_1f28[6] = local_1f28[6] - dVar88;
    local_1eb8 = local_1eb8 + dVar88;
    local_13a0._8_8_ = ((double)uVar14 - dVar56) + dVar27;
    local_1348 = local_1348 + dVar27;
    local_1388 = local_1388 - dVar27;
    dStack_1380 = dStack_1380 - dVar27;
    dStack_1238 = dStack_1238 + dVar67;
    local_11e8 = local_11e8 + dVar67;
    dStack_1228 = dStack_1228 - dVar67;
    dStack_1220 = dStack_1220 - dVar67;
    local_1188 = local_1188 + dVar53;
    local_1138 = local_1138 + dVar53;
    local_1178 = local_1178 - dVar53;
    dStack_1170 = dStack_1170 - dVar53;
    local_cb8 = local_cb8 + dVar29;
    local_c68 = local_c68 + dVar29;
    local_ca8 = local_ca8 - dVar29;
    dStack_ca0 = dStack_ca0 - dVar29;
    local_808[4] = ((double)local_1e18 - dVar33) + dVar126;
    local_808[5] = local_808[5] + dVar33;
    local_808[6] = local_808[6] - dVar126;
    dStack_798 = dStack_798 + dVar126;
    local_1ac8 = local_1de8[9];
    RStack_1ac0 = 0.0;
    dVar29 = exp(dVar49);
    dVar48 = local_1de8[10];
    local_19c8 = exp((double)local_1ce8._0_8_);
    dVar82 = local_808[9];
    dVar72 = local_808[3];
    dVar71 = local_f50;
    dVar70 = local_f68;
    dVar69 = local_f80;
    dVar68 = local_1030;
    dVar52 = local_1208;
    dVar51 = local_1210;
    dVar50 = local_1420;
    dVar35 = dStack_1438;
    dVar34 = local_1450;
    dVar33 = local_1de8[9];
    dVar32 = local_1de8[6];
    dVar67 = dStack_1ee0;
    dVar53 = local_1f28[3];
    local_1ae8 = h_RT[10];
    RStack_1ae0 = h_RT[0xb];
    local_1e08 = local_1418;
    local_1ad8 = local_1240;
    local_19b8 = dStack_1228;
    local_1e18 = (undefined1  [8])local_1018;
    local_1d08 = local_1000;
    local_1cf8 = local_ff8;
    local_1ce8._0_8_ = local_f48;
    local_19e8 = h_RT[6];
    dStack_19e0 = 0.0;
    local_19f8 = h_RT[9];
    dStack_19f0 = 0.0;
    local_19d8._0_8_ = exp(dVar49);
    dVar31 = local_1de8[0xf];
    local_19d8._8_8_ = extraout_XMM0_Qb_03;
    auVar43._0_8_ = exp(local_1e48);
    dVar55 = local_19e8 + local_19f8;
    auVar43._8_8_ = local_19c8;
    dVar27 = (double)local_19d8._0_8_ * 20000000.0;
    dVar29 = dVar29 * 1000000.0;
    auVar133._8_8_ = dVar29;
    auVar133._0_8_ = dVar27;
    auVar132 = divpd(auVar133,auVar43);
    dVar115 = local_1de8[4] * dVar31;
    dVar127 = local_1de8[3] * dVar48;
    dVar56 = dVar32 * dVar33;
    dVar84 = local_1ac8 * dVar123;
    dVar90 = h_RT[3] + local_1ae8;
    dVar103 = auVar132._0_8_;
    dVar106 = auVar132._8_8_;
    dStack_1ee0 = dVar27 * dVar56 - dVar115 * dVar103;
    dVar83 = dVar29 * dVar84 - dVar127 * dVar106;
    dVar54 = local_1ac8 * dVar29;
    local_1240 = local_1ad8 + dVar54;
    local_1ac8 = local_bf8;
    local_1ad8 = local_be0;
    local_1e48 = local_808[4];
    local_19e8 = local_11e0;
    local_19c8 = local_1028;
    local_19d8._0_8_ = local_fd0;
    local_1ae8 = local_bb0;
    local_1208 = dVar54 + dVar52;
    dVar123 = dVar29 * dVar123;
    local_1030 = dVar68 + dVar123;
    local_ff8 = dVar123 + local_1cf8;
    dVar33 = dVar33 * dVar27;
    dVar32 = dVar32 * dVar27;
    dVar27 = dVar27 * dVar92 * dVar56 -
             (dVar92 - ((h_RT[4] + h_RT[0xf]) - (h_RT[9] + h_RT[6])) * dVar47) * dVar103 * dVar115;
    dVar29 = dVar29 * dVar92 * dVar84 - (dVar92 - (dVar90 - dVar55) * dVar47) * dVar106 * dVar127;
    local_808[3] = dVar72 + dVar29;
    local_808[7] = local_808[7] - dVar126;
    local_1f28[3] = dVar53 + dVar83;
    auStack_1ef0 = (undefined1  [8])((double)auStack_1ef0 - dVar88);
    dVar31 = dVar31 * -dVar103;
    dVar53 = local_1de8[4] * -dVar103;
    dVar48 = dVar48 * -dVar106;
    local_1450 = dVar34 + dVar48;
    dStack_1438 = dVar35 - dVar48;
    local_1420 = dVar50 - dVar48;
    local_1418 = dVar48 + local_1e08;
    local_f48 = local_1de8[3] * -dVar106;
    local_f80 = dVar69 + local_f48;
    local_f68 = dVar70 - local_f48;
    local_f50 = dVar71 - local_f48;
    local_f48 = local_f48 + (double)local_1ce8._0_8_;
    local_1f28[4] = local_1f28[4] + dStack_1ee0;
    local_1f28[6] = (local_1f28[6] - dVar83) - dStack_1ee0;
    dStack_1eb0 = dStack_1eb0 + dStack_1ee0;
    dStack_1ee0 = (dVar67 - dVar83) - dStack_1ee0;
    local_1ed8 = (undefined1  [8])(dVar83 + (double)local_1ed8);
    local_13a0._8_8_ = (double)local_13a0._8_8_ + dVar31;
    local_1388 = local_1388 - dVar31;
    local_1340 = local_1340 + dVar31;
    local_1370 = local_1370 - dVar31;
    dStack_1238 = dStack_1238 + dVar33;
    dStack_1228 = (local_19b8 - dVar54) - dVar33;
    local_11e0 = local_11e0 + dVar33;
    local_1210 = (dVar51 - dVar54) - dVar33;
    local_1028 = local_1028 + dVar32;
    local_fd0 = local_fd0 + dVar32;
    local_1018 = ((double)local_1e18 - dVar123) - dVar32;
    local_1000 = (local_1d08 - dVar123) - dVar32;
    local_c08 = local_c08 + dVar53;
    local_bf8 = local_bf8 - dVar53;
    local_bb0 = local_bb0 + dVar53;
    local_be0 = local_be0 - dVar53;
    local_808[4] = local_808[4] + dVar27;
    local_808[6] = (local_808[6] - dVar29) - dVar27;
    local_7b8._0_8_ = dVar29 + (double)local_7b8._0_8_;
    local_808[9] = (dVar82 - dVar29) - dVar27;
    dStack_790 = dStack_790 + dVar27;
    local_1ce8._8_8_ = 0;
    local_1ce8._0_8_ = local_1de8[6];
    local_19b8 = local_1de8[0xb];
    dStack_19b0 = 0.0;
    local_1ae8 = exp((double)local_1aa8._0_8_);
    dVar32 = local_1de8[0xc];
    dVar53 = local_1de8[4];
    dVar72 = exp(local_1938);
    uVar15 = local_7b8._8_8_;
    dVar71 = local_808[4];
    dVar70 = local_e08;
    dVar69 = local_e18;
    dVar68 = dStack_e88;
    dVar52 = dStack_e90;
    dVar51 = local_1200;
    dVar50 = dStack_1228;
    dVar35 = local_1358;
    dVar34 = local_1360;
    dVar33 = local_1388;
    uVar14 = local_13a0._8_8_;
    RVar9 = h_RT[4];
    dVar67 = local_1de8[7];
    dVar31 = dStack_1ed0;
    dVar29 = local_1f28[4];
    local_1ac8 = h_RT[6];
    RStack_1ac0 = h_RT[7];
    local_1ad8 = h_RT[0xb];
    RStack_1ad0 = h_RT[0xc];
    local_1938 = h_RT[0xc];
    RStack_1930 = h_RT[0xd];
    local_1aa8._0_8_ = dStack_1238;
    local_1e18 = (undefined1  [8])local_11f8;
    local_1d08 = local_ec8;
    local_1cf8 = local_eb8;
    local_1e08 = local_de0;
    local_1e48 = local_dd8;
    local_19c8 = local_1de8[3];
    dStack_19c0 = 0.0;
    local_1a98 = exp(local_1a98);
    dVar48 = local_1de8[0xd];
    dVar27 = local_1de8[4];
    dVar82 = exp(local_1d38);
    dVar123 = local_1de8[7];
    dVar83 = dVar111 + local_1a88;
    auVar62._8_8_ = dVar82;
    auVar62._0_8_ = dVar72;
    dVar88 = local_1ae8 * 150000000.0;
    dVar90 = local_1a98 * 13200000.0;
    auVar100._8_8_ = dVar90;
    auVar100._0_8_ = dVar88;
    auVar132 = divpd(auVar100,auVar62);
    dVar82 = dVar53 * dVar32;
    dVar115 = dVar48 * dVar27;
    local_11f8 = dVar88 * local_19b8;
    dVar54 = local_19b8 * (double)local_1ce8._0_8_;
    dVar55 = dVar67 * local_19c8;
    dVar72 = local_1ad8 + local_1ac8;
    dVar84 = RVar9 + local_1938;
    dVar67 = dVar67 * dVar90;
    dVar56 = dVar90 * local_19c8;
    dVar126 = auVar132._0_8_;
    dVar127 = auVar132._8_8_;
    dVar48 = dVar48 * -dVar127;
    dVar27 = dVar27 * -dVar127;
    dStack_1238 = (double)local_1aa8._0_8_ + local_11f8;
    local_19b8 = dStack_1380;
    local_1938 = local_1190;
    local_1a98 = dStack_1170;
    local_1a88 = local_d70;
    local_1d38 = local_d50;
    local_1ac8 = local_1188;
    local_1ad8 = local_1140;
    local_1aa8._0_8_ = local_d20;
    dStack_1228 = dVar50 - local_11f8;
    local_1200 = dVar51 - local_11f8;
    local_11f8 = local_11f8 + (double)local_1e18;
    dStack_e88 = (double)local_1ce8._0_8_ * dVar88;
    local_ec8 = local_1d08 + dStack_e88;
    local_eb8 = local_1cf8 - dStack_e88;
    dStack_e90 = dVar52 - dStack_e88;
    dStack_e88 = dStack_e88 + dVar68;
    dVar50 = dVar83 * dVar88 * dVar54 - (dVar83 - (dVar84 - dVar72) * dVar47) * dVar126 * dVar82;
    dVar51 = (dVar111 + dStack_1a80) * dVar90 * dVar55 -
             ((dVar111 + dStack_1a80) - ((h_RT[0xd] + h_RT[4]) - (h_RT[7] + h_RT[3])) * dVar47) *
             dVar127 * dVar115;
    local_7b8._8_8_ = (double)uVar15 - dVar50;
    dVar52 = dVar54 * dVar88 - dVar82 * dVar126;
    dVar68 = dVar55 * dVar90 - dVar115 * dVar127;
    dStack_1ed0 = dVar31 - dVar52;
    dVar32 = dVar32 * -dVar126;
    local_1388 = dVar33 - dVar32;
    local_1360 = dVar34 - dVar32;
    local_1358 = dVar32 + dVar35;
    dVar53 = -dVar126 * dVar53;
    local_e18 = dVar69 + dVar53;
    local_e08 = dVar70 - dVar53;
    local_de0 = local_1e08 - dVar53;
    local_dd8 = dVar53 + local_1e48;
    local_1f28[3] = local_1f28[3] - dVar68;
    local_1f28[4] = dVar68 + dVar29 + dVar52;
    local_1f28[6] = local_1f28[6] - dVar52;
    auStack_1ef0 = (undefined1  [8])((double)auStack_1ef0 - dVar68);
    local_1ec8 = dVar52 + local_1ec8;
    dStack_1ec0 = dVar68 + dStack_1ec0;
    local_1450 = local_1450 - dVar67;
    dStack_1448 = dStack_1448 + dVar67;
    local_1400 = local_1400 + dVar67;
    local_1430 = local_1430 - dVar67;
    local_13a0._0_8_ = (double)local_13a0._0_8_ - dVar48;
    local_13a0._8_8_ = (double)uVar14 + dVar32 + dVar48;
    local_1350 = local_1350 + dVar48;
    dStack_1380 = dStack_1380 - dVar48;
    local_1190 = local_1190 - dVar56;
    local_1188 = local_1188 + dVar56;
    local_1140 = local_1140 + dVar56;
    dStack_1170 = dStack_1170 - dVar56;
    local_d70 = local_d70 - dVar27;
    local_d68 = local_d68 + dVar27;
    local_d20 = local_d20 + dVar27;
    local_d50 = local_d50 - dVar27;
    local_808[3] = local_808[3] - dVar51;
    local_808[4] = dVar71 + dVar50 + dVar51;
    local_808[6] = local_808[6] - dVar50;
    local_808[7] = local_808[7] - dVar51;
    local_7a8 = dVar50 + local_7a8;
    dStack_7a0 = dVar51 + dStack_7a0;
    local_1ce8._0_8_ = local_1de8[0];
    dVar50 = local_1de8[0] * local_1de8[7];
    dVar51 = exp(local_6f8);
    dVar48 = local_1de8[9];
    dVar29 = local_1de8[1];
    local_1938 = local_1de8[1] * local_1de8[9];
    local_1ae8 = exp(local_1698);
    dVar115 = local_808[9];
    dVar111 = local_808[7];
    dVar82 = local_808[1];
    dVar69 = local_1010;
    dVar68 = local_1040;
    dVar35 = local_1160;
    dVar33 = local_11a0;
    dVar32 = dStack_1580;
    dVar67 = local_1590;
    uVar14 = auStack_15c0._0_8_;
    dVar53 = local_15d0[1];
    dVar31 = local_1670;
    dVar34 = local_1de8[9];
    auVar7 = auStack_1ef0;
    local_1ac8 = dVar87 - ((h_RT[1] + h_RT[9]) - (h_RT[0] + h_RT[7])) * dVar47;
    RStack_1ac0 = 0.0;
    local_19b8 = local_1f28[0];
    local_1e48 = local_1f28[1];
    local_1698 = dStack_1ee0;
    local_6f8 = local_1680[1];
    local_1aa8._0_8_ = local_1640;
    local_1a98 = local_1630;
    local_1a88 = local_11a8;
    local_1d38 = dStack_1170;
    local_1e18 = (undefined1  [8])local_1048;
    local_1d08 = local_1000;
    local_1cf8 = local_808[0];
    dVar126 = exp(dVar49);
    local_1e08 = local_1de8[1];
    local_1ad8 = local_1de8[0x10];
    RStack_1ad0 = 0.0;
    dVar52 = local_1de8[1] * local_1de8[0x10];
    dVar70 = exp(dVar89);
    RVar10 = h_RT[9];
    RVar9 = h_RT[7];
    dVar27 = local_1ea8;
    auVar114._8_8_ = dVar70;
    auVar114._0_8_ = local_1ae8;
    dVar51 = dVar51 * 0.5;
    dVar126 = dVar126 * 40000000.0;
    auVar75._8_8_ = dVar126;
    auVar75._0_8_ = dVar51;
    auVar132 = divpd(auVar75,auVar114);
    local_16c8._8_8_ = auVar132._8_8_;
    dVar70 = -auVar132._0_8_;
    dVar71 = -(double)local_16c8._8_8_;
    dVar88 = dVar51 * dVar50 + local_1938 * dVar70;
    dVar55 = dVar87 * dVar51 * dVar50 - local_1ac8 * auVar132._0_8_ * local_1938;
    local_1f28[0] = local_19b8 - dVar88;
    local_1f28[1] = local_1e48 + dVar88;
    dStack_1ee0 = dVar88 + local_1698;
    dVar123 = dVar123 * dVar51;
    local_1680[1] = local_6f8 - dVar123;
    local_1670 = dVar31 + dVar123;
    local_1640 = (double)local_1aa8._0_8_ - dVar123;
    local_1630 = dVar123 + local_1a98;
    local_1ce8._0_8_ = (double)local_1ce8._0_8_ * dVar51;
    local_11a8 = local_1a88 - (double)local_1ce8._0_8_;
    dVar29 = dVar29 * dVar70;
    local_1048 = (double)local_1e18 - dVar29;
    dVar56 = dVar29 + local_1d08;
    local_808[0] = local_1cf8 - dVar55;
    dVar48 = dVar48 * dVar70;
    dVar31 = local_1ad8 * dVar71;
    local_15d0[1] = dVar53 - dVar48;
    auStack_15c0._0_8_ = (double)uVar14 + dVar48 + dVar31;
    local_1590 = (dVar67 - dVar48) - dVar31;
    dStack_1580 = (dVar32 + dVar48) - dVar31;
    local_1548 = local_1548 + dVar31;
    dVar48 = dVar126 * dVar34;
    local_11a0 = dVar33 + (double)local_1ce8._0_8_ + dVar48;
    local_16b8 = dVar52 * dVar71;
    local_1d38 = (local_1d38 - (double)local_1ce8._0_8_) - dVar48;
    local_1ce8._0_8_ = ((double)local_1ce8._0_8_ + dVar35) - dVar48;
    local_1128 = dVar48 + local_1128;
    local_19f8 = local_fc8;
    dVar71 = local_1e08 * dVar71;
    local_b70 = local_b70 + dVar71;
    local_b40 = local_b40 - dVar71;
    dStack_b30 = dStack_b30 - dVar71;
    local_708 = local_1e58 * dVar126;
    dStack_700 = dStack_1e50;
    local_af8 = dVar71 + local_af8;
    local_16c8._0_8_ =
         (double)local_16c8._8_8_ *
         (local_1e58 - ((h_RT[1] + h_RT[0x10]) - (h_RT[7] + h_RT[9])) * dVar47) * dVar52;
    local_1a08 = dStack_788;
    local_19c8 = local_1de8[10];
    dStack_19c0 = 0.0;
    local_1e48 = local_1f28[1];
    local_19e8 = dStack_1ee0;
    dStack_19e0 = dVar126;
    auStack_1ef0 = (undefined1  [8])((double)auVar7 - dVar88);
    local_1e08 = exp(local_668);
    dVar35 = local_1de8[9];
    local_1878 = exp(local_6e8);
    uVar14 = local_7b8._0_8_;
    dVar51 = local_1158;
    dVar48 = local_1de8[0x13];
    local_16a8 = local_1818 - ((RVar10 + RVar10) - (RVar9 + h_RT[10])) * dVar47;
    uStack_16a0 = uStack_1810;
    local_19d8._0_8_ = local_1ed8;
    local_19b8 = local_ff8;
    local_1698 = local_f60;
    local_668 = local_f50;
    local_6f8 = local_f48;
    local_1948 = local_1de8[7];
    uStack_1940 = 0;
    dVar31 = exp(dVar85);
    local_16d8._0_8_ = exp(local_6d8);
    dVar70 = local_930;
    dVar52 = local_10b8;
    RVar10 = h_RT[8];
    RVar9 = h_RT[7];
    local_16d8._8_8_ = extraout_XMM0_Qb_04;
    local_1938 = local_1e68 - ((h_RT[0x13] + h_RT[7]) - (h_RT[8] + h_RT[0x13])) * dVar47;
    RStack_1930 = dStack_1e60;
    local_1a98 = local_1168;
    local_1d08 = local_928;
    local_1cf8 = local_808[8];
    local_1a88 = local_1de8[0x14];
    dStack_1a80 = 0.0;
    local_1e08 = local_1e08 * 2.46;
    dStack_1e00 = dVar31 * 15000000.0;
    local_16e8 = local_1ee8;
    uStack_16e0 = 0;
    local_6e8 = dStack_1e00 * dVar48;
    dVar127 = local_10c0 + local_6e8;
    local_1ac8 = dStack_1e00;
    RStack_1ac0 = dStack_1e00;
    dStack_6e0 = dStack_1e00;
    local_1aa8._0_8_ = exp(dVar85);
    local_658 = exp(local_658);
    dVar72 = local_878;
    dVar71 = local_880;
    dVar32 = local_1de8[8];
    dVar123 = local_1de8[7];
    dVar54 = local_1e68 - ((h_RT[0x14] + RVar9) - (RVar10 + h_RT[0x14])) * dVar47;
    local_6d8 = local_1de8[3];
    dStack_6d0 = 0.0;
    local_1ae8 = exp(dVar49);
    dVar50 = local_1de8[0xb];
    dVar53 = local_1de8[4];
    dVar31 = local_1de8[1];
    local_1ad8 = local_1de8[1] * local_1de8[4];
    RStack_1ad0 = 0.0;
    dVar83 = exp((double)local_1e78);
    dVar33 = local_1de8[8];
    dVar67 = local_1de8[3];
    local_19a8 = local_19a8 * dVar83;
    local_1e18 = (undefined1  [8])
                 (local_1e58 -
                 (((h_RT[1] + h_RT[4] + h_RT[0xb]) - (h_RT[3] + h_RT[8])) + -1.0) * dVar47);
    uStack_1e10 = dStack_1e50;
    dVar34 = dVar34 * local_1de8[7];
    dVar83 = dVar126 * dVar34 + local_16b8;
    dVar84 = dVar34 * local_708 - (double)local_16c8._0_8_;
    local_1e78 = (undefined1  [8])local_1f28[3];
    local_1ea8 = dVar83 + dVar27;
    dVar126 = dVar126 * local_1de8[7];
    local_1040 = dVar68 + dVar29 + dVar126;
    local_fc8 = dVar126 + local_19f8;
    dStack_788 = dVar84 + local_1a08;
    auVar63._8_8_ = local_16d8._0_8_;
    auVar63._0_8_ = local_1878;
    auVar6._8_8_ = dStack_1e00;
    auVar6._0_8_ = local_1e08;
    auVar132 = divpd(auVar6,auVar63);
    dVar87 = auVar132._0_8_;
    dVar27 = local_1818 * local_1e08 * local_19c8 * local_1de8[7] -
             local_16a8 * dVar87 * dVar35 * dVar35;
    dVar89 = auVar132._8_8_;
    dVar34 = local_1e08 * local_19c8 * local_1de8[7] - dVar35 * dVar35 * dVar87;
    dVar68 = dStack_1e00 * dVar48 * local_1de8[8] - dVar48 * local_1948 * dVar89;
    dStack_1ee0 = dVar34 + dVar34 + (local_19e8 - dVar83);
    local_1ed8 = (undefined1  [8])((double)local_19d8._0_8_ - dVar34);
    dVar85 = local_19c8 * local_1e08;
    local_1158 = dVar51 - dVar85;
    local_1160 = dVar85 + dVar85 + (double)local_1ce8._0_8_;
    dVar35 = dVar87 * -2.0 * dVar35;
    local_1010 = ((dVar69 - dVar29) - dVar126) - dVar35;
    local_ff8 = local_19b8 - dVar35;
    local_1000 = dVar35 + dVar35 + (dVar56 - dVar126);
    dVar29 = local_1e08 * local_1948;
    local_f60 = local_1698 - dVar29;
    local_f48 = local_6f8 - dVar29;
    local_f50 = dVar29 + dVar29 + local_668;
    local_7b8._0_8_ = (double)uVar14 - dVar27;
    local_808[9] = dVar27 + dVar27 + ((dVar55 + dVar115) - dVar84);
    dVar56 = dVar48 * local_1de8[8] * local_1e68 * local_1ac8 -
             dVar48 * local_1948 * dVar89 * local_1938;
    dVar48 = dVar48 * -dVar89;
    local_928 = local_1ac8 * local_1de8[8] + -dVar89 * local_1948;
    auVar76._8_8_ = local_19a8;
    auVar76._0_8_ = local_658;
    dVar115 = (double)local_1aa8._0_8_ * 9000000.0;
    dVar126 = local_1ae8 * 28000000.0;
    auVar121._8_8_ = dVar126;
    auVar121._0_8_ = dVar115;
    auVar132 = divpd(auVar121,auVar76);
    dVar35 = dVar32 * local_6d8;
    dVar87 = auVar132._0_8_;
    dVar89 = auVar132._8_8_;
    dVar51 = dVar115 * local_1a88 * local_1de8[8] - local_1a88 * local_1948 * dVar87;
    dVar69 = dVar126 * dVar35 - dVar50 * local_1ad8 * dVar89;
    local_930 = dVar70 + local_928;
    local_928 = local_1d08 - local_928;
    dVar29 = local_1e68 * dVar115 * local_1a88 * local_1de8[8] -
             dVar54 * dVar87 * local_1a88 * local_1948;
    dVar70 = -dVar89;
    local_1168 = local_1a88 * -dVar87;
    dStack_1170 = (local_1d38 - dVar85) + dVar48 + local_1168;
    local_1168 = (local_1a98 - dVar48) - local_1168;
    local_10c0 = dVar127 + dVar115 * local_1a88;
    local_878 = local_1de8[8] * dVar115 + dVar123 * -dVar87;
    local_880 = dVar71 + local_878;
    local_878 = dVar72 - local_878;
    local_808[7] = (((dVar111 - dVar55) - dVar84) - dVar27) + dVar56 + dVar29;
    dVar27 = ((local_16e8 - dVar68) - dVar51) - dVar69;
    dVar48 = dVar35 * local_1e58 * dVar126 - dVar50 * local_1ad8 * dVar89 * (double)local_1e18;
    local_1f28[1] = local_1e48 + dVar83 + dVar69;
    local_1f28[3] = local_1f28[3] - dVar69;
    local_1f28[4] = local_1f28[4] + dVar69;
    unique0x10005e5c = SUB84(dVar27,0);
    auStack_1ef0 = (undefined1  [8])
                   (((((double)auVar7 - dVar88) - dVar83) - dVar34) + dVar68 + dVar51);
    unique0x10005e60 = (int)((ulong)dVar27 >> 0x20);
    dStack_1ed0 = dStack_1ed0 + dVar69;
    dVar27 = dVar53 * dVar70 * dVar50;
    auStack_15c0._0_8_ = (double)auStack_15c0._0_8_ + dVar27;
    local_15b0 = local_15b0 - dVar27;
    dStack_15a8 = dStack_15a8 + dVar27;
    local_1588 = local_1588 - dVar27;
    local_1570 = dVar27 + local_1570;
    dVar32 = dVar32 * dVar126;
    local_1460 = local_1460 + dVar32;
    local_1450 = local_1450 - dVar32;
    dStack_1448 = dStack_1448 + dVar32;
    local_1428 = local_1428 - dVar32;
    local_1410 = dVar32 + local_1410;
    dVar50 = dVar31 * dVar70 * dVar50;
    local_13b0 = local_13b0 + dVar50;
    local_13a0._0_8_ = (double)local_13a0._0_8_ - dVar50;
    local_13a0._8_8_ = (double)local_13a0._8_8_ + dVar50;
    local_1378 = local_1378 - dVar50;
    local_1360 = dVar50 + local_1360;
    dVar126 = dVar126 * local_1de8[3];
    local_10f0 = local_10f0 + dVar126;
    local_10e0 = local_10e0 - dVar126;
    local_10d8 = local_10d8 + dVar126;
    local_10b8 = ((dVar52 - local_6e8) - dVar115 * local_1a88) - dVar126;
    local_10a0 = dVar126 + local_10a0;
    dVar27 = local_1de8[1] * dVar70 * local_1de8[4];
    local_ee0 = local_ee0 + dVar27;
    local_ed0 = local_ed0 - dVar27;
    local_ec8 = local_ec8 + dVar27;
    local_ea8 = local_ea8 - dVar27;
    dStack_e90 = dVar27 + dStack_e90;
    local_808[1] = dVar82 + dVar55 + dVar84 + dVar48;
    local_808[3] = local_808[3] - dVar48;
    local_808[4] = local_808[4] + dVar48;
    local_808[8] = ((local_1cf8 - dVar56) - dVar29) - dVar48;
    local_7b8._8_8_ = dVar48 + (double)local_7b8._8_8_;
    local_16a8 = exp(dVar49);
    local_19f8 = local_1de8[5];
    dStack_19f0 = 0.0;
    local_19e8 = local_1de8[0xb];
    dStack_19e0 = 0.0;
    local_1a08 = exp(dVar102);
    uVar15 = local_7b8._8_8_;
    dVar54 = local_808[8];
    dVar83 = local_808[5];
    dVar127 = local_808[3];
    dVar82 = dStack_e90;
    dVar71 = local_ea8;
    dVar69 = local_ec0;
    dVar68 = local_ed0;
    dVar111 = local_10b8;
    dVar50 = local_1428;
    dVar31 = local_1de8[8];
    dVar29 = dStack_1ed0;
    dVar48 = local_1f28[3];
    local_1878 = local_1e58 - ((h_RT[5] + h_RT[0xb]) - (h_RT[3] + h_RT[8])) * dVar47;
    dStack_1870 = dStack_1e50;
    local_1e08 = local_1f28[5];
    local_19d8._0_8_ = local_1450;
    local_19c8 = local_1440;
    local_1ae8 = local_1410;
    local_1ac8 = local_12f0;
    local_1ad8 = local_12e0;
    local_19b8 = local_12c8;
    local_1938 = local_12b0;
    local_1ce8._8_8_ = 0;
    local_1ce8._0_8_ = local_1de8[0];
    local_1d08 = local_1de8[3];
    local_1698 = local_10e0;
    local_1cf8 = local_10d0;
    local_1818 = local_10a0;
    local_1e78 = (undefined1  [8])exp(dVar49);
    local_1d38 = local_1de8[1];
    dStack_1d30 = 0.0;
    local_6f8 = local_1de8[9];
    uStack_6f0 = 0;
    dVar87 = exp(local_1e28);
    dVar126 = local_1000;
    dVar115 = local_1008;
    dVar72 = local_1048;
    dVar70 = local_10f8;
    dVar52 = dStack_1580;
    uVar14 = auStack_15c0._0_8_;
    dVar32 = local_1638;
    dVar34 = local_1de8[5];
    dVar123 = dStack_1ee0;
    dVar88 = h_RT[0] + h_RT[8];
    dVar90 = h_RT[1] + h_RT[9];
    local_6e8 = local_1f28[0];
    local_668 = local_1f28[1];
    local_6d8 = local_1680[1];
    local_658 = local_1670;
    local_1aa8._0_8_ = local_1630;
    local_1a98 = local_15d0[1];
    local_1a88 = local_1588;
    local_1e68 = local_10f0;
    local_1e18 = (undefined1  [8])local_10b0;
    local_1e28 = local_1040;
    local_1e48 = local_808[0];
    local_19a8 = local_808[1];
    local_1948 = exp(dVar49);
    local_16b8 = local_1de8[7];
    uStack_16b0 = 0;
    auVar44._0_8_ = exp((((double)uVar8 - (double)uVar8) - dStack_1bc0) + local_1bc8);
    RVar9 = h_RT[8];
    dVar51 = local_1de8[9];
    dVar35 = local_1de8[8];
    auVar44._8_8_ = local_1a08;
    dVar53 = local_1948 * 30000000.0;
    dVar27 = local_16a8 * 12000000.0;
    auVar64._8_8_ = dVar27;
    auVar64._0_8_ = dVar53;
    auVar132 = divpd(auVar64,auVar44);
    dVar55 = auVar132._0_8_;
    dVar56 = auVar132._8_8_;
    local_1410 = dVar27 * dVar33;
    local_1450 = (double)local_19d8._0_8_ - local_1410;
    local_1440 = local_19c8 + local_1410;
    local_1428 = dVar50 - local_1410;
    local_1410 = local_1410 + local_1ae8;
    dVar84 = local_19e8 * -dVar56;
    local_12f0 = local_1ac8 - dVar84;
    local_12e0 = local_1ad8 + dVar84;
    local_12b0 = dVar84 + local_1938;
    dVar129 = dVar27 * local_1d08;
    local_10e0 = local_1698 - dVar129;
    local_10d0 = local_1cf8 + dVar129;
    local_10a0 = dVar129 + local_1818;
    dStack_e90 = local_19f8 * -dVar56;
    local_ed0 = dVar68 - dStack_e90;
    local_ec0 = dVar69 + dStack_e90;
    local_ea8 = dVar71 - dStack_e90;
    dStack_e90 = dStack_e90 + dVar82;
    dVar50 = -dVar55 * dVar34;
    dStack_1170 = dStack_1170 + dVar50;
    local_1168 = local_1168 - dVar50;
    local_10c0 = local_10c0 + dVar34 * dVar53;
    RStack_1930 = dVar33 * dVar67;
    dVar103 = RStack_1930 * local_1e58 * dVar27 - local_19e8 * local_19f8 * dVar56 * local_1878;
    local_1698 = dVar53 * local_1de8[8] * dVar34 - dVar34 * local_16b8 * dVar55;
    dStack_1690 = dVar27 * RStack_1930 - local_19e8 * local_19f8 * dVar56;
    local_1f28[3] = dVar48 - dStack_1690;
    local_1f28[5] = local_1e08 + dStack_1690;
    dStack_1ed0 = dStack_1690 + dVar29;
    local_808[3] = dVar127 - dVar103;
    local_808[5] = dVar83 + dVar103;
    local_7b8._8_8_ = dVar103 + (double)uVar15;
    auStack_1ef0 = (undefined1  [8])((double)auStack_1ef0 + local_1698);
    dVar127 = local_1ee8 - dStack_1690;
    local_1938 = local_1de8[8] * dVar34 * local_1e58 * dVar53 -
                 dVar55 * (local_1e58 - ((h_RT[5] + h_RT[7]) - (h_RT[5] + h_RT[8])) * dVar47) *
                 dVar34 * local_16b8;
    dVar27 = dVar53 * local_1de8[8] + local_16b8 * -dVar55;
    local_12c8 = (local_19b8 - dVar84) - dVar27;
    local_12d0 = dVar27 + local_12d0;
    local_808[7] = local_808[7] + local_1938;
    local_10b8 = dVar111 - dVar129;
    local_808[8] = dVar54 - dVar103;
    local_1ee8 = dVar127;
    local_2128._0_8_ = exp(dVar104);
    dVar71 = local_1de8[0x10];
    local_1e08 = local_1de8[1];
    dStack_1e00 = 0.0;
    dVar89 = exp(dVar105);
    dVar102 = dStack_788;
    dVar85 = local_af8;
    dVar84 = dStack_b30;
    dVar56 = local_b38;
    dVar55 = local_b70;
    dVar82 = local_1548;
    dVar68 = local_1de8[10];
    dVar50 = local_1de8[8];
    local_1818 = dVar112 - ((h_RT[1] + h_RT[0x10]) - (RVar9 + h_RT[9])) * dVar47;
    uStack_1810 = 0;
    local_1d08 = local_1078;
    local_1cf8 = local_fc8;
    dVar27 = exp(dVar104);
    dVar33 = local_1de8[9];
    dVar48 = exp(local_578);
    dVar69 = local_1de8[0xb];
    dVar67 = local_1de8[8];
    local_578 = h_RT[8];
    auVar77._8_8_ = dVar48;
    auVar77._0_8_ = dVar87;
    local_1e78 = (undefined1  [8])((double)local_1e78 * 70000000.0);
    uStack_1e70 = dVar27 * 16000000.0;
    auVar45._8_8_ = uStack_1e70;
    auVar45._0_8_ = local_1e78;
    auVar132 = divpd(auVar45,auVar77);
    dVar48 = auVar132._0_8_;
    dVar83 = auVar132._8_8_;
    local_1630 = (double)local_1e78 * dVar31;
    dVar31 = dVar31 * (double)local_1ce8._0_8_;
    dVar104 = dVar68 * dVar50;
    dVar105 = (double)local_1e78 * dVar31 - local_6f8 * local_1d38 * dVar48;
    local_1f28[0] = local_6e8 - dVar105;
    local_1f28[1] = local_668 + dVar105;
    local_1680[1] = local_6d8 - local_1630;
    local_1670 = local_658 + local_1630;
    local_1638 = dVar32 - local_1630;
    local_1630 = local_1630 + (double)local_1aa8._0_8_;
    dStack_1a90 = -dVar83;
    dVar27 = local_6f8 * -dVar48;
    local_15d0[1] = local_1a98 - dVar27;
    local_1a88 = local_1a88 - dVar27;
    dStack_1a80 = dVar27 + dVar52;
    dVar135 = (double)local_1ce8._0_8_ * (double)local_1e78;
    dVar29 = uStack_1e70 * dVar50;
    local_f58 = local_f58 - dVar29;
    local_f48 = local_f48 - dVar29;
    local_f50 = dVar29 + dVar29 + local_f50;
    local_10f8 = dVar70 - dVar135;
    local_1e68 = local_1e68 + dVar135;
    local_10b0 = dVar135 + (double)local_1e18;
    dVar130 = -dVar48 * local_1d38;
    local_1048 = dVar72 - dVar130;
    local_1e28 = local_1e28 + dVar130;
    local_1a98 = dVar130 + dVar126;
    dVar29 = local_1e58 * (double)local_1e78 * dVar31 -
             (local_1e58 - (dVar90 - dVar88) * dVar47) * dVar48 * local_6f8 * local_1d38;
    dVar48 = dVar112 * uStack_1e70 * dVar104 -
             (dVar112 - ((h_RT[9] + h_RT[9]) - (h_RT[10] + h_RT[8])) * dVar47) * dVar83 *
             dVar33 * dVar33;
    local_808[0] = local_1e48 - dVar29;
    dVar117 = (dVar127 - dVar105) - local_1698;
    local_19a8 = local_19a8 + dVar29;
    dVar120 = ((dVar54 - dVar103) - dVar29) - local_1938;
    dVar29 = local_808[9] + dVar29;
    local_7b8._0_8_ = (double)local_7b8._0_8_ - dVar48;
    dVar68 = uStack_1e70 * dVar68;
    local_10a8 = local_10a8 - dVar68;
    local_1aa8._0_8_ = dVar83 * -2.0 * dVar33;
    local_1aa8._8_8_ = dVar83;
    local_ff8 = local_ff8 - (double)local_1aa8._0_8_;
    unique0x10004bec = SUB84(dVar48,0);
    local_1e18 = (undefined1  [8])dVar48;
    unique0x10004bf0 = (int)((ulong)dVar48 >> 0x20);
    dVar48 = local_1de8[8] * local_1de8[0xb];
    dStack_1ee0 = dVar105 + dVar123;
    local_1588 = local_1a88;
    dStack_1580 = dStack_1a80;
    local_10f0 = local_1e68;
    local_1040 = local_1e28;
    local_1008 = dVar115 - dVar130;
    local_1000 = local_1a98;
    local_808[1] = local_19a8;
    local_808[9] = dVar29;
    auStack_15c0._0_8_ = (double)uVar14 + dVar27;
    local_1ce8._0_8_ = local_10b0;
    dVar126 = exp(dVar49);
    dVar126 = dVar126 * 9000000.0;
    local_1d38 = local_1de8[7];
    dStack_1d30 = 0.0;
    local_1e48 = local_1de8[7] * dVar69;
    dStack_1e40 = 0.0;
    dVar31 = exp(local_1e38);
    dVar31 = dVar126 / dVar31;
    local_1e38 = h_RT[7];
    dStack_1e30 = 0.0;
    dVar128 = dVar126 * dVar48 - local_1e48 * dVar31;
    local_658 = local_1e58 * dVar126 * dVar48 -
                (local_1e58 - ((h_RT[0xb] + h_RT[7]) - (local_578 + h_RT[0xb])) * dVar47) * dVar31 *
                local_1e48;
    dStack_650 = dStack_1e50;
    dVar106 = (double)auStack_1ef0 + dVar128;
    local_6d8 = dStack_1170 + -dVar31 * dVar69;
    local_668 = local_1168 - -dVar31 * dVar69;
    local_1e48 = local_10c0 + dVar69 * dVar126;
    dVar48 = dVar126 * dVar67 - dVar31 * local_1d38;
    local_eb0 = local_eb0 + dVar48;
    local_ea8 = local_ea8 - dVar48;
    local_578 = local_808[7] + local_658;
    uStack_570 = 0;
    dVar127 = exp(dVar49);
    local_6e8 = exp(dVar26);
    dVar72 = local_df8;
    dVar32 = local_1de8[8];
    local_1ad8 = h_RT[8];
    local_1698 = local_e00;
    local_1ae8 = exp(dVar49);
    dVar31 = local_1de8[0xe];
    dVar26 = exp(dVar116);
    dVar52 = local_1de8[9];
    local_1ac8 = local_ea8;
    local_19b8 = dStack_e88;
    local_1938 = local_c98;
    local_6f8 = local_c78;
    dVar70 = local_1e38 + h_RT[0xc];
    dVar127 = dVar127 * 7000000.0;
    RStack_1ad0 = local_1ae8 * 14000000.0;
    auVar122._8_8_ = dVar26;
    auVar122._0_8_ = local_6e8;
    auVar110._8_8_ = RStack_1ad0;
    auVar110._0_8_ = dVar127;
    auVar132 = divpd(auVar110,auVar122);
    dVar88 = local_1de8[0xb] * dVar31;
    dVar48 = local_1de8[0xc] * dVar32;
    dVar32 = RStack_1ad0 * dVar32;
    dVar26 = auVar132._0_8_;
    dVar87 = auVar132._8_8_;
    local_19c8 = -dVar26;
    dStack_19c0 = -dVar87;
    local_1e38 = dVar127 * dVar67 * local_1de8[0xc] - local_1de8[0xc] * local_1d38 * dVar26;
    dStack_1e30 = RStack_1ad0 * dVar48 - dVar88 * dVar87;
    dVar31 = dVar31 * dStack_19c0;
    dVar54 = local_1de8[0xb] * dStack_19c0;
    local_19f8 = local_1de8[0xc];
    dStack_19f0 = local_1de8[0xc];
    local_6e8 = dVar127 * local_1de8[0xc];
    local_10c0 = local_1e48 + local_6e8;
    dVar26 = dVar92 * dVar127 * dVar67 * local_1de8[0xc] -
             (dVar92 - (dVar70 - (h_RT[0xc] + local_1ad8)) * dVar47) * dVar26 *
             local_1de8[0xc] * local_1d38;
    dVar48 = dVar92 * RStack_1ad0 * dVar48 -
             (dVar92 - ((h_RT[0xe] + h_RT[0xb]) - (h_RT[0xc] + local_1ad8)) * dVar47) * dVar87 *
             dVar88;
    auVar4._8_4_ = SUB84(dVar48,0);
    auVar4._0_8_ = dVar26;
    auVar4._12_4_ = (int)((ulong)dVar48 >> 0x20);
    local_1ad8 = RStack_1ad0 * local_1de8[0xc];
    local_10a0 = local_10a0 + local_1ad8;
    local_1098 = local_1098 - local_1ad8;
    local_1088 = local_1088 + local_1ad8;
    local_19d8._8_4_ = SUB84(RStack_1ad0,0);
    local_19d8._0_8_ = dVar32;
    local_19d8._12_4_ = (int)((ulong)RStack_1ad0 >> 0x20);
    local_de0 = local_de0 + dVar32;
    local_dd8 = local_dd8 - dVar32;
    local_dc8 = local_dc8 + dVar32;
    local_7b8._8_8_ = (double)local_7b8._8_8_ + dVar48;
    local_7a8 = local_7a8 - dVar48;
    local_16b8 = dStack_1ed0 + dStack_1e30;
    local_16a8 = dStack_e90 + dVar31;
    local_1a08 = local_e78 + dVar31;
    local_19e8 = local_c80 + dVar54;
    dVar32 = local_c68 + dVar54;
    local_1ae8 = local_1de8[3];
    local_1e48 = local_1de8[3] * local_1de8[9];
    dStack_1e40 = 0.0;
    local_1948 = local_1ec8;
    local_1878 = dStack_1e30;
    dStack_1870 = dStack_1e30;
    dStack_6e0 = RStack_1ad0;
    dVar87 = exp(local_1828);
    dVar70 = local_1de8[0xf];
    dStack_1170 = local_6d8 + local_19f8 * local_19c8;
    local_1168 = local_668 - local_19f8 * local_19c8;
    dVar48 = dVar127 * dVar67 + local_19c8 * local_1d38;
    local_e00 = local_1698 + dVar48;
    dStack_1ed0 = local_16b8;
    local_1ec8 = local_1948 - local_1878;
    local_ea8 = local_1ac8 - dVar31;
    dStack_e90 = local_16a8;
    dStack_e88 = local_19b8 - dVar31;
    local_e78 = local_1a08;
    local_df8 = (dVar72 - dVar48) - (double)local_19d8._0_8_;
    local_c98 = local_1938 - dVar54;
    dVar87 = dVar87 * 26750000.0;
    local_c80 = local_19e8;
    local_1d38 = local_1de8[2];
    local_c78 = local_6f8 - dVar54;
    dVar127 = local_1de8[2] * local_1de8[0xf];
    dVar48 = local_648 * dVar87;
    local_c68 = dVar32;
    dVar72 = exp(local_1d28);
    dVar32 = dStack_1e30;
    dVar67 = local_1f28[2];
    dVar31 = local_1f28[1];
    dVar72 = dVar87 / dVar72;
    dVar92 = dVar48 * local_1e48 -
             (local_648 - ((h_RT[0xf] + h_RT[2]) - (h_RT[9] + h_RT[3])) * dVar47) * dVar72 * dVar127
    ;
    dStack_1d30 = (double)(extraout_XMM0_Qb_05 ^ 0x8000000000000000);
    dVar103 = local_1e48 * dVar87 - dVar127 * dVar72;
    dVar104 = dVar104 * uStack_1e70 - dVar33 * dVar33 * dVar83;
    dVar116 = local_1f28[3] - dVar103;
    dVar70 = dVar70 * -dVar72;
    dVar52 = dVar52 * dVar87;
    dVar87 = dVar87 * local_1ae8;
    local_1d38 = -dVar72 * local_1d38;
    dStack_2070 = auVar4._8_8_;
    local_1e78 = (undefined1  [8])dStack_2070;
    local_6d8 = dVar51;
    dStack_6d0 = dVar51;
    local_1828 = local_1e08 * dVar71;
    uStack_1820 = dStack_1e00;
    local_1e48 = dVar103;
    dStack_1e40 = dVar104;
    uStack_1e70 = dVar92;
    local_1d28 = exp(local_6c8);
    dVar88 = exp(local_1d18);
    local_1d18 = local_1de8[9];
    dStack_1d10 = 0.0;
    local_648 = local_1de8[9] * local_1de8[9];
    dStack_640 = 0.0;
    local_2128._8_8_ = exp(local_248);
    dVar72 = local_1de8[0x11];
    dVar33 = local_1de8[1];
    local_2128._0_8_ = (double)local_2128._0_8_ * 12000000.0;
    local_2128._8_8_ = (double)local_2128._8_8_ * 4990000.0;
    dVar48 = local_6d8 * (double)local_2128._0_8_;
    local_1078 = local_1d08 + dVar48;
    dVar50 = dVar50 * (double)local_2128._0_8_;
    local_fc8 = local_1cf8 + dVar50;
    local_10f0 = local_1e68 + dVar48;
    local_1040 = local_1e28 + dVar50;
    local_10b0 = dVar68 + dVar68 + ((double)local_1ce8._0_8_ - dVar48);
    local_1008 = ((dVar115 - dVar130) - dVar50) - (double)local_1aa8._0_8_;
    local_1000 = (double)local_1aa8._0_8_ + (double)local_1aa8._0_8_ + (local_1a98 - dVar50);
    local_10b8 = (((((((dVar111 - dVar129) - dVar135) - dVar34 * dVar53) - dVar48) - dVar68) -
                  dVar69 * dVar126) - local_6e8) - local_1ad8;
    dVar90 = local_1de8[1] * local_1de8[0x11];
    dVar86 = exp(dVar86);
    dVar54 = local_c68;
    dVar83 = local_c90;
    dVar127 = local_cb8;
    dVar126 = local_cc0;
    dVar115 = local_1028;
    dVar111 = local_1370;
    dVar69 = local_13f8;
    RVar11 = h_RT[0xe];
    RVar10 = h_RT[4];
    RVar9 = h_RT[3];
    dVar68 = local_1de8[0xe];
    dVar50 = local_1de8[0xd];
    dVar34 = local_1de8[9];
    dVar48 = local_1de8[4];
    dVar53 = local_1de8[3];
    auVar78._8_8_ = dVar86;
    auVar78._0_8_ = dVar89;
    auVar132 = divpd(local_2128,auVar78);
    dVar86 = auVar132._0_8_;
    dVar112 = dVar112 * (double)local_2128._0_8_ * dVar35 * dVar51 -
              local_1818 * dVar86 * local_1828;
    dVar89 = auVar132._8_8_;
    dVar71 = dVar71 * -dVar86;
    local_1588 = local_1a88 - dVar71;
    local_1548 = dVar82 + dVar71;
    local_1e08 = local_1e08 * -dVar86;
    local_b70 = dVar55 + local_1e08;
    local_b38 = dVar56 - local_1e08;
    dStack_b30 = dVar84 - local_1e08;
    local_af8 = local_1e08 + dVar85;
    dStack_788 = dVar102 + dVar112;
    local_808[1] = local_19a8 + dVar112;
    local_808[7] = local_578 + dVar26;
    local_808[8] = ((((dVar120 - dVar112) - (double)local_1e18) - local_658) - dVar26) - dStack_2070
    ;
    dVar26 = dVar35 * dVar51 * (double)local_2128._0_8_ - local_1828 * dVar86;
    dVar82 = local_648 * (double)local_2128._8_8_ - dVar90 * dVar89;
    local_1ee8 = ((((dVar117 - dVar26) - dVar104) - dVar128) - local_1e38) - dStack_1e30;
    auStack_1ef0 = (undefined1  [8])(dVar106 + local_1e38);
    local_1f28[2] = local_1e48 + dVar67;
    dStack_1ee0 = (dVar104 + dVar104 + ((dVar105 + dVar123) - dVar26)) - local_1e48;
    local_1ed8 = (undefined1  [8])((double)local_1ed8 - dStack_1e40);
    local_1eb8 = dVar32 + local_1eb8;
    dStack_1eb0 = dVar103 + dStack_1eb0;
    dStack_1508 = dStack_1508 + dVar70;
    local_1500 = local_1500 - dVar70;
    local_14d0 = local_14d0 - dVar70;
    local_14a0 = dVar70 + local_14a0;
    dStack_1458 = dStack_1458 + dVar52;
    dVar70 = local_1450 - dVar52;
    dVar67 = local_1420 - dVar52;
    local_13f0 = dVar52 + local_13f0;
    local_1038 = local_1038 + dVar87;
    dVar32 = local_1030 - dVar87;
    dVar35 = local_1000 - dVar87;
    local_fd0 = dVar87 + local_fd0;
    local_c18 = local_c18 + local_1d38;
    local_c10 = local_c10 - local_1d38;
    local_be0 = local_be0 - local_1d38;
    local_bb0 = local_1d38 + local_bb0;
    local_808[2] = local_808[2] + dVar92;
    local_19a8 = local_808[3] - dVar92;
    dVar92 = ((double)local_1e18 + (double)local_1e18 + (dVar29 - dVar112)) - dVar92;
    dStack_798 = (double)local_1e78 + dStack_798;
    dStack_790 = uStack_1e70 + dStack_790;
    local_1e08 = h_RT[9];
    dStack_1e00 = 0.0;
    local_1ce8._0_8_ = local_1f28[4];
    local_1d38 = dStack_1448;
    local_1868 = local_1868 * (double)local_2128._8_8_ * local_648 -
                 dVar89 * (local_1868 - ((h_RT[1] + h_RT[0x11]) - (h_RT[9] + h_RT[9])) * dVar47) *
                 dVar90;
    local_1f28[1] = dVar26 + dVar31 + dVar82;
    local_1ea8 = dVar26 + local_1ea8;
    dStack_1ea0 = dVar82 + dStack_1ea0;
    dVar72 = dVar72 * -dVar89;
    local_1e78 = (undefined1  [8])local_13a0._0_8_;
    local_1e28 = (double)local_13a0._8_8_;
    local_1e38 = local_1348;
    local_1e48 = local_808[4];
    auStack_15c0._0_8_ = dVar71 + (double)uVar14 + dVar27 + dVar72;
    dStack_1580 = (dStack_1a80 - dVar71) - (dVar72 + dVar72);
    local_1540 = dVar72 + local_1540;
    dVar51 = ((double)local_2128._8_8_ + (double)local_2128._8_8_) * local_1d18;
    local_1040 = local_1040 + dVar51;
    local_fc0 = local_fc0 + dVar51;
    dVar33 = dVar33 * -dVar89;
    local_ac0 = local_ac0 + dVar33;
    local_a80 = local_a80 - (dVar33 + dVar33);
    local_a40 = dVar33 + local_a40;
    local_808[1] = local_808[1] + local_1868;
    dStack_780 = dStack_780 + local_1868;
    local_1d18 = local_1d18 * local_1de8[0xd];
    dStack_1d10 = local_1de8[9] * local_1de8[3];
    local_1f28[3] = dVar116;
    local_1e68 = dStack_1ee0;
    local_1030 = dVar32;
    local_1000 = dVar35;
    local_808[3] = local_19a8;
    local_808[9] = dVar92;
    dVar26 = exp(dVar49);
    dVar29 = local_1de8[0xb];
    dVar27 = local_1de8[10];
    dVar31 = local_1de8[0xb] * local_1de8[10];
    dVar123 = dVar68 * dVar48;
    auVar46._0_8_ = exp(local_6b8);
    auVar46._8_8_ = dVar88;
    dVar26 = dVar26 * 26480000.0;
    local_1d28 = local_1d28 * 36000.0;
    auVar65._8_8_ = local_1d28;
    auVar65._0_8_ = dVar26;
    auVar132 = divpd(auVar65,auVar46);
    dVar34 = local_1d28 * dVar34;
    local_1450 = dVar70 - dVar34;
    dStack_1448 = local_1d38 + dVar34;
    local_1420 = dVar67 - dVar34;
    local_13f8 = dVar34 + dVar69;
    dVar50 = dVar50 * dVar26;
    dVar53 = dVar53 * local_1d28;
    local_1030 = dVar32 - dVar53;
    local_1028 = dVar115 + dVar53;
    dVar67 = auVar132._0_8_;
    dVar32 = auVar132._8_8_;
    dVar33 = local_1e58 * dVar26 * local_1d18 -
             (local_1e58 - ((h_RT[0xb] + h_RT[10]) - (local_1e08 + h_RT[0xd])) * dVar47) * dVar67 *
             dVar31;
    dVar34 = dStack_1e50 * local_1d28 * dStack_1d10 -
             (dStack_1e50 - ((RVar11 + RVar10) - (local_1e08 + RVar9)) * dVar47) * dVar32 * dVar123;
    local_808[3] = local_19a8 - dVar34;
    local_808[4] = local_1e48 + dVar34;
    dVar31 = local_1d18 * dVar26 - dVar31 * dVar67;
    dVar123 = dStack_1d10 * local_1d28 - dVar123 * dVar32;
    local_1f28[3] = dVar116 - dVar123;
    local_1f28[4] = (double)local_1ce8._0_8_ + dVar123;
    dVar68 = dVar68 * -dVar32;
    local_13a0._8_8_ = local_1e28 + dVar68;
    local_13a0._0_8_ = (double)local_1e78 - dVar68;
    local_1370 = dVar111 - dVar68;
    local_1348 = dVar68 + local_1e38;
    dVar48 = dVar48 * -dVar32;
    local_cc0 = dVar126 - dVar48;
    local_cb8 = dVar127 + dVar48;
    local_c90 = dVar83 - dVar48;
    local_c68 = dVar48 + dVar54;
    local_1ed8 = (undefined1  [8])(dVar31 + (double)local_1ed8);
    dStack_1ed0 = dVar31 + dStack_1ed0;
    dStack_1ee0 = ((local_1e68 - dVar123) - (dVar82 + dVar82)) - dVar31;
    dStack_1ec0 = dStack_1ec0 - dVar31;
    local_1eb8 = dVar123 + local_1eb8;
    local_ff8 = dVar50 + local_ff8;
    dStack_ff0 = dVar50 + dStack_ff0;
    local_1000 = ((dVar35 - dVar53) - (dVar51 + dVar51)) - dVar50;
    local_fe0 = local_fe0 - dVar50;
    dStack_fd8 = dVar53 + dStack_fd8;
    dVar29 = dVar29 * -dVar67;
    local_f50 = local_f50 - dVar29;
    local_f48 = dVar29 + local_f48;
    dStack_f40 = dVar29 + dStack_f40;
    local_f30 = local_f30 - dVar29;
    dVar27 = -dVar67 * dVar27;
    local_ea0 = local_ea0 - dVar27;
    local_e98 = dVar27 + local_e98;
    dStack_e90 = dVar27 + dStack_e90;
    local_e80 = local_e80 - dVar27;
    dVar26 = dVar26 * local_1de8[9];
    local_1e58 = local_d40 - dVar26;
    dVar29 = local_d38 + dVar26;
    local_d30 = local_d30 + dVar26;
    dVar26 = local_d20 - dVar26;
    local_808[9] = ((dVar92 - dVar34) - (local_1868 + local_1868)) - dVar33;
    local_7b8._0_8_ = dVar33 + (double)local_7b8._0_8_;
    local_7b8._8_8_ = dVar33 + (double)local_7b8._8_8_;
    dStack_7a0 = dStack_7a0 - dVar33;
    dStack_798 = dVar34 + dStack_798;
    local_1d28 = local_1de8[0xe];
    dVar123 = local_1de8[9] * local_1de8[0xe];
    dVar31 = exp((double)local_1df8._0_8_ * 2.81 + dVar47 * -2948.8496616156594);
    dVar48 = local_1de8[0xd];
    dVar27 = local_1de8[10];
    dVar31 = dVar31 * 0.00332;
    dVar67 = dVar47 * 2.81 + dVar28 * 2948.8496616156594;
    dVar28 = local_1de8[10] * local_1de8[0xd];
    dVar53 = exp((local_1838 - local_1848) + local_1918);
    dVar32 = local_1de8[0x12];
    dVar53 = dVar31 / dVar53;
    local_1d18 = dVar31 * dVar123 - dVar28 * dVar53;
    dVar71 = dVar67 * dVar31 * dVar123 -
             (dVar67 - ((h_RT[10] + h_RT[0xd]) - (h_RT[9] + h_RT[0xe])) * dVar47) * dVar53 * dVar28;
    dStack_1d10 = 0.0;
    dStack_1ee0 = dStack_1ee0 - local_1d18;
    local_1ed8 = (undefined1  [8])((double)local_1ed8 + local_1d18);
    dStack_1ec0 = dStack_1ec0 + local_1d18;
    dVar28 = local_1d28 * dVar31;
    local_1000 = local_1000 - dVar28;
    local_ff8 = local_ff8 + dVar28;
    dStack_fd8 = dStack_fd8 - dVar28;
    local_fe0 = dVar28 + local_fe0;
    dVar48 = dVar48 * -dVar53;
    local_f50 = local_f50 - dVar48;
    local_f48 = local_f48 + dVar48;
    local_f30 = local_f30 + dVar48;
    local_f28 = local_f28 - dVar48;
    dVar27 = -dVar53 * dVar27;
    local_d40 = local_1e58 - dVar27;
    local_d38 = dVar29 + dVar27;
    local_d20 = dVar26 + dVar27;
    local_d18 = local_d18 - dVar27;
    local_1d38 = local_1de8[9];
    dStack_1d30 = 0.0;
    dVar31 = dVar31 * local_1de8[9];
    local_c90 = local_c90 - dVar31;
    local_c88 = local_c88 + dVar31;
    local_c70 = local_c70 + dVar31;
    local_c68 = local_c68 - dVar31;
    local_808[9] = local_808[9] - dVar71;
    local_7b8._0_8_ = (double)local_7b8._0_8_ + dVar71;
    dStack_7a0 = dStack_7a0 + dVar71;
    dVar72 = exp((double)local_1df8._0_8_ * 1.74 + dVar47 * -5258.6141576593245);
    dVar123 = local_1de8[0x11];
    dVar67 = local_1de8[10];
    local_1e48 = local_1a78 * 5258.6141576593245;
    dStack_1e40 = dStack_1a70 * 201.28666632188802;
    dVar82 = exp((local_1838 - local_748) + local_758);
    dVar70 = local_778;
    dVar69 = local_808[9];
    dVar68 = local_988;
    dVar52 = local_9d0;
    dVar51 = local_a38;
    dVar50 = local_a40;
    dVar49 = local_a78;
    dVar35 = local_a80;
    dVar34 = local_f08;
    dVar33 = local_f50;
    RVar11 = h_RT[0x12];
    RVar10 = h_RT[10];
    RVar9 = h_RT[9];
    dVar27 = local_1de8[0xd];
    dVar31 = local_1de8[3];
    dVar29 = local_1e98;
    dVar28 = dStack_1ea0;
    dVar48 = dStack_1ee0;
    local_1e08 = h_RT[0x11];
    dStack_1e00 = h_RT[0x12];
    local_1e78 = (undefined1  [8])local_1000;
    local_1e68 = local_ff8;
    local_1ce8._0_8_ = local_fc0;
    local_19a8 = local_fb8;
    local_1838 = local_f48;
    local_1d28 = local_f10;
    local_1e28 = local_1de8[9];
    local_1e38 = local_9c8;
    local_1868 = local_990;
    local_758 = dStack_780;
    dVar111 = exp(dVar47 * -201.28666632188802 + dVar81);
    dVar26 = local_1de8[0xb];
    local_1e58 = local_1de8[6];
    dStack_1e50 = 0.0;
    dVar115 = exp((dVar91 - local_1858) + local_1848);
    dVar53 = local_1de8[3];
    auVar79._8_8_ = dVar115;
    auVar79._0_8_ = dVar82;
    dVar72 = dVar72 * 6.14;
    dVar111 = dVar111 * 7600000.0;
    auVar119._8_8_ = dVar111;
    auVar119._0_8_ = dVar72;
    auVar132 = divpd(auVar119,auVar79);
    dVar82 = dVar123 * dVar67;
    dVar115 = dVar26 * local_1e58;
    local_fb8 = dVar72 * dVar32;
    dVar32 = dVar32 * local_1d38;
    dVar55 = dVar27 * dVar31;
    local_1e48 = dVar47 * 1.74 + local_1e48;
    dVar127 = dVar47 * 0.0 + dStack_1e40;
    dVar83 = auVar132._0_8_;
    dVar54 = auVar132._8_8_;
    dVar126 = local_1e48 * dVar72 * dVar32 -
              (local_1e48 - ((local_1e08 + RVar10) - (RVar11 + RVar9)) * dVar47) * dVar83 * dVar82;
    dVar127 = dVar127 * dVar111 * dVar55 -
              (dVar127 - ((h_RT[0xb] + h_RT[6]) - (h_RT[0xd] + h_RT[3])) * dVar47) * dVar54 *
              dVar115;
    dVar32 = dVar32 * dVar72 - dVar82 * dVar83;
    dVar82 = dVar55 * dVar111 - dVar115 * dVar54;
    dVar26 = dVar26 * -dVar54;
    local_1e58 = local_1e58 * -dVar54;
    dVar27 = dVar27 * dVar111;
    dVar111 = dVar111 * dVar31;
    local_1000 = (double)local_1e78 - local_fb8;
    local_1e08 = local_ed0;
    local_1d38 = local_e80;
    local_1e78 = (undefined1  [8])local_d70;
    local_1858 = local_d20;
    local_1848 = local_808[3];
    local_1e48 = local_808[6];
    local_ff8 = local_1e68 + local_fb8;
    local_fc0 = (double)local_1ce8._0_8_ + local_fb8;
    local_fb8 = local_19a8 - local_fb8;
    dVar72 = dVar72 * local_1e28;
    local_9d0 = dVar52 - dVar72;
    local_9c8 = local_1e38 + dVar72;
    local_990 = local_1868 + dVar72;
    local_988 = dVar68 - dVar72;
    local_808[9] = dVar69 - dVar126;
    dStack_780 = local_758 + dVar126;
    local_778 = dVar70 - dVar126;
    dStack_1ee0 = dVar48 - dVar32;
    dStack_1ea0 = dVar28 + dVar32;
    local_1e98 = dVar29 - dVar32;
    dVar123 = dVar123 * -dVar83;
    local_f50 = dVar33 - dVar123;
    local_f48 = local_1838 + dVar123;
    local_f10 = local_1d28 + dVar123;
    local_f08 = dVar34 - dVar123;
    dVar67 = -dVar83 * dVar67;
    local_a80 = dVar35 - dVar67;
    local_a78 = dVar49 + dVar67;
    local_a40 = dVar50 + dVar67;
    local_a38 = dVar51 - dVar67;
    local_1f28[6] = local_1f28[6] + dVar82;
    local_1f28[3] = local_1f28[3] - dVar82;
    dStack_1ed0 = dStack_1ed0 + dVar82;
    local_1ed8 = (undefined1  [8])((double)local_1ed8 + dVar32);
    dStack_1ec0 = dStack_1ec0 - dVar82;
    local_1eb8 = local_1eb8 - local_1d18;
    local_1450 = local_1450 - dVar27;
    dStack_1438 = dStack_1438 + dVar27;
    local_1410 = local_1410 + dVar27;
    local_1400 = local_1400 - dVar27;
    local_1240 = local_1240 - dVar26;
    dStack_1228 = dStack_1228 + dVar26;
    local_1200 = local_1200 + dVar26;
    local_11f0 = local_11f0 - dVar26;
    local_ed0 = local_ed0 - local_1e58;
    local_eb8 = local_eb8 + local_1e58;
    dStack_e90 = dStack_e90 + local_1e58;
    local_e80 = local_e80 - local_1e58;
    local_d70 = local_d70 - dVar111;
    local_d58 = local_d58 + dVar111;
    local_d30 = local_d30 + dVar111;
    local_d20 = local_d20 - dVar111;
    local_808[6] = local_808[6] + dVar127;
    local_808[3] = local_808[3] - dVar127;
    local_7b8._8_8_ = (double)local_7b8._8_8_ + dVar127;
    local_7b8._0_8_ = (double)local_7b8._0_8_ + dVar126;
    dStack_7a0 = dStack_7a0 - dVar127;
    dStack_798 = dStack_798 - dVar71;
    local_1868 = local_1de8[0xf];
    uStack_1860 = 0;
    local_1e78 = (undefined1  [8])exp((double)local_1df8._0_8_ * 7.6 + dVar47 * 1776.3548302906618);
    dVar67 = local_1de8[0xe];
    dVar29 = local_1de8[6];
    uStack_1e70 = (double)extraout_XMM0_Qb_06;
    local_1d38 = exp((dVar91 - local_1918) + dVar30);
    dVar68 = local_bb8;
    dVar52 = local_c10;
    dVar51 = local_ca8;
    dVar50 = local_cc0;
    dVar49 = local_11e0;
    dVar35 = local_11e8;
    dVar34 = dStack_1228;
    dVar33 = local_13f0;
    dVar32 = local_13f8;
    dVar30 = dStack_1438;
    dVar123 = local_1450;
    RVar10 = h_RT[6];
    RVar9 = h_RT[3];
    dVar28 = local_1de8[3];
    dVar48 = local_1f28[3];
    local_1e28 = h_RT[0xf];
    RStack_1e20 = h_RT[0x10];
    local_1e38 = h_RT[0xe];
    dStack_1e30 = h_RT[0xf];
    local_1838 = local_1f28[6];
    local_1d18 = local_1eb8;
    local_1d28 = local_1240;
    local_1858 = local_c68;
    local_1848 = local_c60;
    local_758 = local_bf8;
    local_1e68 = local_bb0;
    local_1ce8._0_8_ = local_808[3];
    local_19a8 = local_808[6];
    local_1918 = dStack_798;
    local_1e58 = local_1de8[0x11];
    dStack_1e50 = 0.0;
    local_1e48 = exp(dVar47 * -1949.96457999329 + dVar81);
    dVar31 = local_1de8[6];
    local_1df8._8_8_ = 0;
    local_1df8._0_8_ = local_1de8[0x10];
    dVar26 = exp((dVar91 - local_698) + local_748);
    auVar66._8_8_ = dVar26;
    auVar66._0_8_ = local_1d38;
    dVar126 = (double)local_1e78 * 4.28e-19;
    dVar127 = local_1e48 * 840000.0;
    auVar101._8_8_ = dVar127;
    auVar101._0_8_ = dVar126;
    auVar132 = divpd(auVar101,auVar66);
    uVar124 = local_1df8._12_4_;
    dVar111 = dVar29 * dVar67;
    dVar115 = local_1df8._0_8_ * dVar31;
    dVar26 = dVar126 * local_1868;
    dVar71 = dVar53 * local_1868;
    dVar72 = local_1e58 * dVar28;
    dVar69 = dVar47 * 7.6 + local_1a78 * -1776.3548302906618;
    dVar70 = dVar47 * 0.0 + dStack_1a70 * 1949.96457999329;
    dVar81 = auVar132._0_8_;
    dVar82 = auVar132._8_8_;
    dVar27 = local_1df8._0_8_ * -dVar82;
    local_1df8._8_4_ = local_1df8._8_4_;
    local_1df8._0_8_ = dVar27;
    local_1df8._12_4_ = uVar124;
    dVar31 = dVar31 * -dVar82;
    local_1e58 = local_1e58 * dVar127;
    dVar28 = dVar127 * dVar28;
    local_748 = local_a40;
    local_698 = local_a48;
    local_13f8 = dVar32 + dVar26;
    local_13f0 = dVar33 - dVar26;
    dVar53 = dVar53 * dVar126;
    local_c10 = dVar52 - dVar53;
    local_bf8 = local_758 + dVar53;
    local_bb8 = dVar68 + dVar53;
    local_bb0 = local_1e68 - dVar53;
    dVar53 = dVar69 * dVar126 * dVar71 -
             (dVar69 - ((RVar10 + local_1e38) - (RVar9 + local_1e28)) * dVar47) * dVar81 * dVar111;
    dVar32 = dVar70 * dVar127 * dVar72 -
             (dVar70 - ((h_RT[0x10] + h_RT[6]) - (h_RT[0x11] + h_RT[3])) * dVar47) * dVar82 *
             dVar115;
    dStack_798 = local_1918 + dVar53;
    dVar33 = dVar71 * dVar126 - dVar111 * dVar81;
    dVar52 = dVar72 * dVar127 - dVar115 * dVar82;
    local_1eb8 = local_1d18 + dVar33;
    dVar67 = dVar67 * -dVar81;
    local_11e8 = dVar35 + dVar67;
    local_11e0 = dVar49 - dVar67;
    dVar29 = -dVar81 * dVar29;
    local_cc0 = dVar50 - dVar29;
    local_ca8 = dVar51 + dVar29;
    local_c68 = local_1858 + dVar29;
    local_c60 = local_1848 - dVar29;
    local_1f28[3] = (dVar48 - dVar33) - dVar52;
    local_1f28[6] = local_1838 + dVar33 + dVar52;
    dStack_1eb0 = dStack_1eb0 - dVar33;
    local_1ea8 = dVar52 + local_1ea8;
    local_1450 = (dVar123 - dVar26) - local_1e58;
    dStack_1ea0 = dStack_1ea0 - dVar52;
    dStack_1438 = local_1e58 + dVar30 + dVar26;
    local_13e8 = local_13e8 + local_1e58;
    local_13e0 = local_13e0 - local_1e58;
    local_1240 = (local_1d28 - dVar67) - dVar27;
    dStack_1228 = dVar27 + dVar34 + dVar67;
    local_11d8 = local_11d8 + dVar27;
    local_11d0 = local_11d0 - dVar27;
    local_b60 = local_b60 - dVar31;
    local_b48 = local_b48 + dVar31;
    local_af8 = local_af8 + dVar31;
    local_af0 = local_af0 - dVar31;
    local_ab0 = local_ab0 - dVar28;
    local_a98 = local_a98 + dVar28;
    local_a48 = local_a48 + dVar28;
    local_a40 = local_a40 - dVar28;
    local_808[3] = ((double)local_1ce8._0_8_ - dVar53) - dVar32;
    local_808[6] = local_19a8 + dVar53 + dVar32;
    dStack_790 = dStack_790 - dVar53;
    dStack_788 = dVar32 + dStack_788;
    dStack_780 = dStack_780 - dVar32;
    if (iVar2 == 2) {
      if (1000.0 <= dVar1) {
        c_R[0] = local_6a8 * 2.00255376e-14 +
                 local_568 * -1.79566394e-10 +
                 local_1808 * 4.99456778e-07 + dVar1 * -4.94024731e-05 + 3.3372792;
        c_R[1] = local_6a8 * 4.98197357e-22 +
                 local_568 * -4.73515235e-18 +
                 local_1808 * 1.61561948e-14 + dVar1 * -2.30842973e-11 + 2.50000001;
        c_R[2] = local_6a8 * 1.22833691e-15 +
                 local_568 * -1.00177799e-11 +
                 local_1808 * 4.19484589e-08 + dVar1 * -8.59741137e-05 + 2.56942078;
        c_R[3] = local_6a8 * -2.16717794e-14 +
                 local_568 * 2.09470555e-10 +
                 local_1808 * -7.57966669e-07 + dVar1 * 0.00148308754 + 3.28253784;
        c_R[4] = local_6a8 * 1.17412376e-14 +
                 local_568 * -8.79461556e-11 +
                 local_1808 * 1.26505228e-07 + dVar1 * 0.000548429716 + 3.09288767;
        c_R[5] = local_6a8 * 1.68200992e-14 +
                 local_568 * -9.7041987e-11 +
                 local_1808 * -1.64072518e-07 + dVar1 * 0.00217691804 + 3.03399249;
        c_R[6] = local_6a8 * -1.07908535e-14 +
                 local_568 * 1.1424637e-10 +
                 local_1808 * -6.3365815e-07 + dVar1 * 0.00223982013 + 4.0172109;
        c_R[7] = local_6a8 * -1.87727567e-14 +
                 local_568 * 2.60179549e-10 +
                 local_1808 * -1.40894597e-06 + dVar1 * 0.00365639292 + 2.87410113;
        c_R[8] = local_6a8 * -3.39716365e-14 +
                 local_568 * 4.17906e-10 +
                 local_1808 * -2.01191947e-06 + dVar1 * 0.00465588637 + 2.29203842;
        c_R[9] = local_6a8 * -4.67154394e-14 +
                 local_568 * 5.95684644e-10 +
                 local_1808 * -2.98714348e-06 + dVar1 * 0.00723990037 + 2.28571772;
        c_R[10] = local_6a8 * -1.0181523e-13 +
                  local_568 * 1.22292535e-09 +
                  local_1808 * -5.73285809e-06 + dVar1 * 0.0133909467 + 0.074851495;
        c_R[0xb] = local_6a8 * -2.03647716e-14 +
                   local_568 * 2.30053008e-10 +
                   local_1808 * -9.98825771e-07 + dVar1 * 0.00206252743 + 2.71518561;
        c_R[0xc] = local_6a8 * -4.72084164e-14 +
                   local_568 * 5.23490188e-10 +
                   local_1808 * -2.21481404e-06 + dVar1 * 0.00441437026 + 3.85746029;
        c_R[0xd] = local_6a8 * -5.33508711e-14 +
                   local_568 * 5.89161778e-10 +
                   local_1808 * -2.48445613e-06 + dVar1 * 0.00495695526 + 2.77217438;
        c_R[0xe] = local_6a8 * -8.8385564e-14 +
                   local_568 * 1.00641212e-09 +
                   local_1808 * -4.42258813e-06 + dVar1 * 0.00920000082 + 1.76069008;
        c_R[0xf] = local_6a8 * -2.112616e-14 +
                   local_568 * 3.944431e-10 +
                   local_1808 * -2.656384e-06 + dVar1 * 0.007871497 + 3.770799;
        c_R[0x10] = local_6a8 * -1.25706061e-13 +
                    local_568 * 1.47222923e-09 +
                    local_1808 * -6.71077915e-06 + dVar1 * 0.0146454151 + 2.03611116;
        c_R[0x11] = local_6a8 * -1.49641576e-13 +
                    local_568 * 1.75217689e-09 +
                    local_1808 * -7.98206668e-06 + dVar1 * 0.0173972722 + 1.95465642;
        c_R[0x12] = local_6a8 * -1.9000289e-13 +
                    local_568 * 2.21412001e-09 +
                    local_1808 * -1.00256067e-05 + dVar1 * 0.0216852677 + 1.0718815;
        dVar27 = local_568 * 1.0097038e-10 +
                 local_1808 * -5.68476e-07 + dVar1 * 0.0014879768 + 2.92664;
        dVar26 = local_6a8 * -6.753351e-15;
      }
      else {
        c_R[0] = local_6a8 * -7.37611761e-12 +
                 local_568 * 2.01572094e-08 +
                 local_1808 * -1.9478151e-05 + dVar1 * 0.00798052075 + 2.34433112;
        c_R[1] = local_6a8 * -9.27732332e-22 +
                 local_568 * 2.30081632e-18 +
                 local_1808 * -1.99591964e-15 + dVar1 * 7.05332819e-13 + 2.5;
        c_R[2] = local_6a8 * 2.11265971e-12 +
                 local_568 * -6.12806624e-09 +
                 local_1808 * 6.64306396e-06 + dVar1 * -0.00327931884 + 3.1682671;
        c_R[3] = local_6a8 * 3.24372837e-12 +
                 local_568 * -9.68129509e-09 +
                 local_1808 * 9.84730201e-06 + dVar1 * -0.00299673416 + 3.78245636;
        c_R[4] = local_6a8 * 1.3641147e-12 +
                 local_568 * -3.88113333e-09 +
                 local_1808 * 4.61793841e-06 + dVar1 * -0.00240131752 + 3.99201543;
        c_R[5] = local_6a8 * 1.77197817e-12 +
                 local_568 * -5.48797062e-09 +
                 local_1808 * 6.52040211e-06 + dVar1 * -0.0020364341 + 4.19864056;
        c_R[6] = local_6a8 * 9.29225124e-12 +
                 local_568 * -2.42763894e-08 +
                 local_1808 * 2.11582891e-05 + dVar1 * -0.00474912051 + 4.30179801;
        c_R[7] = local_6a8 * 1.68741719e-12 +
                 local_568 * -3.85091153e-09 +
                 local_1808 * 2.79489841e-06 + dVar1 * 0.000968872143 + 3.76267867;
        c_R[8] = local_6a8 * 1.94314737e-12 +
                 local_568 * -6.68815981e-09 +
                 local_1808 * 8.2329622e-06 + dVar1 * -0.00236661419 + 4.19860411;
        c_R[9] = local_6a8 * 2.54385734e-12 +
                 local_568 * -6.87117425e-09 +
                 local_1808 * 5.73021856e-06 + dVar1 * 0.00201095175 + 3.6735904;
        c_R[10] = local_6a8 * 1.66693956e-11 +
                  local_568 * -4.84743026e-08 +
                  local_1808 * 4.91800599e-05 + dVar1 * -0.0136709788 + 5.14987613;
        c_R[0xb] = local_6a8 * -9.04424499e-13 +
                   local_568 * 9.07005884e-10 +
                   local_1808 * 1.01681433e-06 + dVar1 * -0.00061035368 + 3.57953347;
        c_R[0xc] = local_6a8 * -1.43699548e-13 +
                   local_568 * 2.45919022e-09 +
                   local_1808 * -7.12356269e-06 + dVar1 * 0.00898459677 + 2.35677352;
        c_R[0xd] = local_6a8 * 4.33768865e-12 +
                   local_568 * -1.33144093e-08 +
                   local_1808 * 1.37799446e-05 + dVar1 * -0.00324392532 + 4.22118584;
        c_R[0xe] = local_6a8 * 1.31772652e-11 +
                   local_568 * -3.79285261e-08 +
                   local_1808 * 3.73220008e-05 + dVar1 * -0.00990833369 + 4.79372315;
        c_R[0xf] = local_6a8 * 2.07561e-12 +
                   local_568 * -7.377636e-09 +
                   local_1808 * 5.338472e-06 + dVar1 * 0.007216595 + 2.106204;
        c_R[0x10] = local_6a8 * 2.69884373e-11 +
                    local_568 * -6.91588753e-08 +
                    local_1808 * 5.70990292e-05 + dVar1 * -0.00757052247 + 3.95920148;
        c_R[0x11] = local_6a8 * 2.30509004e-11 +
                    local_568 * -5.99126606e-08 +
                    local_1808 * 4.97142807e-05 + dVar1 * -0.00418658892 + 4.30646568;
        c_R[0x12] = local_6a8 * 2.68685771e-11 +
                    local_568 * -7.08466285e-08 +
                    local_1808 * 5.99438288e-05 + dVar1 * -0.0055015427 + 4.29142492;
        dVar27 = local_568 * 5.641515e-09 +
                 local_1808 * -3.963222e-06 + dVar1 * 0.0014082404 + 3.298677;
        dVar26 = local_6a8 * -2.444854e-12;
      }
      c_R[0x13] = dVar26 + dVar27;
      c_R[0x14] = dVar134 + dVar80 + 2.5 + dVar125 + dVar137;
      if (1000.0 <= dVar1) {
        dcRdT[0] = local_568 * 8.01021504e-14 +
                   local_1808 * -5.38699182e-10 + dVar1 * 9.98913556e-07 + -4.94024731e-05;
        dcRdT[1] = local_568 * 1.99278943e-21 +
                   local_1808 * -1.42054571e-17 + dVar1 * 3.23123896e-14 + -2.30842973e-11;
        dcRdT[2] = local_568 * 4.91334764e-15 +
                   local_1808 * -3.00533397e-11 + dVar1 * 8.38969178e-08 + -8.59741137e-05;
        dcRdT[3] = local_568 * -8.66871176e-14 +
                   local_1808 * 6.28411665e-10 + dVar1 * -1.51593334e-06 + 0.00148308754;
        dcRdT[4] = local_568 * 4.69649504e-14 +
                   local_1808 * -2.63838467e-10 + dVar1 * 2.53010456e-07 + 0.000548429716;
        dcRdT[5] = local_568 * 6.72803968e-14 +
                   local_1808 * -2.91125961e-10 + dVar1 * -3.28145036e-07 + 0.00217691804;
        dcRdT[6] = local_568 * -4.3163414e-14 +
                   local_1808 * 3.4273911e-10 + dVar1 * -1.2673163e-06 + 0.00223982013;
        dcRdT[7] = local_568 * -7.50910268e-14 +
                   local_1808 * 7.80538647e-10 + dVar1 * -2.81789194e-06 + 0.00365639292;
        dcRdT[8] = local_568 * -1.35886546e-13 +
                   local_1808 * 1.253718e-09 + dVar1 * -4.02383894e-06 + 0.00465588637;
        dcRdT[9] = local_568 * -1.86861758e-13 +
                   local_1808 * 1.78705393e-09 + dVar1 * -5.97428696e-06 + 0.00723990037;
        dcRdT[10] = local_568 * -4.0726092e-13 +
                    local_1808 * 3.66877605e-09 + dVar1 * -1.14657162e-05 + 0.0133909467;
        dcRdT[0xb] = local_568 * -8.14590864e-14 +
                     local_1808 * 6.90159024e-10 + dVar1 * -1.99765154e-06 + 0.00206252743;
        dcRdT[0xc] = local_568 * -1.88833666e-13 +
                     local_1808 * 1.57047056e-09 + dVar1 * -4.42962808e-06 + 0.00441437026;
        dcRdT[0xd] = local_568 * -2.13403484e-13 +
                     local_1808 * 1.76748533e-09 + dVar1 * -4.96891226e-06 + 0.00495695526;
        dcRdT[0xe] = local_568 * -3.53542256e-13 +
                     local_1808 * 3.01923636e-09 + dVar1 * -8.84517626e-06 + 0.00920000082;
        dcRdT[0xf] = local_568 * -8.450464e-14 +
                     local_1808 * 1.1833293e-09 + dVar1 * -5.312768e-06 + 0.007871497;
        dcRdT[0x10] = local_568 * -5.02824244e-13 +
                      local_1808 * 4.41668769e-09 + dVar1 * -1.34215583e-05 + 0.0146454151;
        dcRdT[0x11] = local_568 * -5.98566304e-13 +
                      local_1808 * 5.25653067e-09 + dVar1 * -1.59641334e-05 + 0.0173972722;
        dcRdT[0x12] = local_568 * -7.6001156e-13 +
                      local_1808 * 6.64236003e-09 + dVar1 * -2.00512134e-05 + 0.0216852677;
        dVar26 = local_1808 * 3.0291114e-10 + dVar1 * -1.136952e-06 + 0.0014879768;
        dVar27 = local_568 * -2.7013404e-14;
      }
      else {
        dcRdT[0] = local_568 * -2.95044704e-11 +
                   local_1808 * 6.04716282e-08 + dVar1 * -3.8956302e-05 + 0.00798052075;
        dcRdT[1] = local_568 * -3.71092933e-21 +
                   local_1808 * 6.90244896e-18 + dVar1 * -3.99183928e-15 + 7.05332819e-13;
        dcRdT[2] = local_568 * 8.45063884e-12 +
                   local_1808 * -1.83841987e-08 + dVar1 * 1.32861279e-05 + -0.00327931884;
        dcRdT[3] = local_568 * 1.29749135e-11 +
                   local_1808 * -2.90438853e-08 + dVar1 * 1.9694604e-05 + -0.00299673416;
        dcRdT[4] = local_568 * 5.4564588e-12 +
                   local_1808 * -1.16434e-08 + dVar1 * 9.23587682e-06 + -0.00240131752;
        dcRdT[5] = local_568 * 7.08791268e-12 +
                   local_1808 * -1.64639119e-08 + dVar1 * 1.30408042e-05 + -0.0020364341;
        dcRdT[6] = local_568 * 3.7169005e-11 +
                   local_1808 * -7.28291682e-08 + dVar1 * 4.23165782e-05 + -0.00474912051;
        dcRdT[7] = local_568 * 6.74966876e-12 +
                   local_1808 * -1.15527346e-08 + dVar1 * 5.58979682e-06 + 0.000968872143;
        dcRdT[8] = local_568 * 7.77258948e-12 +
                   local_1808 * -2.00644794e-08 + dVar1 * 1.64659244e-05 + -0.00236661419;
        dcRdT[9] = local_568 * 1.01754294e-11 +
                   local_1808 * -2.06135228e-08 + dVar1 * 1.14604371e-05 + 0.00201095175;
        dcRdT[10] = local_568 * 6.66775824e-11 +
                    local_1808 * -1.45422908e-07 + dVar1 * 9.83601198e-05 + -0.0136709788;
        dcRdT[0xb] = local_568 * -3.617698e-12 +
                     local_1808 * 2.72101765e-09 + dVar1 * 2.03362866e-06 + -0.00061035368;
        dcRdT[0xc] = local_568 * -5.74798192e-13 +
                     local_1808 * 7.37757066e-09 + dVar1 * -1.42471254e-05 + 0.00898459677;
        dcRdT[0xd] = local_568 * 1.73507546e-11 +
                     local_1808 * -3.99432279e-08 + dVar1 * 2.75598892e-05 + -0.00324392532;
        dcRdT[0xe] = local_568 * 5.27090608e-11 +
                     local_1808 * -1.13785578e-07 + dVar1 * 7.46440016e-05 + -0.00990833369;
        dcRdT[0xf] = local_568 * 8.30244e-12 +
                     local_1808 * -2.2132908e-08 + dVar1 * 1.0676944e-05 + 0.007216595;
        dcRdT[0x10] = local_568 * 1.07953749e-10 +
                      local_1808 * -2.07476626e-07 + dVar1 * 0.000114198058 + -0.00757052247;
        dcRdT[0x11] = local_568 * 9.22036016e-11 +
                      local_1808 * -1.79737982e-07 + dVar1 * 9.94285614e-05 + -0.00418658892;
        dcRdT[0x12] = local_568 * 1.07474308e-10 +
                      local_1808 * -2.12539886e-07 + dVar1 * 0.000119887658 + -0.0055015427;
        dVar26 = local_1808 * 1.6924545e-08 + dVar1 * -7.926444e-06 + 0.0014082404;
        dVar27 = local_568 * -9.779416e-12;
      }
      dcRdT[0x13] = dVar27 + dVar26;
      dcRdT[0x14] = dVar137 + dVar125 + dVar80 + 0.0;
      pRVar19 = h_RT;
    }
    else {
      if (1000.0 <= dVar1) {
        c_R[0] = local_6a8 * 2.00255376e-14 +
                 local_568 * -1.79566394e-10 +
                 local_1808 * 4.99456778e-07 + dVar1 * -4.94024731e-05 + 2.3372792;
        c_R[1] = local_6a8 * 4.98197357e-22 +
                 local_568 * -4.73515235e-18 +
                 local_1808 * 1.61561948e-14 + dVar1 * -2.30842973e-11 + 1.50000001;
        c_R[2] = local_6a8 * 1.22833691e-15 +
                 local_568 * -1.00177799e-11 +
                 local_1808 * 4.19484589e-08 + dVar1 * -8.59741137e-05 + 1.56942078;
        c_R[3] = local_6a8 * -2.16717794e-14 +
                 local_568 * 2.09470555e-10 +
                 local_1808 * -7.57966669e-07 + dVar1 * 0.00148308754 + 2.28253784;
        c_R[4] = local_6a8 * 1.17412376e-14 +
                 local_568 * -8.79461556e-11 +
                 local_1808 * 1.26505228e-07 + dVar1 * 0.000548429716 + 2.09288767;
        c_R[5] = local_6a8 * 1.68200992e-14 +
                 local_568 * -9.7041987e-11 +
                 local_1808 * -1.64072518e-07 + dVar1 * 0.00217691804 + 2.03399249;
        c_R[6] = local_6a8 * -1.07908535e-14 +
                 local_568 * 1.1424637e-10 +
                 local_1808 * -6.3365815e-07 + dVar1 * 0.00223982013 + 3.0172109;
        c_R[7] = local_6a8 * -1.87727567e-14 +
                 local_568 * 2.60179549e-10 +
                 local_1808 * -1.40894597e-06 + dVar1 * 0.00365639292 + 1.87410113;
        c_R[8] = local_6a8 * -3.39716365e-14 +
                 local_568 * 4.17906e-10 +
                 local_1808 * -2.01191947e-06 + dVar1 * 0.00465588637 + 1.29203842;
        c_R[9] = local_6a8 * -4.67154394e-14 +
                 local_568 * 5.95684644e-10 +
                 local_1808 * -2.98714348e-06 + dVar1 * 0.00723990037 + 1.28571772;
        c_R[10] = local_6a8 * -1.0181523e-13 +
                  local_568 * 1.22292535e-09 +
                  local_1808 * -5.73285809e-06 + dVar1 * 0.0133909467 + -0.925148505;
        c_R[0xb] = local_6a8 * -2.03647716e-14 +
                   local_568 * 2.30053008e-10 +
                   local_1808 * -9.98825771e-07 + dVar1 * 0.00206252743 + 1.71518561;
        c_R[0xc] = local_6a8 * -4.72084164e-14 +
                   local_568 * 5.23490188e-10 +
                   local_1808 * -2.21481404e-06 + dVar1 * 0.00441437026 + 2.85746029;
        c_R[0xd] = local_6a8 * -5.33508711e-14 +
                   local_568 * 5.89161778e-10 +
                   local_1808 * -2.48445613e-06 + dVar1 * 0.00495695526 + 1.77217438;
        c_R[0xe] = local_6a8 * -8.8385564e-14 +
                   local_568 * 1.00641212e-09 +
                   local_1808 * -4.42258813e-06 + dVar1 * 0.00920000082 + 0.76069008;
        c_R[0xf] = local_6a8 * -2.112616e-14 +
                   local_568 * 3.944431e-10 +
                   local_1808 * -2.656384e-06 + dVar1 * 0.007871497 + 2.770799;
        c_R[0x10] = local_6a8 * -1.25706061e-13 +
                    local_568 * 1.47222923e-09 +
                    local_1808 * -6.71077915e-06 + dVar1 * 0.0146454151 + 1.03611116;
        c_R[0x11] = local_6a8 * -1.49641576e-13 +
                    local_568 * 1.75217689e-09 +
                    local_1808 * -7.98206668e-06 + dVar1 * 0.0173972722 + 0.95465642;
        c_R[0x12] = local_6a8 * -1.9000289e-13 +
                    local_568 * 2.21412001e-09 +
                    local_1808 * -1.00256067e-05 + dVar1 * 0.0216852677 + 0.0718815;
        dVar27 = local_568 * 1.0097038e-10 +
                 local_1808 * -5.68476e-07 + dVar1 * 0.0014879768 + 1.92664;
        dVar26 = local_6a8 * -6.753351e-15;
      }
      else {
        c_R[0] = local_6a8 * -7.37611761e-12 +
                 local_568 * 2.01572094e-08 +
                 local_1808 * -1.9478151e-05 + dVar1 * 0.00798052075 + 1.34433112;
        c_R[1] = local_6a8 * -9.27732332e-22 +
                 local_568 * 2.30081632e-18 +
                 local_1808 * -1.99591964e-15 + dVar1 * 7.05332819e-13 + 1.5;
        c_R[2] = local_6a8 * 2.11265971e-12 +
                 local_568 * -6.12806624e-09 +
                 local_1808 * 6.64306396e-06 + dVar1 * -0.00327931884 + 2.1682671;
        c_R[3] = local_6a8 * 3.24372837e-12 +
                 local_568 * -9.68129509e-09 +
                 local_1808 * 9.84730201e-06 + dVar1 * -0.00299673416 + 2.78245636;
        c_R[4] = local_6a8 * 1.3641147e-12 +
                 local_568 * -3.88113333e-09 +
                 local_1808 * 4.61793841e-06 + dVar1 * -0.00240131752 + 2.99201543;
        c_R[5] = local_6a8 * 1.77197817e-12 +
                 local_568 * -5.48797062e-09 +
                 local_1808 * 6.52040211e-06 + dVar1 * -0.0020364341 + 3.19864056;
        c_R[6] = local_6a8 * 9.29225124e-12 +
                 local_568 * -2.42763894e-08 +
                 local_1808 * 2.11582891e-05 + dVar1 * -0.00474912051 + 3.30179801;
        c_R[7] = local_6a8 * 1.68741719e-12 +
                 local_568 * -3.85091153e-09 +
                 local_1808 * 2.79489841e-06 + dVar1 * 0.000968872143 + 2.76267867;
        c_R[8] = local_6a8 * 1.94314737e-12 +
                 local_568 * -6.68815981e-09 +
                 local_1808 * 8.2329622e-06 + dVar1 * -0.00236661419 + 3.19860411;
        c_R[9] = local_6a8 * 2.54385734e-12 +
                 local_568 * -6.87117425e-09 +
                 local_1808 * 5.73021856e-06 + dVar1 * 0.00201095175 + 2.6735904;
        c_R[10] = local_6a8 * 1.66693956e-11 +
                  local_568 * -4.84743026e-08 +
                  local_1808 * 4.91800599e-05 + dVar1 * -0.0136709788 + 4.14987613;
        c_R[0xb] = local_6a8 * -9.04424499e-13 +
                   local_568 * 9.07005884e-10 +
                   local_1808 * 1.01681433e-06 + dVar1 * -0.00061035368 + 2.57953347;
        c_R[0xc] = local_6a8 * -1.43699548e-13 +
                   local_568 * 2.45919022e-09 +
                   local_1808 * -7.12356269e-06 + dVar1 * 0.00898459677 + 1.35677352;
        c_R[0xd] = local_6a8 * 4.33768865e-12 +
                   local_568 * -1.33144093e-08 +
                   local_1808 * 1.37799446e-05 + dVar1 * -0.00324392532 + 3.22118584;
        c_R[0xe] = local_6a8 * 1.31772652e-11 +
                   local_568 * -3.79285261e-08 +
                   local_1808 * 3.73220008e-05 + dVar1 * -0.00990833369 + 3.79372315;
        c_R[0xf] = local_6a8 * 2.07561e-12 +
                   local_568 * -7.377636e-09 +
                   local_1808 * 5.338472e-06 + dVar1 * 0.007216595 + 1.106204;
        c_R[0x10] = local_6a8 * 2.69884373e-11 +
                    local_568 * -6.91588753e-08 +
                    local_1808 * 5.70990292e-05 + dVar1 * -0.00757052247 + 2.95920148;
        c_R[0x11] = local_6a8 * 2.30509004e-11 +
                    local_568 * -5.99126606e-08 +
                    local_1808 * 4.97142807e-05 + dVar1 * -0.00418658892 + 3.30646568;
        c_R[0x12] = local_6a8 * 2.68685771e-11 +
                    local_568 * -7.08466285e-08 +
                    local_1808 * 5.99438288e-05 + dVar1 * -0.0055015427 + 3.29142492;
        dVar27 = local_568 * 5.641515e-09 +
                 local_1808 * -3.963222e-06 + dVar1 * 0.0014082404 + 2.298677;
        dVar26 = local_6a8 * -2.444854e-12;
      }
      c_R[0x13] = dVar26 + dVar27;
      c_R[0x14] = dVar80 + 1.5 + dVar125 + dVar137 + dVar134;
      if (1000.0 <= dVar1) {
        dcRdT[0] = local_568 * 8.01021504e-14 +
                   local_1808 * -5.38699182e-10 + dVar1 * 9.98913556e-07 + -4.94024731e-05;
        dcRdT[1] = local_568 * 1.99278943e-21 +
                   local_1808 * -1.42054571e-17 + dVar1 * 3.23123896e-14 + -2.30842973e-11;
        dcRdT[2] = local_568 * 4.91334764e-15 +
                   local_1808 * -3.00533397e-11 + dVar1 * 8.38969178e-08 + -8.59741137e-05;
        dcRdT[3] = local_568 * -8.66871176e-14 +
                   local_1808 * 6.28411665e-10 + dVar1 * -1.51593334e-06 + 0.00148308754;
        dcRdT[4] = local_568 * 4.69649504e-14 +
                   local_1808 * -2.63838467e-10 + dVar1 * 2.53010456e-07 + 0.000548429716;
        dcRdT[5] = local_568 * 6.72803968e-14 +
                   local_1808 * -2.91125961e-10 + dVar1 * -3.28145036e-07 + 0.00217691804;
        dcRdT[6] = local_568 * -4.3163414e-14 +
                   local_1808 * 3.4273911e-10 + dVar1 * -1.2673163e-06 + 0.00223982013;
        dcRdT[7] = local_568 * -7.50910268e-14 +
                   local_1808 * 7.80538647e-10 + dVar1 * -2.81789194e-06 + 0.00365639292;
        dcRdT[8] = local_568 * -1.35886546e-13 +
                   local_1808 * 1.253718e-09 + dVar1 * -4.02383894e-06 + 0.00465588637;
        dcRdT[9] = local_568 * -1.86861758e-13 +
                   local_1808 * 1.78705393e-09 + dVar1 * -5.97428696e-06 + 0.00723990037;
        dcRdT[10] = local_568 * -4.0726092e-13 +
                    local_1808 * 3.66877605e-09 + dVar1 * -1.14657162e-05 + 0.0133909467;
        dcRdT[0xb] = local_568 * -8.14590864e-14 +
                     local_1808 * 6.90159024e-10 + dVar1 * -1.99765154e-06 + 0.00206252743;
        dcRdT[0xc] = local_568 * -1.88833666e-13 +
                     local_1808 * 1.57047056e-09 + dVar1 * -4.42962808e-06 + 0.00441437026;
        dcRdT[0xd] = local_568 * -2.13403484e-13 +
                     local_1808 * 1.76748533e-09 + dVar1 * -4.96891226e-06 + 0.00495695526;
        dcRdT[0xe] = local_568 * -3.53542256e-13 +
                     local_1808 * 3.01923636e-09 + dVar1 * -8.84517626e-06 + 0.00920000082;
        dcRdT[0xf] = local_568 * -8.450464e-14 +
                     local_1808 * 1.1833293e-09 + dVar1 * -5.312768e-06 + 0.007871497;
        dcRdT[0x10] = local_568 * -5.02824244e-13 +
                      local_1808 * 4.41668769e-09 + dVar1 * -1.34215583e-05 + 0.0146454151;
        dcRdT[0x11] = local_568 * -5.98566304e-13 +
                      local_1808 * 5.25653067e-09 + dVar1 * -1.59641334e-05 + 0.0173972722;
        dcRdT[0x12] = local_568 * -7.6001156e-13 +
                      local_1808 * 6.64236003e-09 + dVar1 * -2.00512134e-05 + 0.0216852677;
        dVar27 = local_1808 * 3.0291114e-10 + dVar1 * -1.136952e-06 + 0.0014879768;
        dVar26 = local_568 * -2.7013404e-14;
      }
      else {
        dcRdT[0] = local_568 * -2.95044704e-11 +
                   local_1808 * 6.04716282e-08 + dVar1 * -3.8956302e-05 + 0.00798052075;
        dcRdT[1] = local_568 * -3.71092933e-21 +
                   local_1808 * 6.90244896e-18 + dVar1 * -3.99183928e-15 + 7.05332819e-13;
        dcRdT[2] = local_568 * 8.45063884e-12 +
                   local_1808 * -1.83841987e-08 + dVar1 * 1.32861279e-05 + -0.00327931884;
        dcRdT[3] = local_568 * 1.29749135e-11 +
                   local_1808 * -2.90438853e-08 + dVar1 * 1.9694604e-05 + -0.00299673416;
        dcRdT[4] = local_568 * 5.4564588e-12 +
                   local_1808 * -1.16434e-08 + dVar1 * 9.23587682e-06 + -0.00240131752;
        dcRdT[5] = local_568 * 7.08791268e-12 +
                   local_1808 * -1.64639119e-08 + dVar1 * 1.30408042e-05 + -0.0020364341;
        dcRdT[6] = local_568 * 3.7169005e-11 +
                   local_1808 * -7.28291682e-08 + dVar1 * 4.23165782e-05 + -0.00474912051;
        dcRdT[7] = local_568 * 6.74966876e-12 +
                   local_1808 * -1.15527346e-08 + dVar1 * 5.58979682e-06 + 0.000968872143;
        dcRdT[8] = local_568 * 7.77258948e-12 +
                   local_1808 * -2.00644794e-08 + dVar1 * 1.64659244e-05 + -0.00236661419;
        dcRdT[9] = local_568 * 1.01754294e-11 +
                   local_1808 * -2.06135228e-08 + dVar1 * 1.14604371e-05 + 0.00201095175;
        dcRdT[10] = local_568 * 6.66775824e-11 +
                    local_1808 * -1.45422908e-07 + dVar1 * 9.83601198e-05 + -0.0136709788;
        dcRdT[0xb] = local_568 * -3.617698e-12 +
                     local_1808 * 2.72101765e-09 + dVar1 * 2.03362866e-06 + -0.00061035368;
        dcRdT[0xc] = local_568 * -5.74798192e-13 +
                     local_1808 * 7.37757066e-09 + dVar1 * -1.42471254e-05 + 0.00898459677;
        dcRdT[0xd] = local_568 * 1.73507546e-11 +
                     local_1808 * -3.99432279e-08 + dVar1 * 2.75598892e-05 + -0.00324392532;
        dcRdT[0xe] = local_568 * 5.27090608e-11 +
                     local_1808 * -1.13785578e-07 + dVar1 * 7.46440016e-05 + -0.00990833369;
        dcRdT[0xf] = local_568 * 8.30244e-12 +
                     local_1808 * -2.2132908e-08 + dVar1 * 1.0676944e-05 + 0.007216595;
        dcRdT[0x10] = local_568 * 1.07953749e-10 +
                      local_1808 * -2.07476626e-07 + dVar1 * 0.000114198058 + -0.00757052247;
        dcRdT[0x11] = local_568 * 9.22036016e-11 +
                      local_1808 * -1.79737982e-07 + dVar1 * 9.94285614e-05 + -0.00418658892;
        dcRdT[0x12] = local_568 * 1.07474308e-10 +
                      local_1808 * -2.12539886e-07 + dVar1 * 0.000119887658 + -0.0055015427;
        dVar27 = local_1808 * 1.6924545e-08 + dVar1 * -7.926444e-06 + 0.0014082404;
        dVar26 = local_568 * -9.779416e-12;
      }
      dcRdT[0x13] = dVar26 + dVar27;
      dcRdT[0x14] = dVar80 + 0.0 + dVar125 + dVar137;
      if (1000.0 <= dVar1) {
        local_2f8 = dVar47 * -950.158922 +
                    local_6a8 * 4.00510752e-15 +
                    local_568 * -4.48915985e-11 +
                    local_1808 * 1.66485593e-07 + dVar1 * -2.47012365e-05 + 2.3372792;
        dStack_2f0 = dVar47 * 25473.6599 +
                     local_6a8 * 9.96394714e-23 +
                     local_568 * -1.18378809e-18 +
                     local_1808 * 5.38539827e-15 + dVar1 * -1.15421486e-11 + 1.50000001;
        local_2e8 = dVar47 * 29217.5791 +
                    local_6a8 * 2.45667382e-16 +
                    local_568 * -2.50444497e-12 +
                    local_1808 * 1.39828196e-08 + dVar1 * -4.29870569e-05 + 1.56942078;
        dStack_2e0 = dVar47 * -1088.45772 +
                     local_6a8 * -4.33435588e-15 +
                     local_568 * 5.23676387e-11 +
                     local_1808 * -2.52655556e-07 + dVar1 * 0.00074154377 + 2.28253784;
        local_2d8 = dVar47 * 3858.657 +
                    local_6a8 * 2.34824752e-15 +
                    local_568 * -2.19865389e-11 +
                    local_1808 * 4.21684093e-08 + dVar1 * 0.000274214858 + 2.09288767;
        dStack_2d0 = dVar47 * -30004.2971 +
                     local_6a8 * 3.36401984e-15 +
                     local_568 * -2.42604967e-11 +
                     local_1808 * -5.46908393e-08 + dVar1 * 0.00108845902 + 2.03399249;
        local_2c8 = dVar47 * 111.856713 +
                    local_6a8 * -2.1581707e-15 +
                    local_568 * 2.85615925e-11 +
                    local_1808 * -2.11219383e-07 + dVar1 * 0.00111991006 + 3.0172109;
        dStack_2c0 = dVar47 * 46263.604 +
                     local_6a8 * -3.75455134e-15 +
                     local_568 * 6.50448872e-11 +
                     local_1808 * -4.69648657e-07 + dVar1 * 0.00182819646 + 1.87410113;
        local_2b8 = dVar47 * 50925.9997 +
                    local_6a8 * -6.7943273e-15 +
                    local_568 * 1.044765e-10 +
                    local_1808 * -6.70639823e-07 + dVar1 * 0.00232794318 + 1.29203842;
        dStack_2b0 = dVar47 * 16775.5843 +
                     local_6a8 * -9.34308788e-15 +
                     local_568 * 1.48921161e-10 +
                     local_1808 * -9.95714493e-07 + dVar1 * 0.00361995018 + 1.28571772;
        local_2a8 = dVar47 * -9468.34459 +
                    local_6a8 * -2.0363046e-14 +
                    local_568 * 3.05731338e-10 +
                    local_1808 * -1.9109527e-06 + dVar1 * 0.00669547335 + -0.925148505;
        dStack_2a0 = dVar47 * -14151.8724 +
                     local_6a8 * -4.07295432e-15 +
                     local_568 * 5.7513252e-11 +
                     local_1808 * -3.32941924e-07 + dVar1 * 0.00103126372 + 1.71518561;
        local_298 = dVar47 * -48759.166 +
                    local_6a8 * -9.44168328e-15 +
                    local_568 * 1.30872547e-10 +
                    local_1808 * -7.38271347e-07 + dVar1 * 0.00220718513 + 2.85746029;
        dStack_290 = dVar47 * 4011.91815 +
                     local_6a8 * -1.06701742e-14 +
                     local_568 * 1.47290445e-10 +
                     local_1808 * -8.28152043e-07 + dVar1 * 0.00247847763 + 1.77217438;
        local_288 = dVar47 * -13995.8323 +
                    local_6a8 * -1.76771128e-14 +
                    local_568 * 2.5160303e-10 +
                    local_1808 * -1.47419604e-06 + dVar1 * 0.00460000041 + 0.76069008;
        dStack_280 = dVar47 * 127.83252 +
                     local_6a8 * -4.225232e-15 +
                     local_568 * 9.8610775e-11 +
                     local_1808 * -8.85461333e-07 + dVar1 * 0.0039357485 + 2.770799;
        local_278 = dVar47 * 4939.88614 +
                    local_6a8 * -2.51412122e-14 +
                    local_568 * 3.68057308e-10 +
                    local_1808 * -2.23692638e-06 + dVar1 * 0.00732270755 + 1.03611116;
        dStack_270 = dVar47 * 12857.52 +
                     local_6a8 * -2.99283152e-14 +
                     local_568 * 4.38044223e-10 +
                     local_1808 * -2.66068889e-06 + dVar1 * 0.0086986361 + 0.95465642;
        local_268 = dVar47 * -11426.3932 +
                    local_6a8 * -3.8000578e-14 +
                    local_568 * 5.53530003e-10 +
                    local_1808 * -3.3418689e-06 + dVar1 * 0.0108426339 + 0.0718815;
        dVar27 = local_6a8 * -1.3506702e-15 +
                 local_568 * 2.5242595e-11 +
                 local_1808 * -1.89492e-07 + dVar1 * 0.0007439884 + 1.92664;
        dVar26 = dVar47 * -922.7977;
      }
      else {
        local_2f8 = dVar47 * -917.935173 +
                    local_6a8 * -1.47522352e-12 +
                    local_568 * 5.03930235e-09 +
                    local_1808 * -6.492717e-06 + dVar1 * 0.00399026037 + 1.34433112;
        dStack_2f0 = dVar47 * 25473.6599 +
                     local_6a8 * -1.85546466e-22 +
                     local_568 * 5.7520408e-19 +
                     local_1808 * -6.65306547e-16 + dVar1 * 3.52666409e-13 + 1.5;
        local_2e8 = dVar47 * 29122.2592 +
                    local_6a8 * 4.22531942e-13 +
                    local_568 * -1.53201656e-09 +
                    local_1808 * 2.21435465e-06 + dVar1 * -0.00163965942 + 2.1682671;
        dStack_2e0 = dVar47 * -1063.94356 +
                     local_6a8 * 6.48745674e-13 +
                     local_568 * -2.42032377e-09 +
                     local_1808 * 3.282434e-06 + dVar1 * -0.00149836708 + 2.78245636;
        local_2d8 = dVar47 * 3615.08056 +
                    local_6a8 * 2.7282294e-13 +
                    local_568 * -9.70283332e-10 +
                    local_1808 * 1.5393128e-06 + dVar1 * -0.00120065876 + 2.99201543;
        dStack_2d0 = dVar47 * -30293.7267 +
                     local_6a8 * 3.54395634e-13 +
                     local_568 * -1.37199266e-09 +
                     local_1808 * 2.17346737e-06 + dVar1 * -0.00101821705 + 3.19864056;
        local_2c8 = dVar47 * 294.80804 +
                    local_6a8 * 1.85845025e-12 +
                    local_568 * -6.06909735e-09 +
                    local_1808 * 7.05276303e-06 + dVar1 * -0.00237456025 + 3.30179801;
        dStack_2c0 = dVar47 * 46004.0401 +
                     local_6a8 * 3.37483438e-13 +
                     local_568 * -9.62727883e-10 +
                     local_1808 * 9.31632803e-07 + dVar1 * 0.000484436072 + 2.76267867;
        local_2b8 = dVar47 * 50496.8163 +
                    local_6a8 * 3.88629474e-13 +
                    local_568 * -1.67203995e-09 +
                    local_1808 * 2.74432073e-06 + dVar1 * -0.0011833071 + 3.19860411;
        dStack_2b0 = dVar47 * 16444.9988 +
                     local_6a8 * 5.08771468e-13 +
                     local_568 * -1.71779356e-09 +
                     local_1808 * 1.91007285e-06 + dVar1 * 0.00100547588 + 2.6735904;
        local_2a8 = dVar47 * -10246.6476 +
                    local_6a8 * 3.33387912e-12 +
                    local_568 * -1.21185757e-08 +
                    local_1808 * 1.63933533e-05 + dVar1 * -0.0068354894 + 4.14987613;
        dStack_2a0 = dVar47 * -14344.086 +
                     local_6a8 * -1.808849e-13 +
                     local_568 * 2.26751471e-10 +
                     local_1808 * 3.3893811e-07 + dVar1 * -0.00030517684 + 2.57953347;
        local_298 = dVar47 * -48371.9697 +
                    local_6a8 * -2.87399096e-14 +
                    local_568 * 6.14797555e-10 +
                    local_1808 * -2.3745209e-06 + dVar1 * 0.00449229839 + 1.35677352;
        dStack_290 = dVar47 * 3839.56496 +
                     local_6a8 * 8.6753773e-13 +
                     local_568 * -3.32860233e-09 +
                     local_1808 * 4.59331487e-06 + dVar1 * -0.00162196266 + 3.22118584;
        local_288 = dVar47 * -14308.9567 +
                    local_6a8 * 2.63545304e-12 +
                    local_568 * -9.48213152e-09 +
                    local_1808 * 1.24406669e-05 + dVar1 * -0.00495416684 + 3.79372315;
        dStack_280 = dVar47 * 978.6011 +
                     local_6a8 * 4.15122e-13 +
                     local_568 * -1.844409e-09 +
                     local_1808 * 1.77949067e-06 + dVar1 * 0.0036082975 + 1.106204;
        local_278 = dVar47 * 5089.77593 +
                    local_6a8 * 5.39768746e-12 +
                    local_568 * -1.72897188e-08 +
                    local_1808 * 1.90330097e-05 + dVar1 * -0.00378526124 + 2.95920148;
        dStack_270 = dVar47 * 12841.6265 +
                     local_6a8 * 4.61018008e-12 +
                     local_568 * -1.49781651e-08 +
                     local_1808 * 1.65714269e-05 + dVar1 * -0.00209329446 + 3.30646568;
        local_268 = dVar47 * -11522.2055 +
                    local_6a8 * 5.37371542e-12 +
                    local_568 * -1.77116571e-08 +
                    local_1808 * 1.99812763e-05 + dVar1 * -0.00275077135 + 3.29142492;
        dVar27 = local_6a8 * -4.889708e-13 +
                 local_568 * 1.41037875e-09 +
                 local_1808 * -1.321074e-06 + dVar1 * 0.0007041202 + 2.298677;
        dVar26 = dVar47 * -1020.8999;
      }
      local_260 = dVar26 + dVar27;
      local_258 = dVar47 * -745.375 + dVar134 + dVar137 + dVar125 + dVar80 + 1.5;
      pRVar19 = &local_2f8;
    }
    dVar26 = 0.0;
    dVar27 = 0.0;
    dVar48 = 0.0;
    dVar28 = 0.0;
    for (lVar17 = 0; lVar17 != 0xa8; lVar17 = lVar17 + 8) {
      dVar48 = dVar48 + *(double *)((long)dcRdT + lVar17) * *(double *)((long)local_1de8 + lVar17);
      dVar29 = *(double *)((long)pRVar19 + lVar17);
      dVar26 = dVar26 + *(double *)((long)local_1de8 + lVar17) * *(double *)((long)c_R + lVar17);
      dVar27 = dVar27 + *(double *)((long)local_1f28 + lVar17) * dVar29;
      dVar28 = dVar28 + (*(double *)((long)c_R + lVar17) - dVar29) * dVar47 *
                        *(double *)((long)local_1f28 + lVar17) +
                        dVar29 * *(double *)((long)local_808 + lVar17);
    }
    dVar27 = dVar27 * (1.0 / dVar26);
    dVar1 = dVar1 * (1.0 / dVar26);
    dVar47 = dVar27 * dVar1;
    dVar1 = -dVar1;
    pdVar18 = __s;
    for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
      dVar26 = 0.0;
      for (lVar22 = 0; lVar22 != 0x15; lVar22 = lVar22 + 1) {
        dVar26 = dVar26 + pRVar19[lVar22] * pdVar18[lVar22];
      }
      *(double *)(auStack_15c0 + lVar17 * 0xb0 + -0x10) = c_R[lVar17] * dVar47 + dVar26 * dVar1;
      pdVar18 = pdVar18 + 0x16;
    }
    local_760 = dVar1 * dVar28 + (dVar47 * dVar48 - dVar27);
    pdVar18 = local_1680;
    for (lVar17 = 0; pdVar18 = (double *)((long)pdVar18 + 0xb0), lVar17 != 0x15; lVar17 = lVar17 + 1
        ) {
      local_808[lVar17] = local_808[lVar17] * 1e-06;
      *pdVar18 = *pdVar18 * 1000000.0;
    }
    lVar17 = *(long *)((long)J->content + 0x18);
    pdVar18 = __s;
    for (lVar22 = 0; lVar22 != 0x15; lVar22 = lVar22 + 1) {
      lVar3 = *(long *)(lVar17 + uVar21 * 0xb0 + lVar22 * 8);
      dVar47 = local_238[lVar22];
      for (lVar23 = 0; lVar23 != 0x15; lVar23 = lVar23 + 1) {
        *(double *)(lVar3 + uVar25 + lVar23 * 8) = (pdVar18[lVar23] * local_238[lVar23]) / dVar47;
      }
      *(double *)(lVar3 + 0xa8 + uVar21 * 0xb0) =
           *(double *)(auStack_15c0 + lVar22 * 0xb0 + -0x10) / dVar47;
      pdVar18 = pdVar18 + 0x16;
    }
    lVar17 = *(long *)(lVar17 + 0xa8 + uVar21 * 0xb0);
    for (lVar22 = 0; lVar22 != 0x15; lVar22 = lVar22 + 1) {
      *(double *)(lVar17 + uVar25 + lVar22 * 8) = local_808[lVar22] * local_238[lVar22];
    }
    prVar24 = prVar24 + 0x16;
    uVar25 = uVar25 + 0xb0;
  }
  return 0;
}

Assistant:

int
cJac(
  amrex::Real /* tn */,
  N_Vector u,
  N_Vector /* fu */,
  SUNMatrix J,
  void* user_data,
  N_Vector /* tmp1 */,
  N_Vector /* tmp2 */,
  N_Vector /* tmp3 */)
{
  BL_PROFILE("Pele::ReactorCvode::cJacDense()");

  // Make local copies of pointers to input data
  amrex::Real* ydata = N_VGetArrayPointer(u);

  // Make local copies of pointers in user_data
  auto* udata = static_cast<CVODEUserData*>(user_data);
  auto ncells = udata->ncells;
  auto reactor_type = udata->reactor_type;

  for (int tid = 0; tid < ncells; tid++) {
    // Offset in case several cells
    int offset = tid * (NUM_SPECIES + 1);

    // MW CGS
    amrex::Real mw[NUM_SPECIES] = {0.0};
    get_mw(mw);

    // rho MKS
    amrex::Real rho = 0.0;
    for (int i = 0; i < NUM_SPECIES; i++) {
      rho = rho + ydata[offset + i];
    }

    amrex::Real temp = ydata[offset + NUM_SPECIES];

    amrex::Real massfrac[NUM_SPECIES] = {0.0};
    // Yks
    for (int i = 0; i < NUM_SPECIES; i++) {
      massfrac[i] = ydata[offset + i] / rho;
    }

    // Jac
    amrex::Real Jmat_tmp[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)] = {0.0};
    const int consP =
      static_cast<int>(reactor_type == ReactorTypes::h_reactor_type);
    auto eos = pele::physics::PhysicsType::eos();
    eos.RTY2JAC(rho, temp, massfrac, Jmat_tmp, consP);

    // fill the sunMat and scale
    for (int i = 0; i < NUM_SPECIES; i++) {
      // cppcheck-suppress cstyleCast
      amrex::Real* J_col = SM_COLUMN_D(J, offset + i);
      for (int k = 0; k < NUM_SPECIES; k++) {
        J_col[offset + k] = Jmat_tmp[i * (NUM_SPECIES + 1) + k] * mw[k] / mw[i];
      }
      J_col[offset + NUM_SPECIES] =
        Jmat_tmp[i * (NUM_SPECIES + 1) + NUM_SPECIES] / mw[i];
    }
    // cppcheck-suppress cstyleCast
    amrex::Real* J_col = SM_COLUMN_D(J, offset + NUM_SPECIES);
    for (int i = 0; i < NUM_SPECIES; i++) {
      J_col[offset + i] = Jmat_tmp[NUM_SPECIES * (NUM_SPECIES + 1) + i] * mw[i];
    }
    // J_col = SM_COLUMN_D(J, offset); // Never read
  }

  return (0);
}